

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersector1<8>::
     occluded_t<embree::avx::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [16];
  undefined1 (*pauVar8) [28];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  RTCFilterFunctionN p_Var21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [28];
  undefined1 auVar134 [28];
  undefined1 auVar135 [28];
  undefined1 auVar136 [28];
  ulong uVar137;
  ulong uVar138;
  RTCIntersectArguments *pRVar139;
  ulong uVar140;
  uint uVar141;
  long lVar142;
  byte bVar143;
  long lVar144;
  long lVar145;
  undefined4 uVar146;
  undefined8 unaff_R13;
  Geometry *geometry;
  long lVar147;
  float fVar149;
  undefined1 auVar150 [16];
  float fVar148;
  undefined1 auVar151 [16];
  float fVar170;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar167;
  float fVar168;
  float fVar171;
  float fVar173;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar169;
  float fVar172;
  float fVar174;
  float fVar178;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar179;
  undefined1 auVar182 [16];
  float fVar192;
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar184 [32];
  float fVar197;
  undefined1 auVar187 [32];
  float fVar198;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar191;
  float fVar193;
  undefined1 auVar190 [64];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  float fVar210;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar211;
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar212;
  float fVar223;
  float fVar224;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar225;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar226;
  float fVar227;
  float fVar237;
  float fVar239;
  undefined1 auVar228 [16];
  float fVar241;
  undefined1 auVar229 [16];
  float fVar244;
  float fVar247;
  float fVar250;
  undefined1 auVar231 [32];
  undefined1 auVar230 [16];
  undefined1 auVar232 [32];
  float fVar238;
  float fVar240;
  float fVar242;
  float fVar243;
  float fVar245;
  float fVar246;
  float fVar248;
  float fVar249;
  float fVar251;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar252;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar253;
  float fVar264;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar262;
  float fVar263;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar269;
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  float fVar270;
  float fVar271;
  float fVar275;
  float fVar276;
  float fVar278;
  float fVar279;
  float fVar281;
  float fVar283;
  float fVar285;
  float fVar287;
  float fVar288;
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  float fVar277;
  float fVar280;
  float fVar282;
  float fVar284;
  float fVar286;
  float fVar289;
  float fVar290;
  undefined1 auVar274 [32];
  undefined1 auVar291 [16];
  float fVar296;
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  float fVar297;
  float fVar298;
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  float fVar299;
  float fVar306;
  float fVar307;
  float fVar312;
  undefined1 auVar308 [12];
  float fVar309;
  float fVar313;
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  float fVar311;
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  float fVar310;
  undefined1 auVar304 [32];
  undefined1 auVar305 [64];
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [64];
  undefined1 auVar327 [16];
  float fVar326;
  float fVar338;
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  float fVar339;
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar340 [16];
  float fVar347;
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar348 [16];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [16];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  float fVar366;
  float fVar367;
  float fVar371;
  float fVar373;
  float fVar375;
  undefined1 auVar368 [32];
  float fVar372;
  float fVar374;
  float fVar376;
  undefined1 auVar369 [32];
  undefined1 auVar370 [64];
  float fVar377;
  float fVar382;
  float fVar383;
  float fVar384;
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar385 [16];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  int local_7cc;
  long local_7c8;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  ulong local_720;
  Precalculations *local_718;
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 local_6b0 [8];
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined4 local_698;
  float local_694;
  uint local_690;
  undefined4 local_68c;
  undefined4 local_688;
  uint local_684;
  uint local_680;
  ulong local_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5b0 [8];
  undefined8 uStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  Primitive *local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  uint local_260;
  uint local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined1 local_220 [16];
  undefined1 local_200 [32];
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar183 [24];
  undefined1 auVar334 [32];
  
  PVar18 = prim[1];
  uVar137 = (ulong)(byte)PVar18;
  auVar385 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 4 + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 4 + 10)));
  auVar215 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 5 + 6)));
  auVar216 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 5 + 10)));
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 6 + 6)));
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 6 + 10)));
  local_718 = pre;
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 0xf + 6)));
  lVar144 = uVar137 * 0x25;
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 0xf + 10)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 10)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 0x11 + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 0x11 + 10)));
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 0x1a + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 0x1a + 10)));
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 0x1b + 6)));
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 0x1b + 10)));
  auVar328._16_16_ = auVar214;
  auVar328._0_16_ = auVar385;
  auVar385 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar144 + 6));
  auVar217._16_16_ = auVar216;
  auVar217._0_16_ = auVar215;
  fVar226 = *(float *)(prim + lVar144 + 0x12);
  auVar228._0_4_ = fVar226 * auVar385._0_4_;
  auVar228._4_4_ = fVar226 * auVar385._4_4_;
  auVar228._8_4_ = fVar226 * auVar385._8_4_;
  auVar228._12_4_ = fVar226 * auVar385._12_4_;
  auVar348._0_4_ = fVar226 * (ray->dir).field_0.m128[0];
  auVar348._4_4_ = fVar226 * (ray->dir).field_0.m128[1];
  auVar348._8_4_ = fVar226 * (ray->dir).field_0.m128[2];
  auVar348._12_4_ = fVar226 * (ray->dir).field_0.m128[3];
  auVar154 = vcvtdq2ps_avx(auVar217);
  auVar218._16_16_ = auVar32;
  auVar218._0_16_ = auVar31;
  auVar23 = vcvtdq2ps_avx(auVar218);
  auVar219._16_16_ = auVar34;
  auVar219._0_16_ = auVar33;
  auVar256._16_16_ = auVar36;
  auVar256._0_16_ = auVar35;
  auVar24 = vcvtdq2ps_avx(auVar256);
  auVar257._16_16_ = auVar38;
  auVar257._0_16_ = auVar37;
  auVar25 = vcvtdq2ps_avx(auVar257);
  auVar378._16_16_ = auVar40;
  auVar378._0_16_ = auVar39;
  auVar152._16_16_ = auVar42;
  auVar152._0_16_ = auVar41;
  auVar385 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 0x1c + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 0x1c + 10)));
  auVar341._16_16_ = auVar214;
  auVar341._0_16_ = auVar385;
  auVar385 = vshufps_avx(auVar348,auVar348,0x55);
  auVar214 = vshufps_avx(auVar348,auVar348,0xaa);
  fVar226 = auVar214._0_4_;
  fVar270 = auVar214._4_4_;
  fVar262 = auVar214._8_4_;
  fVar239 = auVar214._12_4_;
  fVar278 = auVar385._0_4_;
  fVar241 = auVar385._4_4_;
  fVar264 = auVar385._8_4_;
  fVar281 = auVar385._12_4_;
  auVar26 = vcvtdq2ps_avx(auVar328);
  auVar27 = vcvtdq2ps_avx(auVar219);
  auVar28 = vcvtdq2ps_avx(auVar378);
  auVar29 = vcvtdq2ps_avx(auVar152);
  auVar30 = vcvtdq2ps_avx(auVar341);
  auVar385 = vshufps_avx(auVar348,auVar348,0);
  fVar253 = auVar385._0_4_;
  fVar237 = auVar385._4_4_;
  fVar275 = auVar385._8_4_;
  fVar263 = auVar385._12_4_;
  auVar349._0_4_ = auVar26._0_4_ * fVar253 + fVar278 * auVar154._0_4_ + auVar23._0_4_ * fVar226;
  auVar349._4_4_ = auVar26._4_4_ * fVar237 + fVar241 * auVar154._4_4_ + auVar23._4_4_ * fVar270;
  auVar349._8_4_ = auVar26._8_4_ * fVar275 + fVar264 * auVar154._8_4_ + auVar23._8_4_ * fVar262;
  auVar349._12_4_ = auVar26._12_4_ * fVar263 + fVar281 * auVar154._12_4_ + auVar23._12_4_ * fVar239;
  auVar349._16_4_ = auVar26._16_4_ * fVar253 + fVar278 * auVar154._16_4_ + auVar23._16_4_ * fVar226;
  auVar349._20_4_ = auVar26._20_4_ * fVar237 + fVar241 * auVar154._20_4_ + auVar23._20_4_ * fVar270;
  auVar349._24_4_ = auVar26._24_4_ * fVar275 + fVar264 * auVar154._24_4_ + auVar23._24_4_ * fVar262;
  auVar349._28_4_ = fVar281 + 0.0;
  auVar342._0_4_ = fVar278 * auVar24._0_4_ + fVar226 * auVar25._0_4_ + auVar27._0_4_ * fVar253;
  auVar342._4_4_ = fVar241 * auVar24._4_4_ + fVar270 * auVar25._4_4_ + auVar27._4_4_ * fVar237;
  auVar342._8_4_ = fVar264 * auVar24._8_4_ + fVar262 * auVar25._8_4_ + auVar27._8_4_ * fVar275;
  auVar342._12_4_ = fVar281 * auVar24._12_4_ + fVar239 * auVar25._12_4_ + auVar27._12_4_ * fVar263;
  auVar342._16_4_ = fVar278 * auVar24._16_4_ + fVar226 * auVar25._16_4_ + auVar27._16_4_ * fVar253;
  auVar342._20_4_ = fVar241 * auVar24._20_4_ + fVar270 * auVar25._20_4_ + auVar27._20_4_ * fVar237;
  auVar342._24_4_ = fVar264 * auVar24._24_4_ + fVar262 * auVar25._24_4_ + auVar27._24_4_ * fVar275;
  auVar342._28_4_ = 0;
  auVar258._0_4_ = auVar28._0_4_ * fVar253 + fVar278 * auVar29._0_4_ + fVar226 * auVar30._0_4_;
  auVar258._4_4_ = auVar28._4_4_ * fVar237 + fVar241 * auVar29._4_4_ + fVar270 * auVar30._4_4_;
  auVar258._8_4_ = auVar28._8_4_ * fVar275 + fVar264 * auVar29._8_4_ + fVar262 * auVar30._8_4_;
  auVar258._12_4_ = auVar28._12_4_ * fVar263 + fVar281 * auVar29._12_4_ + fVar239 * auVar30._12_4_;
  auVar258._16_4_ = auVar28._16_4_ * fVar253 + fVar278 * auVar29._16_4_ + fVar226 * auVar30._16_4_;
  auVar258._20_4_ = auVar28._20_4_ * fVar237 + fVar241 * auVar29._20_4_ + fVar270 * auVar30._20_4_;
  auVar258._24_4_ = auVar28._24_4_ * fVar275 + fVar264 * auVar29._24_4_ + fVar262 * auVar30._24_4_;
  auVar258._28_4_ = fVar263 + fVar281 + fVar239;
  auVar385 = vshufps_avx(auVar228,auVar228,0x55);
  auVar214 = vshufps_avx(auVar228,auVar228,0xaa);
  fVar226 = auVar214._0_4_;
  fVar270 = auVar214._4_4_;
  fVar262 = auVar214._8_4_;
  fVar239 = auVar214._12_4_;
  fVar278 = auVar385._0_4_;
  fVar241 = auVar385._4_4_;
  fVar264 = auVar385._8_4_;
  fVar281 = auVar385._12_4_;
  auVar385._8_8_ = 0;
  auVar385._0_8_ = *(ulong *)(prim + uVar137 * 7 + 6);
  auVar385 = vpmovsxwd_avx(auVar385);
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *(ulong *)(prim + uVar137 * 7 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar214);
  auVar215._8_8_ = 0;
  auVar215._0_8_ = *(ulong *)(prim + uVar137 * 0xb + 6);
  auVar215 = vpmovsxwd_avx(auVar215);
  auVar216._8_8_ = 0;
  auVar216._0_8_ = *(ulong *)(prim + uVar137 * 0xb + 0xe);
  auVar216 = vpmovsxwd_avx(auVar216);
  auVar31 = vshufps_avx(auVar228,auVar228,0);
  fVar253 = auVar31._0_4_;
  fVar237 = auVar31._4_4_;
  fVar275 = auVar31._8_4_;
  fVar263 = auVar31._12_4_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar137 * 9 + 6);
  auVar31 = vpmovsxwd_avx(auVar31);
  auVar153._0_4_ = auVar23._0_4_ * fVar226 + fVar278 * auVar154._0_4_ + auVar26._0_4_ * fVar253;
  auVar153._4_4_ = auVar23._4_4_ * fVar270 + fVar241 * auVar154._4_4_ + auVar26._4_4_ * fVar237;
  auVar153._8_4_ = auVar23._8_4_ * fVar262 + fVar264 * auVar154._8_4_ + auVar26._8_4_ * fVar275;
  auVar153._12_4_ = auVar23._12_4_ * fVar239 + fVar281 * auVar154._12_4_ + auVar26._12_4_ * fVar263;
  auVar153._16_4_ = auVar23._16_4_ * fVar226 + fVar278 * auVar154._16_4_ + auVar26._16_4_ * fVar253;
  auVar153._20_4_ = auVar23._20_4_ * fVar270 + fVar241 * auVar154._20_4_ + auVar26._20_4_ * fVar237;
  auVar153._24_4_ = auVar23._24_4_ * fVar262 + fVar264 * auVar154._24_4_ + auVar26._24_4_ * fVar275;
  auVar153._28_4_ = auVar23._28_4_ + fVar239 + fVar281;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar137 * 9 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar32);
  auVar220._0_4_ = auVar27._0_4_ * fVar253 + fVar278 * auVar24._0_4_ + fVar226 * auVar25._0_4_;
  auVar220._4_4_ = auVar27._4_4_ * fVar237 + fVar241 * auVar24._4_4_ + fVar270 * auVar25._4_4_;
  auVar220._8_4_ = auVar27._8_4_ * fVar275 + fVar264 * auVar24._8_4_ + fVar262 * auVar25._8_4_;
  auVar220._12_4_ = auVar27._12_4_ * fVar263 + fVar281 * auVar24._12_4_ + fVar239 * auVar25._12_4_;
  auVar220._16_4_ = auVar27._16_4_ * fVar253 + fVar278 * auVar24._16_4_ + fVar226 * auVar25._16_4_;
  auVar220._20_4_ = auVar27._20_4_ * fVar237 + fVar241 * auVar24._20_4_ + fVar270 * auVar25._20_4_;
  auVar220._24_4_ = auVar27._24_4_ * fVar275 + fVar264 * auVar24._24_4_ + fVar262 * auVar25._24_4_;
  auVar220._28_4_ = fVar239 + auVar25._28_4_ + 0.0;
  auVar184._0_4_ = auVar28._0_4_ * fVar253 + fVar278 * auVar29._0_4_ + fVar226 * auVar30._0_4_;
  auVar184._4_4_ = auVar28._4_4_ * fVar237 + fVar241 * auVar29._4_4_ + fVar270 * auVar30._4_4_;
  auVar184._8_4_ = auVar28._8_4_ * fVar275 + fVar264 * auVar29._8_4_ + fVar262 * auVar30._8_4_;
  auVar184._12_4_ = auVar28._12_4_ * fVar263 + fVar281 * auVar29._12_4_ + fVar239 * auVar30._12_4_;
  auVar184._16_4_ = auVar28._16_4_ * fVar253 + fVar278 * auVar29._16_4_ + fVar226 * auVar30._16_4_;
  auVar184._20_4_ = auVar28._20_4_ * fVar237 + fVar241 * auVar29._20_4_ + fVar270 * auVar30._20_4_;
  auVar184._24_4_ = auVar28._24_4_ * fVar275 + fVar264 * auVar29._24_4_ + fVar262 * auVar30._24_4_;
  auVar184._28_4_ = fVar263 + fVar281 + auVar30._28_4_;
  auVar379._8_4_ = 0x7fffffff;
  auVar379._0_8_ = 0x7fffffff7fffffff;
  auVar379._12_4_ = 0x7fffffff;
  auVar379._16_4_ = 0x7fffffff;
  auVar379._20_4_ = 0x7fffffff;
  auVar379._24_4_ = 0x7fffffff;
  auVar379._28_4_ = 0x7fffffff;
  auVar231._8_4_ = 0x219392ef;
  auVar231._0_8_ = 0x219392ef219392ef;
  auVar231._12_4_ = 0x219392ef;
  auVar231._16_4_ = 0x219392ef;
  auVar231._20_4_ = 0x219392ef;
  auVar231._24_4_ = 0x219392ef;
  auVar231._28_4_ = 0x219392ef;
  auVar154 = vandps_avx(auVar349,auVar379);
  auVar154 = vcmpps_avx(auVar154,auVar231,1);
  auVar23 = vblendvps_avx(auVar349,auVar231,auVar154);
  auVar154 = vandps_avx(auVar342,auVar379);
  auVar154 = vcmpps_avx(auVar154,auVar231,1);
  auVar24 = vblendvps_avx(auVar342,auVar231,auVar154);
  auVar154 = vandps_avx(auVar379,auVar258);
  auVar154 = vcmpps_avx(auVar154,auVar231,1);
  auVar154 = vblendvps_avx(auVar258,auVar231,auVar154);
  auVar25 = vrcpps_avx(auVar23);
  fVar226 = auVar25._0_4_;
  fVar237 = auVar25._4_4_;
  auVar26._4_4_ = auVar23._4_4_ * fVar237;
  auVar26._0_4_ = auVar23._0_4_ * fVar226;
  fVar239 = auVar25._8_4_;
  auVar26._8_4_ = auVar23._8_4_ * fVar239;
  fVar241 = auVar25._12_4_;
  auVar26._12_4_ = auVar23._12_4_ * fVar241;
  fVar244 = auVar25._16_4_;
  auVar26._16_4_ = auVar23._16_4_ * fVar244;
  fVar247 = auVar25._20_4_;
  auVar26._20_4_ = auVar23._20_4_ * fVar247;
  fVar250 = auVar25._24_4_;
  auVar26._24_4_ = auVar23._24_4_ * fVar250;
  auVar26._28_4_ = auVar258._28_4_;
  auVar350._8_4_ = 0x3f800000;
  auVar350._0_8_ = 0x3f8000003f800000;
  auVar350._12_4_ = 0x3f800000;
  auVar350._16_4_ = 0x3f800000;
  auVar350._20_4_ = 0x3f800000;
  auVar350._24_4_ = 0x3f800000;
  auVar350._28_4_ = 0x3f800000;
  auVar27 = vsubps_avx(auVar350,auVar26);
  fVar226 = fVar226 + fVar226 * auVar27._0_4_;
  fVar237 = fVar237 + fVar237 * auVar27._4_4_;
  fVar239 = fVar239 + fVar239 * auVar27._8_4_;
  fVar241 = fVar241 + fVar241 * auVar27._12_4_;
  fVar244 = fVar244 + fVar244 * auVar27._16_4_;
  fVar247 = fVar247 + fVar247 * auVar27._20_4_;
  fVar250 = fVar250 + fVar250 * auVar27._24_4_;
  auVar26 = vrcpps_avx(auVar24);
  fVar253 = auVar26._0_4_;
  fVar262 = auVar26._4_4_;
  auVar28._4_4_ = auVar24._4_4_ * fVar262;
  auVar28._0_4_ = auVar24._0_4_ * fVar253;
  fVar263 = auVar26._8_4_;
  auVar28._8_4_ = auVar24._8_4_ * fVar263;
  fVar264 = auVar26._12_4_;
  auVar28._12_4_ = auVar24._12_4_ * fVar264;
  fVar265 = auVar26._16_4_;
  auVar28._16_4_ = auVar24._16_4_ * fVar265;
  fVar266 = auVar26._20_4_;
  auVar28._20_4_ = auVar24._20_4_ * fVar266;
  fVar267 = auVar26._24_4_;
  auVar28._24_4_ = auVar24._24_4_ * fVar267;
  auVar28._28_4_ = auVar23._28_4_;
  auVar28 = vsubps_avx(auVar350,auVar28);
  fVar253 = fVar253 + fVar253 * auVar28._0_4_;
  fVar262 = fVar262 + fVar262 * auVar28._4_4_;
  fVar263 = fVar263 + fVar263 * auVar28._8_4_;
  fVar264 = fVar264 + fVar264 * auVar28._12_4_;
  fVar265 = fVar265 + fVar265 * auVar28._16_4_;
  fVar266 = fVar266 + fVar266 * auVar28._20_4_;
  fVar267 = fVar267 + fVar267 * auVar28._24_4_;
  auVar23 = vrcpps_avx(auVar154);
  fVar270 = auVar23._0_4_;
  fVar275 = auVar23._4_4_;
  auVar29._4_4_ = auVar154._4_4_ * fVar275;
  auVar29._0_4_ = auVar154._0_4_ * fVar270;
  fVar278 = auVar23._8_4_;
  auVar29._8_4_ = auVar154._8_4_ * fVar278;
  fVar281 = auVar23._12_4_;
  auVar29._12_4_ = auVar154._12_4_ * fVar281;
  fVar283 = auVar23._16_4_;
  auVar29._16_4_ = auVar154._16_4_ * fVar283;
  fVar285 = auVar23._20_4_;
  auVar29._20_4_ = auVar154._20_4_ * fVar285;
  fVar287 = auVar23._24_4_;
  auVar29._24_4_ = auVar154._24_4_ * fVar287;
  auVar29._28_4_ = auVar24._28_4_;
  auVar154 = vsubps_avx(auVar350,auVar29);
  fVar270 = auVar154._0_4_ * fVar270 + fVar270;
  fVar275 = auVar154._4_4_ * fVar275 + fVar275;
  fVar278 = auVar154._8_4_ * fVar278 + fVar278;
  fVar281 = auVar154._12_4_ * fVar281 + fVar281;
  fVar283 = auVar154._16_4_ * fVar283 + fVar283;
  fVar285 = auVar154._20_4_ * fVar285 + fVar285;
  fVar287 = auVar154._24_4_ * fVar287 + fVar287;
  auVar314._16_16_ = auVar214;
  auVar314._0_16_ = auVar385;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar137 * 0xd + 6);
  auVar385 = vpmovsxwd_avx(auVar33);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar137 * 0xd + 0xe);
  auVar214 = vpmovsxwd_avx(auVar34);
  auVar33 = vpermilps_avx(ZEXT416((uint)(((ray->dir).field_0.m128[3] -
                                         *(float *)(prim + lVar144 + 0x16)) *
                                        *(float *)(prim + lVar144 + 0x1a))),0);
  auVar154 = vcvtdq2ps_avx(auVar314);
  auVar292._16_16_ = auVar216;
  auVar292._0_16_ = auVar215;
  auVar23 = vcvtdq2ps_avx(auVar292);
  auVar23 = vsubps_avx(auVar23,auVar154);
  fVar268 = auVar33._0_4_;
  fVar347 = auVar33._4_4_;
  fVar288 = auVar33._8_4_;
  fVar210 = auVar33._12_4_;
  auVar293._0_4_ = auVar154._0_4_ + fVar268 * auVar23._0_4_;
  auVar293._4_4_ = auVar154._4_4_ + fVar347 * auVar23._4_4_;
  auVar293._8_4_ = auVar154._8_4_ + fVar288 * auVar23._8_4_;
  auVar293._12_4_ = auVar154._12_4_ + fVar210 * auVar23._12_4_;
  auVar293._16_4_ = auVar154._16_4_ + fVar268 * auVar23._16_4_;
  auVar293._20_4_ = auVar154._20_4_ + fVar347 * auVar23._20_4_;
  auVar293._24_4_ = auVar154._24_4_ + fVar288 * auVar23._24_4_;
  auVar293._28_4_ = auVar154._28_4_ + auVar23._28_4_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar137 * 0x12 + 6);
  auVar215 = vpmovsxwd_avx(auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar137 * 0x12 + 0xe);
  auVar216 = vpmovsxwd_avx(auVar36);
  auVar300._16_16_ = auVar32;
  auVar300._0_16_ = auVar31;
  auVar154 = vcvtdq2ps_avx(auVar300);
  auVar329._16_16_ = auVar214;
  auVar329._0_16_ = auVar385;
  auVar23 = vcvtdq2ps_avx(auVar329);
  auVar23 = vsubps_avx(auVar23,auVar154);
  auVar301._0_4_ = auVar154._0_4_ + auVar23._0_4_ * fVar268;
  auVar301._4_4_ = auVar154._4_4_ + auVar23._4_4_ * fVar347;
  auVar301._8_4_ = auVar154._8_4_ + auVar23._8_4_ * fVar288;
  auVar301._12_4_ = auVar154._12_4_ + auVar23._12_4_ * fVar210;
  auVar301._16_4_ = auVar154._16_4_ + auVar23._16_4_ * fVar268;
  auVar301._20_4_ = auVar154._20_4_ + auVar23._20_4_ * fVar347;
  auVar301._24_4_ = auVar154._24_4_ + auVar23._24_4_ * fVar288;
  auVar301._28_4_ = auVar154._28_4_ + auVar23._28_4_;
  auVar315._16_16_ = auVar216;
  auVar315._0_16_ = auVar215;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar137 * 0x16 + 6);
  auVar385 = vpmovsxwd_avx(auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar137 * 0x16 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar38);
  auVar154 = vcvtdq2ps_avx(auVar315);
  auVar330._16_16_ = auVar214;
  auVar330._0_16_ = auVar385;
  auVar23 = vcvtdq2ps_avx(auVar330);
  auVar23 = vsubps_avx(auVar23,auVar154);
  auVar316._0_4_ = auVar154._0_4_ + auVar23._0_4_ * fVar268;
  auVar316._4_4_ = auVar154._4_4_ + auVar23._4_4_ * fVar347;
  auVar316._8_4_ = auVar154._8_4_ + auVar23._8_4_ * fVar288;
  auVar316._12_4_ = auVar154._12_4_ + auVar23._12_4_ * fVar210;
  auVar316._16_4_ = auVar154._16_4_ + auVar23._16_4_ * fVar268;
  auVar316._20_4_ = auVar154._20_4_ + auVar23._20_4_ * fVar347;
  auVar316._24_4_ = auVar154._24_4_ + auVar23._24_4_ * fVar288;
  auVar316._28_4_ = auVar154._28_4_ + auVar23._28_4_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar137 * 0x14 + 6);
  auVar385 = vpmovsxwd_avx(auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar137 * 0x14 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar40);
  auVar331._16_16_ = auVar214;
  auVar331._0_16_ = auVar385;
  auVar154 = vcvtdq2ps_avx(auVar331);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar137 * 0x18 + 6);
  auVar385 = vpmovsxwd_avx(auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar137 * 0x18 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar42);
  auVar343._16_16_ = auVar214;
  auVar343._0_16_ = auVar385;
  auVar23 = vcvtdq2ps_avx(auVar343);
  auVar23 = vsubps_avx(auVar23,auVar154);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar137 * 0x1d + 6);
  auVar385 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar137 * 0x1d + 0xe);
  auVar214 = vpmovsxwd_avx(auVar11);
  auVar332._0_4_ = auVar154._0_4_ + auVar23._0_4_ * fVar268;
  auVar332._4_4_ = auVar154._4_4_ + auVar23._4_4_ * fVar347;
  auVar332._8_4_ = auVar154._8_4_ + auVar23._8_4_ * fVar288;
  auVar332._12_4_ = auVar154._12_4_ + auVar23._12_4_ * fVar210;
  auVar332._16_4_ = auVar154._16_4_ + auVar23._16_4_ * fVar268;
  auVar332._20_4_ = auVar154._20_4_ + auVar23._20_4_ * fVar347;
  auVar332._24_4_ = auVar154._24_4_ + auVar23._24_4_ * fVar288;
  auVar332._28_4_ = auVar154._28_4_ + auVar23._28_4_;
  auVar344._16_16_ = auVar214;
  auVar344._0_16_ = auVar385;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar137 * 0x21 + 6);
  auVar385 = vpmovsxwd_avx(auVar12);
  auVar154 = vcvtdq2ps_avx(auVar344);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar137 * 0x21 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar13);
  auVar351._16_16_ = auVar214;
  auVar351._0_16_ = auVar385;
  auVar23 = vcvtdq2ps_avx(auVar351);
  auVar23 = vsubps_avx(auVar23,auVar154);
  auVar345._0_4_ = auVar154._0_4_ + auVar23._0_4_ * fVar268;
  auVar345._4_4_ = auVar154._4_4_ + auVar23._4_4_ * fVar347;
  auVar345._8_4_ = auVar154._8_4_ + auVar23._8_4_ * fVar288;
  auVar345._12_4_ = auVar154._12_4_ + auVar23._12_4_ * fVar210;
  auVar345._16_4_ = auVar154._16_4_ + auVar23._16_4_ * fVar268;
  auVar345._20_4_ = auVar154._20_4_ + auVar23._20_4_ * fVar347;
  auVar345._24_4_ = auVar154._24_4_ + auVar23._24_4_ * fVar288;
  auVar345._28_4_ = auVar154._28_4_ + auVar23._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar137 * 0x1f + 6);
  auVar385 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar137 * 0x1f + 0xe);
  auVar214 = vpmovsxwd_avx(auVar15);
  auVar352._16_16_ = auVar214;
  auVar352._0_16_ = auVar385;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar137 * 0x23 + 6);
  auVar385 = vpmovsxwd_avx(auVar16);
  local_4a8 = prim;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar137 * 0x23 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar17);
  auVar359._16_16_ = auVar214;
  auVar359._0_16_ = auVar385;
  auVar154 = vcvtdq2ps_avx(auVar352);
  auVar23 = vcvtdq2ps_avx(auVar359);
  auVar23 = vsubps_avx(auVar23,auVar154);
  auVar353._0_4_ = auVar154._0_4_ + auVar23._0_4_ * fVar268;
  auVar353._4_4_ = auVar154._4_4_ + auVar23._4_4_ * fVar347;
  auVar353._8_4_ = auVar154._8_4_ + auVar23._8_4_ * fVar288;
  auVar353._12_4_ = auVar154._12_4_ + auVar23._12_4_ * fVar210;
  auVar353._16_4_ = auVar154._16_4_ + auVar23._16_4_ * fVar268;
  auVar353._20_4_ = auVar154._20_4_ + auVar23._20_4_ * fVar347;
  auVar353._24_4_ = auVar154._24_4_ + auVar23._24_4_ * fVar288;
  auVar353._28_4_ = auVar154._28_4_ + fVar210;
  auVar154 = vsubps_avx(auVar293,auVar153);
  auVar199._0_4_ = fVar226 * auVar154._0_4_;
  auVar199._4_4_ = fVar237 * auVar154._4_4_;
  auVar199._8_4_ = fVar239 * auVar154._8_4_;
  auVar199._12_4_ = fVar241 * auVar154._12_4_;
  auVar24._16_4_ = fVar244 * auVar154._16_4_;
  auVar24._0_16_ = auVar199;
  auVar24._20_4_ = fVar247 * auVar154._20_4_;
  auVar24._24_4_ = fVar250 * auVar154._24_4_;
  auVar24._28_4_ = auVar154._28_4_;
  auVar154 = vsubps_avx(auVar301,auVar153);
  auVar229._0_4_ = fVar226 * auVar154._0_4_;
  auVar229._4_4_ = fVar237 * auVar154._4_4_;
  auVar229._8_4_ = fVar239 * auVar154._8_4_;
  auVar229._12_4_ = fVar241 * auVar154._12_4_;
  auVar30._16_4_ = fVar244 * auVar154._16_4_;
  auVar30._0_16_ = auVar229;
  auVar30._20_4_ = fVar247 * auVar154._20_4_;
  auVar30._24_4_ = fVar250 * auVar154._24_4_;
  auVar30._28_4_ = auVar25._28_4_ + auVar27._28_4_;
  auVar154 = vsubps_avx(auVar316,auVar220);
  auVar150._0_4_ = fVar253 * auVar154._0_4_;
  auVar150._4_4_ = fVar262 * auVar154._4_4_;
  auVar150._8_4_ = fVar263 * auVar154._8_4_;
  auVar150._12_4_ = fVar264 * auVar154._12_4_;
  auVar25._16_4_ = fVar265 * auVar154._16_4_;
  auVar25._0_16_ = auVar150;
  auVar25._20_4_ = fVar266 * auVar154._20_4_;
  auVar25._24_4_ = fVar267 * auVar154._24_4_;
  auVar25._28_4_ = auVar154._28_4_;
  auVar154 = vsubps_avx(auVar332,auVar220);
  auVar254._0_4_ = fVar253 * auVar154._0_4_;
  auVar254._4_4_ = fVar262 * auVar154._4_4_;
  auVar254._8_4_ = fVar263 * auVar154._8_4_;
  auVar254._12_4_ = fVar264 * auVar154._12_4_;
  auVar27._16_4_ = fVar265 * auVar154._16_4_;
  auVar27._0_16_ = auVar254;
  auVar27._20_4_ = fVar266 * auVar154._20_4_;
  auVar27._24_4_ = fVar267 * auVar154._24_4_;
  auVar27._28_4_ = auVar26._28_4_ + auVar28._28_4_;
  auVar154 = vsubps_avx(auVar345,auVar184);
  auVar213._0_4_ = fVar270 * auVar154._0_4_;
  auVar213._4_4_ = fVar275 * auVar154._4_4_;
  auVar213._8_4_ = fVar278 * auVar154._8_4_;
  auVar213._12_4_ = fVar281 * auVar154._12_4_;
  auVar22._16_4_ = fVar283 * auVar154._16_4_;
  auVar22._0_16_ = auVar213;
  auVar22._20_4_ = fVar285 * auVar154._20_4_;
  auVar22._24_4_ = fVar287 * auVar154._24_4_;
  auVar22._28_4_ = auVar154._28_4_;
  auVar154 = vsubps_avx(auVar353,auVar184);
  auVar180._0_4_ = fVar270 * auVar154._0_4_;
  auVar180._4_4_ = fVar275 * auVar154._4_4_;
  auVar180._8_4_ = fVar278 * auVar154._8_4_;
  auVar180._12_4_ = fVar281 * auVar154._12_4_;
  auVar43._16_4_ = fVar283 * auVar154._16_4_;
  auVar43._0_16_ = auVar180;
  auVar43._20_4_ = fVar285 * auVar154._20_4_;
  auVar43._24_4_ = fVar287 * auVar154._24_4_;
  auVar43._28_4_ = auVar154._28_4_;
  auVar385 = vpminsd_avx(auVar24._16_16_,auVar30._16_16_);
  auVar214 = vpminsd_avx(auVar199,auVar229);
  auVar333._16_16_ = auVar385;
  auVar333._0_16_ = auVar214;
  auVar385 = vpminsd_avx(auVar25._16_16_,auVar27._16_16_);
  auVar214 = vpminsd_avx(auVar150,auVar254);
  auVar346._16_16_ = auVar385;
  auVar346._0_16_ = auVar214;
  auVar154 = vmaxps_avx(auVar333,auVar346);
  auVar385 = vpminsd_avx(auVar22._16_16_,auVar43._16_16_);
  auVar214 = vpminsd_avx(auVar213,auVar180);
  auVar360._16_16_ = auVar385;
  auVar360._0_16_ = auVar214;
  uVar146 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar368._4_4_ = uVar146;
  auVar368._0_4_ = uVar146;
  auVar368._8_4_ = uVar146;
  auVar368._12_4_ = uVar146;
  auVar368._16_4_ = uVar146;
  auVar368._20_4_ = uVar146;
  auVar368._24_4_ = uVar146;
  auVar368._28_4_ = uVar146;
  auVar23 = vmaxps_avx(auVar360,auVar368);
  auVar154 = vmaxps_avx(auVar154,auVar23);
  local_80._4_4_ = auVar154._4_4_ * 0.99999964;
  local_80._0_4_ = auVar154._0_4_ * 0.99999964;
  local_80._8_4_ = auVar154._8_4_ * 0.99999964;
  local_80._12_4_ = auVar154._12_4_ * 0.99999964;
  local_80._16_4_ = auVar154._16_4_ * 0.99999964;
  local_80._20_4_ = auVar154._20_4_ * 0.99999964;
  local_80._24_4_ = auVar154._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar385 = vpmaxsd_avx(auVar24._16_16_,auVar30._16_16_);
  auVar214 = vpmaxsd_avx(auVar199,auVar229);
  auVar204._16_16_ = auVar385;
  auVar204._0_16_ = auVar214;
  auVar385 = vpmaxsd_avx(auVar25._16_16_,auVar27._16_16_);
  auVar214 = vpmaxsd_avx(auVar150,auVar254);
  auVar154._16_16_ = auVar385;
  auVar154._0_16_ = auVar214;
  auVar154 = vminps_avx(auVar204,auVar154);
  auVar385 = vpmaxsd_avx(auVar22._16_16_,auVar43._16_16_);
  auVar214 = vpmaxsd_avx(auVar213,auVar180);
  auVar185._16_16_ = auVar385;
  auVar185._0_16_ = auVar214;
  fVar226 = ray->tfar;
  auVar205._4_4_ = fVar226;
  auVar205._0_4_ = fVar226;
  auVar205._8_4_ = fVar226;
  auVar205._12_4_ = fVar226;
  auVar205._16_4_ = fVar226;
  auVar205._20_4_ = fVar226;
  auVar205._24_4_ = fVar226;
  auVar205._28_4_ = fVar226;
  auVar23 = vminps_avx(auVar185,auVar205);
  auVar154 = vminps_avx(auVar154,auVar23);
  auVar23._4_4_ = auVar154._4_4_ * 1.0000004;
  auVar23._0_4_ = auVar154._0_4_ * 1.0000004;
  auVar23._8_4_ = auVar154._8_4_ * 1.0000004;
  auVar23._12_4_ = auVar154._12_4_ * 1.0000004;
  auVar23._16_4_ = auVar154._16_4_ * 1.0000004;
  auVar23._20_4_ = auVar154._20_4_ * 1.0000004;
  auVar23._24_4_ = auVar154._24_4_ * 1.0000004;
  auVar23._28_4_ = auVar154._28_4_;
  auVar154 = vcmpps_avx(local_80,auVar23,2);
  auVar385 = vpshufd_avx(ZEXT116((byte)PVar18),0);
  auVar186._16_16_ = auVar385;
  auVar186._0_16_ = auVar385;
  auVar23 = vcvtdq2ps_avx(auVar186);
  auVar23 = vcmpps_avx(_DAT_01f7b060,auVar23,1);
  auVar154 = vandps_avx(auVar154,auVar23);
  uVar146 = vmovmskps_avx(auVar154);
  local_4a0 = mm_lookupmask_ps._16_8_;
  uStack_498 = mm_lookupmask_ps._24_8_;
  uStack_490 = mm_lookupmask_ps._16_8_;
  uStack_488 = mm_lookupmask_ps._24_8_;
  for (uVar137 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar146); uVar137 != 0;
      uVar137 = (ulong)((uint)uVar137 & (uint)uVar137 + 0xff & uVar141)) {
    lVar144 = 0;
    if (uVar137 != 0) {
      for (; (uVar137 >> lVar144 & 1) == 0; lVar144 = lVar144 + 1) {
      }
    }
    local_720 = (ulong)*(uint *)(local_4a8 + 2);
    pGVar19 = (context->scene->geometries).items[*(uint *)(local_4a8 + 2)].ptr;
    local_668 = (ulong)*(uint *)(local_4a8 + lVar144 * 4 + 6);
    uVar140 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                              (ulong)*(uint *)(local_4a8 + lVar144 * 4 + 6) *
                              pGVar19[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar226 = (pGVar19->time_range).lower;
    fVar226 = pGVar19->fnumTimeSegments *
              (((ray->dir).field_0.m128[3] - fVar226) / ((pGVar19->time_range).upper - fVar226));
    auVar385 = vroundss_avx(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),9);
    auVar385 = vminss_avx(auVar385,ZEXT416((uint)(pGVar19->fnumTimeSegments + -1.0)));
    auVar385 = vmaxss_avx(ZEXT816(0) << 0x20,auVar385);
    fVar226 = fVar226 - auVar385._0_4_;
    _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar145 = (long)(int)auVar385._0_4_ * 0x38;
    lVar144 = *(long *)(_Var20 + 0x10 + lVar145);
    lVar147 = *(long *)(_Var20 + 0x38 + lVar145);
    lVar142 = *(long *)(_Var20 + 0x48 + lVar145);
    auVar385 = vshufps_avx(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),0);
    pfVar1 = (float *)(lVar147 + uVar140 * lVar142);
    fVar262 = auVar385._0_4_;
    fVar275 = auVar385._4_4_;
    fVar239 = auVar385._8_4_;
    fVar263 = auVar385._12_4_;
    pfVar2 = (float *)(lVar147 + (uVar140 + 1) * lVar142);
    pfVar3 = (float *)(lVar147 + (uVar140 + 2) * lVar142);
    pfVar4 = (float *)(lVar147 + lVar142 * (uVar140 + 3));
    lVar147 = *(long *)(_Var20 + lVar145);
    auVar385 = vshufps_avx(ZEXT416((uint)(1.0 - fVar226)),ZEXT416((uint)(1.0 - fVar226)),0);
    pfVar5 = (float *)(lVar147 + lVar144 * uVar140);
    fVar226 = auVar385._0_4_;
    fVar253 = auVar385._4_4_;
    fVar270 = auVar385._8_4_;
    fVar237 = auVar385._12_4_;
    pfVar6 = (float *)(lVar147 + lVar144 * (uVar140 + 1));
    local_6b0 = (undefined1  [8])
                CONCAT44(fVar275 * pfVar1[1] + fVar253 * pfVar5[1],
                         fVar262 * *pfVar1 + fVar226 * *pfVar5);
    uStack_6a8._0_4_ = fVar239 * pfVar1[2] + fVar270 * pfVar5[2];
    uStack_6a8._4_4_ = fVar263 * pfVar1[3] + fVar237 * pfVar5[3];
    local_6c0 = (undefined1  [8])
                CONCAT44(fVar253 * pfVar6[1] + fVar275 * pfVar2[1],
                         fVar226 * *pfVar6 + fVar262 * *pfVar2);
    uStack_6b8._0_4_ = fVar270 * pfVar6[2] + fVar239 * pfVar2[2];
    uStack_6b8._4_4_ = fVar237 * pfVar6[3] + fVar263 * pfVar2[3];
    pfVar1 = (float *)(lVar147 + lVar144 * (uVar140 + 2));
    pfVar2 = (float *)(lVar147 + lVar144 * (uVar140 + 3));
    local_5b0 = (undefined1  [8])
                CONCAT44(fVar253 * pfVar1[1] + fVar275 * pfVar3[1],
                         fVar226 * *pfVar1 + fVar262 * *pfVar3);
    uStack_5a8._0_4_ = fVar270 * pfVar1[2] + fVar239 * pfVar3[2];
    uStack_5a8._4_4_ = fVar237 * pfVar1[3] + fVar263 * pfVar3[3];
    local_5c0._0_4_ = fVar226 * *pfVar2 + fVar262 * *pfVar4;
    local_5c0._4_4_ = fVar253 * pfVar2[1] + fVar275 * pfVar4[1];
    fStack_5b8 = fVar270 * pfVar2[2] + fVar239 * pfVar4[2];
    fStack_5b4 = fVar237 * pfVar2[3] + fVar263 * pfVar4[3];
    uVar141 = (uint)pGVar19[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar9 = (ray->org).field_0;
    auVar215 = vsubps_avx(_local_6b0,(undefined1  [16])aVar9);
    auVar34 = _local_6b0;
    auVar385 = vshufps_avx(auVar215,auVar215,0);
    auVar214 = vshufps_avx(auVar215,auVar215,0x55);
    auVar215 = vshufps_avx(auVar215,auVar215,0xaa);
    fVar226 = (local_718->ray_space).vx.field_0.m128[0];
    fVar253 = (local_718->ray_space).vx.field_0.m128[1];
    fVar270 = (local_718->ray_space).vx.field_0.m128[2];
    fVar237 = (local_718->ray_space).vx.field_0.m128[3];
    fVar262 = (local_718->ray_space).vy.field_0.m128[0];
    fVar275 = (local_718->ray_space).vy.field_0.m128[1];
    fVar239 = (local_718->ray_space).vy.field_0.m128[2];
    fVar263 = (local_718->ray_space).vy.field_0.m128[3];
    fVar278 = (local_718->ray_space).vz.field_0.m128[0];
    fVar241 = (local_718->ray_space).vz.field_0.m128[1];
    fVar264 = (local_718->ray_space).vz.field_0.m128[2];
    fVar281 = (local_718->ray_space).vz.field_0.m128[3];
    auVar340._0_4_ = auVar385._0_4_ * fVar226 + auVar215._0_4_ * fVar278 + auVar214._0_4_ * fVar262;
    auVar340._4_4_ = auVar385._4_4_ * fVar253 + auVar215._4_4_ * fVar241 + auVar214._4_4_ * fVar275;
    auVar340._8_4_ = auVar385._8_4_ * fVar270 + auVar215._8_4_ * fVar264 + auVar214._8_4_ * fVar239;
    auVar340._12_4_ =
         auVar385._12_4_ * fVar237 + auVar215._12_4_ * fVar281 + auVar214._12_4_ * fVar263;
    auVar385 = vblendps_avx(auVar340,_local_6b0,8);
    auVar33 = _local_6c0;
    auVar216 = vsubps_avx(_local_6c0,(undefined1  [16])aVar9);
    auVar214 = vshufps_avx(auVar216,auVar216,0);
    auVar215 = vshufps_avx(auVar216,auVar216,0x55);
    auVar216 = vshufps_avx(auVar216,auVar216,0xaa);
    auVar358._0_4_ = auVar214._0_4_ * fVar226 + auVar216._0_4_ * fVar278 + auVar215._0_4_ * fVar262;
    auVar358._4_4_ = auVar214._4_4_ * fVar253 + auVar216._4_4_ * fVar241 + auVar215._4_4_ * fVar275;
    auVar358._8_4_ = auVar214._8_4_ * fVar270 + auVar216._8_4_ * fVar264 + auVar215._8_4_ * fVar239;
    auVar358._12_4_ =
         auVar214._12_4_ * fVar237 + auVar216._12_4_ * fVar281 + auVar215._12_4_ * fVar263;
    auVar214 = vblendps_avx(auVar358,_local_6c0,8);
    auVar31 = vsubps_avx(_local_5b0,(undefined1  [16])aVar9);
    auVar215 = vshufps_avx(auVar31,auVar31,0);
    auVar216 = vshufps_avx(auVar31,auVar31,0x55);
    auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
    auVar291._0_4_ = auVar215._0_4_ * fVar226 + auVar216._0_4_ * fVar262 + auVar31._0_4_ * fVar278;
    auVar291._4_4_ = auVar215._4_4_ * fVar253 + auVar216._4_4_ * fVar275 + auVar31._4_4_ * fVar241;
    auVar291._8_4_ = auVar215._8_4_ * fVar270 + auVar216._8_4_ * fVar239 + auVar31._8_4_ * fVar264;
    auVar291._12_4_ =
         auVar215._12_4_ * fVar237 + auVar216._12_4_ * fVar263 + auVar31._12_4_ * fVar281;
    auVar215 = vblendps_avx(auVar291,_local_5b0,8);
    auVar32 = vsubps_avx(_local_5c0,(undefined1  [16])aVar9);
    auVar216 = vshufps_avx(auVar32,auVar32,0xaa);
    auVar31 = vshufps_avx(auVar32,auVar32,0);
    auVar32 = vshufps_avx(auVar32,auVar32,0x55);
    auVar181._0_4_ = auVar31._0_4_ * fVar226 + auVar216._0_4_ * fVar278 + auVar32._0_4_ * fVar262;
    auVar181._4_4_ = auVar31._4_4_ * fVar253 + auVar216._4_4_ * fVar241 + auVar32._4_4_ * fVar275;
    auVar181._8_4_ = auVar31._8_4_ * fVar270 + auVar216._8_4_ * fVar264 + auVar32._8_4_ * fVar239;
    auVar181._12_4_ =
         auVar31._12_4_ * fVar237 + auVar216._12_4_ * fVar281 + auVar32._12_4_ * fVar263;
    auVar216 = vblendps_avx(auVar181,_local_5c0,8);
    auVar230._8_4_ = 0x7fffffff;
    auVar230._0_8_ = 0x7fffffff7fffffff;
    auVar230._12_4_ = 0x7fffffff;
    auVar385 = vandps_avx(auVar385,auVar230);
    auVar214 = vandps_avx(auVar214,auVar230);
    auVar31 = vmaxps_avx(auVar385,auVar214);
    auVar385 = vandps_avx(auVar215,auVar230);
    auVar214 = vandps_avx(auVar216,auVar230);
    auVar385 = vmaxps_avx(auVar385,auVar214);
    auVar385 = vmaxps_avx(auVar31,auVar385);
    auVar214 = vmovshdup_avx(auVar385);
    auVar214 = vmaxss_avx(auVar214,auVar385);
    auVar385 = vshufpd_avx(auVar385,auVar385,1);
    auVar385 = vmaxss_avx(auVar385,auVar214);
    local_7c8 = (long)(int)uVar141;
    lVar144 = local_7c8 * 0x44;
    fVar250 = *(float *)(catmullrom_basis0 + lVar144 + 0x908);
    fVar267 = *(float *)(catmullrom_basis0 + lVar144 + 0x90c);
    fVar287 = *(float *)(catmullrom_basis0 + lVar144 + 0x910);
    fVar268 = *(float *)(catmullrom_basis0 + lVar144 + 0x914);
    fVar347 = *(float *)(catmullrom_basis0 + lVar144 + 0x918);
    fVar288 = *(float *)(catmullrom_basis0 + lVar144 + 0x91c);
    fVar210 = *(float *)(catmullrom_basis0 + lVar144 + 0x920);
    local_640._0_16_ = auVar291;
    auVar214 = vshufps_avx(auVar291,auVar291,0);
    register0x00001250 = auVar214;
    _local_7c0 = auVar214;
    fVar275 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar144 + 0xd8c);
    fVar263 = *(float *)(catmullrom_basis0 + lVar144 + 0xd90);
    fVar278 = *(float *)(catmullrom_basis0 + lVar144 + 0xd94);
    fVar264 = *(float *)(catmullrom_basis0 + lVar144 + 0xd98);
    fVar281 = *(float *)(catmullrom_basis0 + lVar144 + 0xd9c);
    fVar244 = *(float *)(catmullrom_basis0 + lVar144 + 0xda0);
    fVar265 = *(float *)(catmullrom_basis0 + lVar144 + 0xda4);
    auVar133 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar144 + 0xd8c);
    auVar215 = vshufps_avx(auVar181,auVar181,0);
    register0x00001590 = auVar215;
    _local_420 = auVar215;
    fVar366 = auVar215._0_4_;
    fVar371 = auVar215._4_4_;
    fVar373 = auVar215._8_4_;
    fVar375 = auVar215._12_4_;
    fVar179 = auVar214._0_4_;
    fVar191 = auVar214._4_4_;
    fVar192 = auVar214._8_4_;
    fVar193 = auVar214._12_4_;
    auVar214 = vshufps_avx(auVar291,auVar291,0x55);
    register0x000012d0 = auVar214;
    _local_760 = auVar214;
    auVar215 = vshufps_avx(auVar181,auVar181,0x55);
    register0x00001210 = auVar215;
    _local_740 = auVar215;
    fVar148 = auVar215._0_4_;
    fVar167 = auVar215._4_4_;
    fVar170 = auVar215._8_4_;
    fVar173 = auVar215._12_4_;
    fVar212 = auVar214._0_4_;
    fVar223 = auVar214._4_4_;
    fVar224 = auVar214._8_4_;
    fVar225 = auVar214._12_4_;
    auVar32 = _local_5b0;
    auVar214 = vshufps_avx(_local_5b0,_local_5b0,0xff);
    register0x00001390 = auVar214;
    _local_a0 = auVar214;
    auVar215 = vshufps_avx(_local_5c0,_local_5c0,0xff);
    register0x00001450 = auVar215;
    _local_c0 = auVar215;
    fVar296 = auVar215._0_4_;
    fVar297 = auVar215._4_4_;
    fVar321 = auVar215._8_4_;
    fVar322 = auVar215._12_4_;
    fVar285 = auVar214._0_4_;
    fVar276 = auVar214._4_4_;
    fVar279 = auVar214._8_4_;
    auVar215 = vshufps_avx(auVar358,auVar358,0);
    register0x00001310 = auVar215;
    _local_780 = auVar215;
    fVar243 = *(float *)(catmullrom_basis0 + lVar144 + 0x484);
    fVar194 = *(float *)(catmullrom_basis0 + lVar144 + 0x488);
    fVar307 = *(float *)(catmullrom_basis0 + lVar144 + 0x48c);
    fVar310 = *(float *)(catmullrom_basis0 + lVar144 + 0x490);
    fVar246 = *(float *)(catmullrom_basis0 + lVar144 + 0x494);
    fVar195 = *(float *)(catmullrom_basis0 + lVar144 + 0x498);
    fVar312 = *(float *)(catmullrom_basis0 + lVar144 + 0x49c);
    fVar284 = auVar215._0_4_;
    fVar286 = auVar215._4_4_;
    fVar289 = auVar215._8_4_;
    fVar290 = auVar215._12_4_;
    auVar215 = vshufps_avx(auVar358,auVar358,0x55);
    register0x00001290 = auVar215;
    _local_320 = auVar215;
    fVar271 = auVar215._0_4_;
    fVar277 = auVar215._4_4_;
    fVar280 = auVar215._8_4_;
    fVar282 = auVar215._12_4_;
    auVar215 = vpermilps_avx(_local_6c0,0xff);
    register0x000015d0 = auVar215;
    _local_140 = auVar215;
    fVar338 = auVar215._0_4_;
    fVar339 = auVar215._4_4_;
    fVar367 = auVar215._8_4_;
    fVar372 = auVar215._12_4_;
    auVar215 = vshufps_avx(auVar340,auVar340,0);
    register0x00001250 = auVar215;
    _local_660 = auVar215;
    pauVar7 = (undefined1 (*) [16])(catmullrom_basis0 + lVar144);
    fVar283 = *(float *)*pauVar7;
    fVar247 = *(float *)(catmullrom_basis0 + lVar144 + 4);
    fVar266 = *(float *)(catmullrom_basis0 + lVar144 + 8);
    auVar308 = *(undefined1 (*) [12])*pauVar7;
    fVar313 = *(float *)(catmullrom_basis0 + lVar144 + 0xc);
    fStack_370 = *(float *)(catmullrom_basis0 + lVar144 + 0x10);
    fStack_36c = *(float *)(catmullrom_basis0 + lVar144 + 0x14);
    fStack_368 = *(float *)(catmullrom_basis0 + lVar144 + 0x18);
    fVar226 = auVar215._0_4_;
    fVar237 = auVar215._4_4_;
    fVar239 = auVar215._8_4_;
    fVar241 = auVar215._12_4_;
    auVar327._0_4_ = fVar283 * fVar226 + fVar284 * fVar243 + fVar179 * fVar250 + fVar366 * fVar275;
    auVar327._4_4_ = fVar247 * fVar237 + fVar286 * fVar194 + fVar191 * fVar267 + fVar371 * fVar263;
    auVar327._8_4_ = fVar266 * fVar239 + fVar289 * fVar307 + fVar192 * fVar287 + fVar373 * fVar278;
    auVar327._12_4_ = fVar313 * fVar241 + fVar290 * fVar310 + fVar193 * fVar268 + fVar375 * fVar264;
    auVar334._16_4_ =
         fStack_370 * fVar226 + fVar284 * fVar246 + fVar179 * fVar347 + fVar366 * fVar281;
    auVar334._0_16_ = auVar327;
    auVar334._20_4_ =
         fStack_36c * fVar237 + fVar286 * fVar195 + fVar191 * fVar288 + fVar371 * fVar244;
    auVar334._24_4_ =
         fStack_368 * fVar239 + fVar289 * fVar312 + fVar192 * fVar210 + fVar373 * fVar265;
    auVar334._28_4_ = *(float *)(catmullrom_basis0 + lVar144 + 0xda8) + fVar193 + 0.0 + 0.0;
    auVar215 = vshufps_avx(auVar340,auVar340,0x55);
    register0x00001410 = auVar215;
    _local_340 = auVar215;
    fVar299 = auVar215._0_4_;
    fVar306 = auVar215._4_4_;
    fVar309 = auVar215._8_4_;
    fVar311 = auVar215._12_4_;
    auVar361._0_4_ = fVar299 * fVar283 + fVar271 * fVar243 + fVar212 * fVar250 + fVar148 * fVar275;
    auVar361._4_4_ = fVar306 * fVar247 + fVar277 * fVar194 + fVar223 * fVar267 + fVar167 * fVar263;
    auVar361._8_4_ = fVar309 * fVar266 + fVar280 * fVar307 + fVar224 * fVar287 + fVar170 * fVar278;
    auVar361._12_4_ = fVar311 * fVar313 + fVar282 * fVar310 + fVar225 * fVar268 + fVar173 * fVar264;
    auVar361._16_4_ =
         fVar299 * fStack_370 + fVar271 * fVar246 + fVar212 * fVar347 + fVar148 * fVar281;
    auVar361._20_4_ =
         fVar306 * fStack_36c + fVar277 * fVar195 + fVar223 * fVar288 + fVar167 * fVar244;
    auVar361._24_4_ =
         fVar309 * fStack_368 + fVar280 * fVar312 + fVar224 * fVar210 + fVar170 * fVar265;
    auVar361._28_4_ = fVar225 + fVar173 + 0.0 + 0.0;
    auVar215 = vpermilps_avx(_local_6b0,0xff);
    register0x000013d0 = auVar215;
    _local_e0 = auVar215;
    _local_380 = *pauVar7;
    auVar35 = _local_380;
    uStack_364 = *(undefined4 *)(catmullrom_basis0 + lVar144 + 0x1c);
    fVar253 = auVar215._0_4_;
    fVar270 = auVar215._4_4_;
    fVar262 = auVar215._8_4_;
    local_7a0._0_4_ = fVar283 * fVar253 + fVar338 * fVar243 + fVar285 * fVar250 + fVar296 * fVar275;
    local_7a0._4_4_ = fVar247 * fVar270 + fVar339 * fVar194 + fVar276 * fVar267 + fVar297 * fVar263;
    fStack_798 = fVar266 * fVar262 + fVar367 * fVar307 + fVar279 * fVar287 + fVar321 * fVar278;
    fStack_794 = fVar313 * auVar215._12_4_ +
                 fVar372 * fVar310 + auVar214._12_4_ * fVar268 + fVar322 * fVar264;
    fStack_790 = fStack_370 * fVar253 + fVar338 * fVar246 + fVar285 * fVar347 + fVar296 * fVar281;
    fStack_78c = fStack_36c * fVar270 + fVar339 * fVar195 + fVar276 * fVar288 + fVar297 * fVar244;
    fStack_788 = fStack_368 * fVar262 + fVar367 * fVar312 + fVar279 * fVar210 + fVar321 * fVar265;
    fStack_784 = 0.0;
    fVar249 = *(float *)(catmullrom_basis1 + lVar144 + 0x908);
    fVar196 = *(float *)(catmullrom_basis1 + lVar144 + 0x90c);
    fVar323 = *(float *)(catmullrom_basis1 + lVar144 + 0x910);
    fVar324 = *(float *)(catmullrom_basis1 + lVar144 + 0x914);
    fVar325 = *(float *)(catmullrom_basis1 + lVar144 + 0x918);
    fVar326 = *(float *)(catmullrom_basis1 + lVar144 + 0x91c);
    fVar211 = *(float *)(catmullrom_basis1 + lVar144 + 0x920);
    fVar149 = *(float *)(catmullrom_basis1 + lVar144 + 0xd8c);
    fVar168 = *(float *)(catmullrom_basis1 + lVar144 + 0xd90);
    fVar171 = *(float *)(catmullrom_basis1 + lVar144 + 0xd94);
    fVar197 = *(float *)(catmullrom_basis1 + lVar144 + 0xd98);
    fVar298 = *(float *)(catmullrom_basis1 + lVar144 + 0xd9c);
    fVar178 = *(float *)(catmullrom_basis1 + lVar144 + 0xda0);
    fVar252 = *(float *)(catmullrom_basis1 + lVar144 + 0xda4);
    fVar275 = fVar290 + 0.0;
    fVar227 = *(float *)(catmullrom_basis1 + lVar144 + 0x484);
    fVar238 = *(float *)(catmullrom_basis1 + lVar144 + 0x488);
    fVar240 = *(float *)(catmullrom_basis1 + lVar144 + 0x48c);
    fVar242 = *(float *)(catmullrom_basis1 + lVar144 + 0x490);
    fVar245 = *(float *)(catmullrom_basis1 + lVar144 + 0x494);
    fVar248 = *(float *)(catmullrom_basis1 + lVar144 + 0x498);
    fVar251 = *(float *)(catmullrom_basis1 + lVar144 + 0x49c);
    auVar209 = ZEXT3264(_local_660);
    fVar278 = fVar275 + fVar290 + 0.0;
    fVar269 = fVar275 + fVar322 + 0.0;
    fVar169 = *(float *)(catmullrom_basis1 + lVar144);
    fVar172 = *(float *)(catmullrom_basis1 + lVar144 + 4);
    fVar174 = *(float *)(catmullrom_basis1 + lVar144 + 8);
    fVar175 = *(float *)(catmullrom_basis1 + lVar144 + 0xc);
    fVar176 = *(float *)(catmullrom_basis1 + lVar144 + 0x10);
    fVar177 = *(float *)(catmullrom_basis1 + lVar144 + 0x14);
    fVar198 = *(float *)(catmullrom_basis1 + lVar144 + 0x18);
    local_360._0_4_ = fVar226 * fVar169 + fVar284 * fVar227 + fVar249 * fVar179 + fVar366 * fVar149;
    local_360._4_4_ = fVar237 * fVar172 + fVar286 * fVar238 + fVar196 * fVar191 + fVar371 * fVar168;
    local_360._8_4_ = fVar239 * fVar174 + fVar289 * fVar240 + fVar323 * fVar192 + fVar373 * fVar171;
    local_360._12_4_ = fVar241 * fVar175 + fVar290 * fVar242 + fVar324 * fVar193 + fVar375 * fVar197
    ;
    local_360._16_4_ = fVar226 * fVar176 + fVar284 * fVar245 + fVar325 * fVar179 + fVar366 * fVar298
    ;
    local_360._20_4_ = fVar237 * fVar177 + fVar286 * fVar248 + fVar326 * fVar191 + fVar371 * fVar178
    ;
    local_360._24_4_ = fVar239 * fVar198 + fVar289 * fVar251 + fVar211 * fVar192 + fVar373 * fVar252
    ;
    local_360._28_4_ = fVar372 + fVar375 + fVar275;
    local_480._0_4_ = fVar299 * fVar169 + fVar227 * fVar271 + fVar249 * fVar212 + fVar149 * fVar148;
    local_480._4_4_ = fVar306 * fVar172 + fVar238 * fVar277 + fVar196 * fVar223 + fVar168 * fVar167;
    fStack_478 = fVar309 * fVar174 + fVar240 * fVar280 + fVar323 * fVar224 + fVar171 * fVar170;
    fStack_474 = fVar311 * fVar175 + fVar242 * fVar282 + fVar324 * fVar225 + fVar197 * fVar173;
    fStack_470 = fVar299 * fVar176 + fVar245 * fVar271 + fVar325 * fVar212 + fVar298 * fVar148;
    fStack_46c = fVar306 * fVar177 + fVar248 * fVar277 + fVar326 * fVar223 + fVar178 * fVar167;
    fStack_468 = fVar309 * fVar198 + fVar251 * fVar280 + fVar211 * fVar224 + fVar252 * fVar170;
    register0x0000159c = fVar375 + fVar275 + fVar278;
    local_6e0._0_4_ = fVar253 * fVar169 + fVar338 * fVar227 + fVar285 * fVar249 + fVar296 * fVar149;
    local_6e0._4_4_ = fVar270 * fVar172 + fVar339 * fVar238 + fVar276 * fVar196 + fVar297 * fVar168;
    local_6e0._8_4_ = fVar262 * fVar174 + fVar367 * fVar240 + fVar279 * fVar323 + fVar321 * fVar171;
    local_6e0._12_4_ =
         auVar215._12_4_ * fVar175 +
         fVar372 * fVar242 + auVar214._12_4_ * fVar324 + fVar322 * fVar197;
    local_6e0._16_4_ = fVar253 * fVar176 + fVar338 * fVar245 + fVar285 * fVar325 + fVar296 * fVar298
    ;
    local_6e0._20_4_ = fVar270 * fVar177 + fVar339 * fVar248 + fVar276 * fVar326 + fVar297 * fVar178
    ;
    local_6e0._24_4_ = fVar262 * fVar198 + fVar367 * fVar251 + fVar279 * fVar211 + fVar321 * fVar252
    ;
    local_6e0._28_4_ = fVar278 + fVar269;
    auVar24 = vsubps_avx(local_360,auVar334);
    auVar25 = vsubps_avx(_local_480,auVar361);
    fVar253 = auVar24._0_4_;
    fVar262 = auVar24._4_4_;
    auVar44._4_4_ = auVar361._4_4_ * fVar262;
    auVar44._0_4_ = auVar361._0_4_ * fVar253;
    fVar263 = auVar24._8_4_;
    auVar44._8_4_ = auVar361._8_4_ * fVar263;
    fVar264 = auVar24._12_4_;
    auVar44._12_4_ = auVar361._12_4_ * fVar264;
    fVar244 = auVar24._16_4_;
    auVar44._16_4_ = auVar361._16_4_ * fVar244;
    fVar283 = auVar24._20_4_;
    auVar44._20_4_ = auVar361._20_4_ * fVar283;
    fVar266 = auVar24._24_4_;
    auVar44._24_4_ = auVar361._24_4_ * fVar266;
    auVar44._28_4_ = fVar278;
    fVar270 = auVar25._0_4_;
    fVar275 = auVar25._4_4_;
    auVar45._4_4_ = auVar327._4_4_ * fVar275;
    auVar45._0_4_ = auVar327._0_4_ * fVar270;
    fVar278 = auVar25._8_4_;
    auVar45._8_4_ = auVar327._8_4_ * fVar278;
    fVar281 = auVar25._12_4_;
    auVar45._12_4_ = auVar327._12_4_ * fVar281;
    fVar265 = auVar25._16_4_;
    auVar45._16_4_ = auVar334._16_4_ * fVar265;
    fVar247 = auVar25._20_4_;
    auVar45._20_4_ = auVar334._20_4_ * fVar247;
    fVar285 = auVar25._24_4_;
    auVar45._24_4_ = auVar334._24_4_ * fVar285;
    auVar45._28_4_ = fVar269;
    auVar23 = vsubps_avx(auVar44,auVar45);
    auVar154 = vmaxps_avx(_local_7a0,local_6e0);
    auVar46._4_4_ = auVar154._4_4_ * auVar154._4_4_ * (fVar262 * fVar262 + fVar275 * fVar275);
    auVar46._0_4_ = auVar154._0_4_ * auVar154._0_4_ * (fVar253 * fVar253 + fVar270 * fVar270);
    auVar46._8_4_ = auVar154._8_4_ * auVar154._8_4_ * (fVar263 * fVar263 + fVar278 * fVar278);
    auVar46._12_4_ = auVar154._12_4_ * auVar154._12_4_ * (fVar264 * fVar264 + fVar281 * fVar281);
    auVar46._16_4_ = auVar154._16_4_ * auVar154._16_4_ * (fVar244 * fVar244 + fVar265 * fVar265);
    auVar46._20_4_ = auVar154._20_4_ * auVar154._20_4_ * (fVar283 * fVar283 + fVar247 * fVar247);
    auVar46._24_4_ = auVar154._24_4_ * auVar154._24_4_ * (fVar266 * fVar266 + fVar285 * fVar285);
    auVar46._28_4_ = local_360._28_4_ + fVar269;
    auVar47._4_4_ = auVar23._4_4_ * auVar23._4_4_;
    auVar47._0_4_ = auVar23._0_4_ * auVar23._0_4_;
    auVar47._8_4_ = auVar23._8_4_ * auVar23._8_4_;
    auVar47._12_4_ = auVar23._12_4_ * auVar23._12_4_;
    auVar47._16_4_ = auVar23._16_4_ * auVar23._16_4_;
    auVar47._20_4_ = auVar23._20_4_ * auVar23._20_4_;
    auVar47._24_4_ = auVar23._24_4_ * auVar23._24_4_;
    auVar47._28_4_ = auVar23._28_4_;
    auVar154 = vcmpps_avx(auVar47,auVar46,2);
    fVar253 = auVar385._0_4_ * 4.7683716e-07;
    auVar190 = ZEXT464((uint)fVar253);
    auVar255._0_4_ = (float)(int)uVar141;
    auVar255._4_12_ = auVar327._4_12_;
    local_440 = auVar255._0_4_;
    fStack_43c = auVar327._4_4_;
    fStack_438 = auVar327._8_4_;
    fStack_434 = auVar327._12_4_;
    auVar385 = vshufps_avx(auVar255,auVar255,0);
    auVar259._16_16_ = auVar385;
    auVar259._0_16_ = auVar385;
    auVar23 = vcmpps_avx(_DAT_01f7b060,auVar259,1);
    auVar385 = vpermilps_avx(auVar340,0xaa);
    register0x000013d0 = auVar385;
    _local_460 = auVar385;
    auVar214 = vpermilps_avx(auVar358,0xaa);
    register0x00001590 = auVar214;
    _local_2e0 = auVar214;
    auVar215 = vpermilps_avx(auVar291,0xaa);
    register0x000015d0 = auVar215;
    _local_300 = auVar215;
    auVar216 = vpermilps_avx(auVar181,0xaa);
    register0x00001490 = auVar216;
    _local_5a0 = auVar216;
    auVar26 = auVar23 & auVar154;
    auVar31 = vpermilps_avx((undefined1  [16])aVar9,0xff);
    local_620 = ZEXT1632(auVar31);
    fVar270 = fVar148;
    fVar262 = fVar167;
    fVar275 = fVar170;
    fVar263 = fVar173;
    fVar278 = fVar179;
    fVar264 = fVar191;
    fVar281 = fVar192;
    fVar244 = fVar212;
    fVar265 = fVar223;
    fVar283 = fVar224;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar26 >> 0x7f,0) == '\0') &&
          (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar26 >> 0xbf,0) == '\0') &&
        (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar26[0x1f]) {
      bVar143 = 0;
      auVar320 = ZEXT3264(_local_780);
      auVar370 = ZEXT3264(_local_660);
      local_620._0_16_ = auVar31;
    }
    else {
      _local_3a0 = vandps_avx(auVar154,auVar23);
      fVar276 = auVar385._0_4_;
      fVar279 = auVar385._4_4_;
      fVar296 = auVar385._8_4_;
      fVar297 = auVar385._12_4_;
      fVar367 = auVar214._0_4_;
      fVar372 = auVar214._4_4_;
      fVar374 = auVar214._8_4_;
      fVar376 = auVar214._12_4_;
      fVar377 = auVar215._0_4_;
      fVar382 = auVar215._4_4_;
      fVar383 = auVar215._8_4_;
      fVar384 = auVar215._12_4_;
      fVar321 = auVar216._0_4_;
      fVar322 = auVar216._4_4_;
      fVar338 = auVar216._8_4_;
      fVar339 = auVar216._12_4_;
      fVar269 = auVar23._28_4_ + 0.0;
      fVar247 = local_3a0._28_4_ + fVar269;
      local_3c0._0_4_ =
           fVar276 * fVar169 + fVar367 * fVar227 + fVar377 * fVar249 + fVar321 * fVar149;
      local_3c0._4_4_ =
           fVar279 * fVar172 + fVar372 * fVar238 + fVar382 * fVar196 + fVar322 * fVar168;
      fStack_3b8 = fVar296 * fVar174 + fVar374 * fVar240 + fVar383 * fVar323 + fVar338 * fVar171;
      fStack_3b4 = fVar297 * fVar175 + fVar376 * fVar242 + fVar384 * fVar324 + fVar339 * fVar197;
      fStack_3b0 = fVar276 * fVar176 + fVar367 * fVar245 + fVar377 * fVar325 + fVar321 * fVar298;
      fStack_3ac = fVar279 * fVar177 + fVar372 * fVar248 + fVar382 * fVar326 + fVar322 * fVar178;
      fStack_3a8 = fVar296 * fVar198 + fVar374 * fVar251 + fVar383 * fVar211 + fVar338 * fVar252;
      fStack_3a4 = *(float *)(catmullrom_basis1 + lVar144 + 0x1c) + fVar247;
      local_640._0_16_ = ZEXT416((uint)fVar253);
      local_380._0_4_ = auVar308._0_4_;
      local_380._4_4_ = auVar308._4_4_;
      fStack_378 = auVar308._8_4_;
      local_600._0_4_ = auVar133._0_4_;
      local_600._4_4_ = auVar133._4_4_;
      fStack_5f8 = auVar133._8_4_;
      fStack_5f4 = auVar133._12_4_;
      fStack_5f0 = auVar133._16_4_;
      fStack_5ec = auVar133._20_4_;
      fStack_5e8 = auVar133._24_4_;
      local_5e0 = fVar276 * (float)local_380._0_4_ +
                  fVar367 * fVar243 + fVar377 * fVar250 + fVar321 * (float)local_600._0_4_;
      fStack_5dc = fVar279 * (float)local_380._4_4_ +
                   fVar372 * fVar194 + fVar382 * fVar267 + fVar322 * (float)local_600._4_4_;
      fStack_5d8 = fVar296 * fStack_378 +
                   fVar374 * fVar307 + fVar383 * fVar287 + fVar338 * fStack_5f8;
      fStack_5d4 = fVar297 * fVar313 + fVar376 * fVar310 + fVar384 * fVar268 + fVar339 * fStack_5f4;
      fStack_5d0 = fVar276 * fStack_370 +
                   fVar367 * fVar246 + fVar377 * fVar347 + fVar321 * fStack_5f0;
      fStack_5cc = fVar279 * fStack_36c +
                   fVar372 * fVar195 + fVar382 * fVar288 + fVar322 * fStack_5ec;
      fStack_5c8 = fVar296 * fStack_368 +
                   fVar374 * fVar312 + fVar383 * fVar210 + fVar338 * fStack_5e8;
      fStack_5c4 = fStack_3a4 + *(float *)(catmullrom_basis1 + lVar144 + 0x1c) + fVar247 + 0.0;
      fVar247 = *(float *)(catmullrom_basis0 + lVar144 + 0x1210);
      fVar266 = *(float *)(catmullrom_basis0 + lVar144 + 0x1214);
      fVar285 = *(float *)(catmullrom_basis0 + lVar144 + 0x1218);
      fVar250 = *(float *)(catmullrom_basis0 + lVar144 + 0x121c);
      fVar267 = *(float *)(catmullrom_basis0 + lVar144 + 0x1220);
      fVar287 = *(float *)(catmullrom_basis0 + lVar144 + 0x1224);
      fVar268 = *(float *)(catmullrom_basis0 + lVar144 + 0x1228);
      fVar347 = *(float *)(catmullrom_basis0 + lVar144 + 0x1694);
      fVar288 = *(float *)(catmullrom_basis0 + lVar144 + 0x1698);
      fVar210 = *(float *)(catmullrom_basis0 + lVar144 + 0x169c);
      fVar243 = *(float *)(catmullrom_basis0 + lVar144 + 0x16a0);
      fVar194 = *(float *)(catmullrom_basis0 + lVar144 + 0x16a4);
      fVar307 = *(float *)(catmullrom_basis0 + lVar144 + 0x16a8);
      fVar310 = *(float *)(catmullrom_basis0 + lVar144 + 0x16ac);
      fVar246 = *(float *)(catmullrom_basis0 + lVar144 + 0x1b18);
      fVar195 = *(float *)(catmullrom_basis0 + lVar144 + 0x1b1c);
      fVar312 = *(float *)(catmullrom_basis0 + lVar144 + 0x1b20);
      fVar313 = *(float *)(catmullrom_basis0 + lVar144 + 0x1b24);
      fVar249 = *(float *)(catmullrom_basis0 + lVar144 + 0x1b28);
      fVar196 = *(float *)(catmullrom_basis0 + lVar144 + 0x1b2c);
      fVar323 = *(float *)(catmullrom_basis0 + lVar144 + 0x1b30);
      fVar324 = *(float *)(catmullrom_basis0 + lVar144 + 0x1f9c);
      fVar325 = *(float *)(catmullrom_basis0 + lVar144 + 0x1fa0);
      fVar326 = *(float *)(catmullrom_basis0 + lVar144 + 0x1fa4);
      fVar211 = *(float *)(catmullrom_basis0 + lVar144 + 0x1fa8);
      fVar149 = *(float *)(catmullrom_basis0 + lVar144 + 0x1fac);
      fVar168 = *(float *)(catmullrom_basis0 + lVar144 + 0x1fb0);
      fVar171 = *(float *)(catmullrom_basis0 + lVar144 + 0x1fb4);
      fVar298 = *(float *)(catmullrom_basis1 + lVar144 + 0x4a0) + fVar297;
      fVar197 = *(float *)(catmullrom_basis0 + lVar144 + 0x1b34) +
                *(float *)(catmullrom_basis0 + lVar144 + 0x1fb8);
      fVar178 = *(float *)(catmullrom_basis0 + lVar144 + 0x16b0) + fVar197;
      local_580 = fVar226 * fVar247 + fVar347 * fVar284 + fVar179 * fVar246 + fVar366 * fVar324;
      fStack_57c = fVar237 * fVar266 + fVar288 * fVar286 + fVar191 * fVar195 + fVar371 * fVar325;
      fStack_578 = fVar239 * fVar285 + fVar210 * fVar289 + fVar192 * fVar312 + fVar373 * fVar326;
      fStack_574 = fVar241 * fVar250 + fVar243 * fVar290 + fVar193 * fVar313 + fVar375 * fVar211;
      fStack_570 = fVar226 * fVar267 + fVar194 * fVar284 + fVar179 * fVar249 + fVar366 * fVar149;
      fStack_56c = fVar237 * fVar287 + fVar307 * fVar286 + fVar191 * fVar196 + fVar371 * fVar168;
      fStack_568 = fVar239 * fVar268 + fVar310 * fVar289 + fVar192 * fVar323 + fVar373 * fVar171;
      fStack_564 = *(float *)(catmullrom_basis0 + lVar144 + 0x16b0) +
                   *(float *)(catmullrom_basis0 + lVar144 + 0x1fb8) + fVar298;
      auVar362._0_4_ = fVar299 * fVar247 + fVar212 * fVar246 + fVar148 * fVar324 + fVar271 * fVar347
      ;
      auVar362._4_4_ = fVar306 * fVar266 + fVar223 * fVar195 + fVar167 * fVar325 + fVar277 * fVar288
      ;
      auVar362._8_4_ = fVar309 * fVar285 + fVar224 * fVar312 + fVar170 * fVar326 + fVar280 * fVar210
      ;
      auVar362._12_4_ =
           fVar311 * fVar250 + fVar225 * fVar313 + fVar173 * fVar211 + fVar282 * fVar243;
      auVar362._16_4_ =
           fVar299 * fVar267 + fVar212 * fVar249 + fVar148 * fVar149 + fVar271 * fVar194;
      auVar362._20_4_ =
           fVar306 * fVar287 + fVar223 * fVar196 + fVar167 * fVar168 + fVar277 * fVar307;
      auVar362._24_4_ =
           fVar309 * fVar268 + fVar224 * fVar323 + fVar170 * fVar171 + fVar280 * fVar310;
      auVar362._28_4_ =
           fVar197 + *(float *)(catmullrom_basis1 + lVar144 + 0x4a0) + fVar269 + fVar298;
      auVar221._0_4_ = fVar367 * fVar347 + fVar377 * fVar246 + fVar321 * fVar324 + fVar276 * fVar247
      ;
      auVar221._4_4_ = fVar372 * fVar288 + fVar382 * fVar195 + fVar322 * fVar325 + fVar279 * fVar266
      ;
      auVar221._8_4_ = fVar374 * fVar210 + fVar383 * fVar312 + fVar338 * fVar326 + fVar296 * fVar285
      ;
      auVar221._12_4_ =
           fVar376 * fVar243 + fVar384 * fVar313 + fVar339 * fVar211 + fVar297 * fVar250;
      auVar221._16_4_ =
           fVar367 * fVar194 + fVar377 * fVar249 + fVar321 * fVar149 + fVar276 * fVar267;
      auVar221._20_4_ =
           fVar372 * fVar307 + fVar382 * fVar196 + fVar322 * fVar168 + fVar279 * fVar287;
      auVar221._24_4_ =
           fVar374 * fVar310 + fVar383 * fVar323 + fVar338 * fVar171 + fVar296 * fVar268;
      auVar221._28_4_ = fVar178 + *(float *)(catmullrom_basis0 + lVar144 + 0x122c);
      fVar247 = *(float *)(catmullrom_basis1 + lVar144 + 0x1b18);
      fVar266 = *(float *)(catmullrom_basis1 + lVar144 + 0x1b1c);
      fVar285 = *(float *)(catmullrom_basis1 + lVar144 + 0x1b20);
      fVar250 = *(float *)(catmullrom_basis1 + lVar144 + 0x1b24);
      fVar267 = *(float *)(catmullrom_basis1 + lVar144 + 0x1b28);
      fVar287 = *(float *)(catmullrom_basis1 + lVar144 + 0x1b2c);
      fVar268 = *(float *)(catmullrom_basis1 + lVar144 + 0x1b30);
      fVar347 = *(float *)(catmullrom_basis1 + lVar144 + 0x1f9c);
      fVar288 = *(float *)(catmullrom_basis1 + lVar144 + 0x1fa0);
      fVar210 = *(float *)(catmullrom_basis1 + lVar144 + 0x1fa4);
      fVar243 = *(float *)(catmullrom_basis1 + lVar144 + 0x1fa8);
      fVar194 = *(float *)(catmullrom_basis1 + lVar144 + 0x1fac);
      fVar307 = *(float *)(catmullrom_basis1 + lVar144 + 0x1fb0);
      fVar310 = *(float *)(catmullrom_basis1 + lVar144 + 0x1fb4);
      fVar246 = *(float *)(catmullrom_basis1 + lVar144 + 0x1694);
      fVar195 = *(float *)(catmullrom_basis1 + lVar144 + 0x1698);
      fVar312 = *(float *)(catmullrom_basis1 + lVar144 + 0x169c);
      fVar313 = *(float *)(catmullrom_basis1 + lVar144 + 0x16a0);
      fVar249 = *(float *)(catmullrom_basis1 + lVar144 + 0x16a4);
      fVar196 = *(float *)(catmullrom_basis1 + lVar144 + 0x16a8);
      fVar323 = *(float *)(catmullrom_basis1 + lVar144 + 0x16ac);
      fVar324 = *(float *)(catmullrom_basis1 + lVar144 + 0x1210);
      fVar325 = *(float *)(catmullrom_basis1 + lVar144 + 0x1214);
      fVar326 = *(float *)(catmullrom_basis1 + lVar144 + 0x1218);
      fVar211 = *(float *)(catmullrom_basis1 + lVar144 + 0x121c);
      fVar149 = *(float *)(catmullrom_basis1 + lVar144 + 0x1220);
      fVar168 = *(float *)(catmullrom_basis1 + lVar144 + 0x1224);
      fVar171 = *(float *)(catmullrom_basis1 + lVar144 + 0x1228);
      auVar302._0_4_ = fVar226 * fVar324 + fVar246 * fVar284 + fVar179 * fVar247 + fVar366 * fVar347
      ;
      auVar302._4_4_ = fVar237 * fVar325 + fVar195 * fVar286 + fVar191 * fVar266 + fVar371 * fVar288
      ;
      auVar302._8_4_ = fVar239 * fVar326 + fVar312 * fVar289 + fVar192 * fVar285 + fVar373 * fVar210
      ;
      auVar302._12_4_ =
           fVar241 * fVar211 + fVar313 * fVar290 + fVar193 * fVar250 + fVar375 * fVar243;
      auVar302._16_4_ =
           fVar226 * fVar149 + fVar249 * fVar284 + fVar179 * fVar267 + fVar366 * fVar194;
      auVar302._20_4_ =
           fVar237 * fVar168 + fVar196 * fVar286 + fVar191 * fVar287 + fVar371 * fVar307;
      auVar302._24_4_ =
           fVar239 * fVar171 + fVar323 * fVar289 + fVar192 * fVar268 + fVar373 * fVar310;
      auVar302._28_4_ = fVar225 + fVar225 + fVar178 + fVar375;
      auVar317._0_4_ = fVar299 * fVar324 + fVar271 * fVar246 + fVar212 * fVar247 + fVar148 * fVar347
      ;
      auVar317._4_4_ = fVar306 * fVar325 + fVar277 * fVar195 + fVar223 * fVar266 + fVar167 * fVar288
      ;
      auVar317._8_4_ = fVar309 * fVar326 + fVar280 * fVar312 + fVar224 * fVar285 + fVar170 * fVar210
      ;
      auVar317._12_4_ =
           fVar311 * fVar211 + fVar282 * fVar313 + fVar225 * fVar250 + fVar173 * fVar243;
      auVar317._16_4_ =
           fVar299 * fVar149 + fVar271 * fVar249 + fVar212 * fVar267 + fVar148 * fVar194;
      auVar317._20_4_ =
           fVar306 * fVar168 + fVar277 * fVar196 + fVar223 * fVar287 + fVar167 * fVar307;
      auVar317._24_4_ =
           fVar309 * fVar171 + fVar280 * fVar323 + fVar224 * fVar268 + fVar170 * fVar310;
      auVar317._28_4_ = fVar225 + fVar225 + fVar225 + fVar178;
      auVar232._0_4_ = fVar276 * fVar324 + fVar367 * fVar246 + fVar377 * fVar247 + fVar321 * fVar347
      ;
      auVar232._4_4_ = fVar279 * fVar325 + fVar372 * fVar195 + fVar382 * fVar266 + fVar322 * fVar288
      ;
      auVar232._8_4_ = fVar296 * fVar326 + fVar374 * fVar312 + fVar383 * fVar285 + fVar338 * fVar210
      ;
      auVar232._12_4_ =
           fVar297 * fVar211 + fVar376 * fVar313 + fVar384 * fVar250 + fVar339 * fVar243;
      auVar232._16_4_ =
           fVar276 * fVar149 + fVar367 * fVar249 + fVar377 * fVar267 + fVar321 * fVar194;
      auVar232._20_4_ =
           fVar279 * fVar168 + fVar372 * fVar196 + fVar382 * fVar287 + fVar322 * fVar307;
      auVar232._24_4_ =
           fVar296 * fVar171 + fVar374 * fVar323 + fVar383 * fVar268 + fVar338 * fVar310;
      auVar232._28_4_ =
           *(float *)(catmullrom_basis1 + lVar144 + 0x122c) +
           *(float *)(catmullrom_basis1 + lVar144 + 0x16b0) +
           *(float *)(catmullrom_basis1 + lVar144 + 0x1b34) +
           *(float *)(catmullrom_basis1 + lVar144 + 0x1fb8);
      auVar206._8_4_ = 0x7fffffff;
      auVar206._0_8_ = 0x7fffffff7fffffff;
      auVar206._12_4_ = 0x7fffffff;
      auVar206._16_4_ = 0x7fffffff;
      auVar206._20_4_ = 0x7fffffff;
      auVar206._24_4_ = 0x7fffffff;
      auVar206._28_4_ = 0x7fffffff;
      auVar129._4_4_ = fStack_57c;
      auVar129._0_4_ = local_580;
      auVar129._8_4_ = fStack_578;
      auVar129._12_4_ = fStack_574;
      auVar129._16_4_ = fStack_570;
      auVar129._20_4_ = fStack_56c;
      auVar129._24_4_ = fStack_568;
      auVar129._28_4_ = fStack_564;
      auVar154 = vandps_avx(auVar129,auVar206);
      auVar23 = vandps_avx(auVar362,auVar206);
      auVar23 = vmaxps_avx(auVar154,auVar23);
      auVar154 = vandps_avx(auVar221,auVar206);
      auVar154 = vmaxps_avx(auVar23,auVar154);
      auVar385 = vpermilps_avx(ZEXT416((uint)fVar253),0);
      auVar294._16_16_ = auVar385;
      auVar294._0_16_ = auVar385;
      auVar154 = vcmpps_avx(auVar154,auVar294,1);
      auVar26 = vblendvps_avx(auVar129,auVar24,auVar154);
      auVar27 = vblendvps_avx(auVar362,auVar25,auVar154);
      auVar154 = vandps_avx(auVar302,auVar206);
      auVar23 = vandps_avx(auVar317,auVar206);
      auVar28 = vmaxps_avx(auVar154,auVar23);
      auVar154 = vandps_avx(auVar232,auVar206);
      auVar154 = vmaxps_avx(auVar28,auVar154);
      auVar28 = vcmpps_avx(auVar154,auVar294,1);
      auVar154 = vblendvps_avx(auVar302,auVar24,auVar28);
      auVar24 = vblendvps_avx(auVar317,auVar25,auVar28);
      fVar149 = auVar26._0_4_;
      fVar168 = auVar26._4_4_;
      fVar171 = auVar26._8_4_;
      fVar197 = auVar26._12_4_;
      fVar298 = auVar26._16_4_;
      fVar178 = auVar26._20_4_;
      fVar252 = auVar26._24_4_;
      fVar227 = auVar154._0_4_;
      fVar238 = auVar154._4_4_;
      fVar240 = auVar154._8_4_;
      fVar242 = auVar154._12_4_;
      fVar245 = auVar154._16_4_;
      fVar248 = auVar154._20_4_;
      fVar251 = auVar154._24_4_;
      fVar226 = auVar27._0_4_;
      fVar241 = auVar27._4_4_;
      fVar250 = auVar27._8_4_;
      fVar347 = auVar27._12_4_;
      fVar194 = auVar27._16_4_;
      fVar195 = auVar27._20_4_;
      fVar196 = auVar27._24_4_;
      auVar155._0_4_ = fVar226 * fVar226 + fVar149 * fVar149;
      auVar155._4_4_ = fVar241 * fVar241 + fVar168 * fVar168;
      auVar155._8_4_ = fVar250 * fVar250 + fVar171 * fVar171;
      auVar155._12_4_ = fVar347 * fVar347 + fVar197 * fVar197;
      auVar155._16_4_ = fVar194 * fVar194 + fVar298 * fVar298;
      auVar155._20_4_ = fVar195 * fVar195 + fVar178 * fVar178;
      auVar155._24_4_ = fVar196 * fVar196 + fVar252 * fVar252;
      auVar155._28_4_ = auVar317._28_4_ + auVar26._28_4_;
      auVar25 = vrsqrtps_avx(auVar155);
      fVar253 = auVar25._0_4_;
      fVar237 = auVar25._4_4_;
      auVar48._4_4_ = fVar237 * 1.5;
      auVar48._0_4_ = fVar253 * 1.5;
      fVar239 = auVar25._8_4_;
      auVar48._8_4_ = fVar239 * 1.5;
      fVar247 = auVar25._12_4_;
      auVar48._12_4_ = fVar247 * 1.5;
      fVar266 = auVar25._16_4_;
      auVar48._16_4_ = fVar266 * 1.5;
      fVar285 = auVar25._20_4_;
      auVar48._20_4_ = fVar285 * 1.5;
      fVar267 = auVar25._24_4_;
      auVar48._24_4_ = fVar267 * 1.5;
      auVar48._28_4_ = auVar23._28_4_;
      auVar49._4_4_ = fVar237 * fVar237 * fVar237 * auVar155._4_4_ * 0.5;
      auVar49._0_4_ = fVar253 * fVar253 * fVar253 * auVar155._0_4_ * 0.5;
      auVar49._8_4_ = fVar239 * fVar239 * fVar239 * auVar155._8_4_ * 0.5;
      auVar49._12_4_ = fVar247 * fVar247 * fVar247 * auVar155._12_4_ * 0.5;
      auVar49._16_4_ = fVar266 * fVar266 * fVar266 * auVar155._16_4_ * 0.5;
      auVar49._20_4_ = fVar285 * fVar285 * fVar285 * auVar155._20_4_ * 0.5;
      auVar49._24_4_ = fVar267 * fVar267 * fVar267 * auVar155._24_4_ * 0.5;
      auVar49._28_4_ = auVar155._28_4_;
      auVar25 = vsubps_avx(auVar48,auVar49);
      fVar253 = auVar25._0_4_;
      fVar247 = auVar25._4_4_;
      fVar267 = auVar25._8_4_;
      fVar288 = auVar25._12_4_;
      fVar307 = auVar25._16_4_;
      fVar312 = auVar25._20_4_;
      fVar323 = auVar25._24_4_;
      fVar326 = auVar27._28_4_;
      fVar237 = auVar24._0_4_;
      fVar266 = auVar24._4_4_;
      fVar287 = auVar24._8_4_;
      fVar210 = auVar24._12_4_;
      fVar310 = auVar24._16_4_;
      fVar313 = auVar24._20_4_;
      fVar324 = auVar24._24_4_;
      auVar156._0_4_ = fVar237 * fVar237 + fVar227 * fVar227;
      auVar156._4_4_ = fVar266 * fVar266 + fVar238 * fVar238;
      auVar156._8_4_ = fVar287 * fVar287 + fVar240 * fVar240;
      auVar156._12_4_ = fVar210 * fVar210 + fVar242 * fVar242;
      auVar156._16_4_ = fVar310 * fVar310 + fVar245 * fVar245;
      auVar156._20_4_ = fVar313 * fVar313 + fVar248 * fVar248;
      auVar156._24_4_ = fVar324 * fVar324 + fVar251 * fVar251;
      auVar156._28_4_ = auVar154._28_4_ + auVar25._28_4_;
      auVar154 = vrsqrtps_avx(auVar156);
      fVar239 = auVar154._0_4_;
      fVar285 = auVar154._4_4_;
      auVar50._4_4_ = fVar285 * 1.5;
      auVar50._0_4_ = fVar239 * 1.5;
      fVar268 = auVar154._8_4_;
      auVar50._8_4_ = fVar268 * 1.5;
      fVar243 = auVar154._12_4_;
      auVar50._12_4_ = fVar243 * 1.5;
      fVar246 = auVar154._16_4_;
      auVar50._16_4_ = fVar246 * 1.5;
      fVar249 = auVar154._20_4_;
      auVar50._20_4_ = fVar249 * 1.5;
      fVar325 = auVar154._24_4_;
      auVar50._24_4_ = fVar325 * 1.5;
      auVar50._28_4_ = auVar23._28_4_;
      fVar211 = auVar154._28_4_;
      auVar51._4_4_ = fVar285 * fVar285 * fVar285 * auVar156._4_4_ * 0.5;
      auVar51._0_4_ = fVar239 * fVar239 * fVar239 * auVar156._0_4_ * 0.5;
      auVar51._8_4_ = fVar268 * fVar268 * fVar268 * auVar156._8_4_ * 0.5;
      auVar51._12_4_ = fVar243 * fVar243 * fVar243 * auVar156._12_4_ * 0.5;
      auVar51._16_4_ = fVar246 * fVar246 * fVar246 * auVar156._16_4_ * 0.5;
      auVar51._20_4_ = fVar249 * fVar249 * fVar249 * auVar156._20_4_ * 0.5;
      auVar51._24_4_ = fVar325 * fVar325 * fVar325 * auVar156._24_4_ * 0.5;
      auVar51._28_4_ = auVar156._28_4_;
      auVar154 = vsubps_avx(auVar50,auVar51);
      fVar239 = auVar154._0_4_;
      fVar285 = auVar154._4_4_;
      fVar268 = auVar154._8_4_;
      fVar243 = auVar154._12_4_;
      fVar246 = auVar154._16_4_;
      fVar249 = auVar154._20_4_;
      fVar325 = auVar154._24_4_;
      fVar226 = (float)local_7a0._0_4_ * fVar226 * fVar253;
      fVar241 = (float)local_7a0._4_4_ * fVar241 * fVar247;
      auVar52._4_4_ = fVar241;
      auVar52._0_4_ = fVar226;
      fVar250 = fStack_798 * fVar250 * fVar267;
      auVar52._8_4_ = fVar250;
      fVar347 = fStack_794 * fVar347 * fVar288;
      auVar52._12_4_ = fVar347;
      fVar194 = fStack_790 * fVar194 * fVar307;
      auVar52._16_4_ = fVar194;
      fVar195 = fStack_78c * fVar195 * fVar312;
      auVar52._20_4_ = fVar195;
      fVar196 = fStack_788 * fVar196 * fVar323;
      auVar52._24_4_ = fVar196;
      auVar52._28_4_ = fVar326;
      local_600._4_4_ = auVar327._4_4_ + fVar241;
      local_600._0_4_ = auVar327._0_4_ + fVar226;
      fStack_5f8 = auVar327._8_4_ + fVar250;
      fStack_5f4 = auVar327._12_4_ + fVar347;
      fStack_5f0 = auVar334._16_4_ + fVar194;
      fStack_5ec = auVar334._20_4_ + fVar195;
      fStack_5e8 = auVar334._24_4_ + fVar196;
      fStack_5e4 = auVar334._28_4_ + fVar326;
      fVar226 = (float)local_7a0._0_4_ * fVar253 * -fVar149;
      fVar241 = (float)local_7a0._4_4_ * fVar247 * -fVar168;
      auVar53._4_4_ = fVar241;
      auVar53._0_4_ = fVar226;
      fVar250 = fStack_798 * fVar267 * -fVar171;
      auVar53._8_4_ = fVar250;
      fVar347 = fStack_794 * fVar288 * -fVar197;
      auVar53._12_4_ = fVar347;
      fVar194 = fStack_790 * fVar307 * -fVar298;
      auVar53._16_4_ = fVar194;
      fVar195 = fStack_78c * fVar312 * -fVar178;
      auVar53._20_4_ = fVar195;
      fVar196 = fStack_788 * fVar323 * -fVar252;
      auVar53._24_4_ = fVar196;
      auVar53._28_4_ = 0x3f000000;
      local_560._4_4_ = fVar241 + auVar361._4_4_;
      local_560._0_4_ = fVar226 + auVar361._0_4_;
      fStack_558 = fVar250 + auVar361._8_4_;
      fStack_554 = fVar347 + auVar361._12_4_;
      fStack_550 = fVar194 + auVar361._16_4_;
      fStack_54c = fVar195 + auVar361._20_4_;
      fStack_548 = fVar196 + auVar361._24_4_;
      fStack_544 = auVar361._28_4_ + 0.5;
      fVar226 = (float)local_7a0._0_4_ * fVar253 * 0.0;
      fVar253 = (float)local_7a0._4_4_ * fVar247 * 0.0;
      auVar54._4_4_ = fVar253;
      auVar54._0_4_ = fVar226;
      fVar241 = fStack_798 * fVar267 * 0.0;
      auVar54._8_4_ = fVar241;
      fVar247 = fStack_794 * fVar288 * 0.0;
      auVar54._12_4_ = fVar247;
      fVar250 = fStack_790 * fVar307 * 0.0;
      auVar54._16_4_ = fVar250;
      fVar267 = fStack_78c * fVar312 * 0.0;
      auVar54._20_4_ = fVar267;
      fVar347 = fStack_788 * fVar323 * 0.0;
      auVar54._24_4_ = fVar347;
      auVar54._28_4_ = auVar362._28_4_;
      auVar127._4_4_ = fStack_5dc;
      auVar127._0_4_ = local_5e0;
      auVar127._8_4_ = fStack_5d8;
      auVar127._12_4_ = fStack_5d4;
      auVar127._16_4_ = fStack_5d0;
      auVar127._20_4_ = fStack_5cc;
      auVar127._24_4_ = fStack_5c8;
      auVar127._28_4_ = fStack_5c4;
      auVar303._0_4_ = fVar226 + local_5e0;
      auVar303._4_4_ = fVar253 + fStack_5dc;
      auVar303._8_4_ = fVar241 + fStack_5d8;
      auVar303._12_4_ = fVar247 + fStack_5d4;
      auVar303._16_4_ = fVar250 + fStack_5d0;
      auVar303._20_4_ = fVar267 + fStack_5cc;
      auVar303._24_4_ = fVar347 + fStack_5c8;
      auVar303._28_4_ = auVar362._28_4_ + fStack_5c4;
      fVar226 = (float)local_6e0._0_4_ * fVar237 * fVar239;
      fVar253 = local_6e0._4_4_ * fVar266 * fVar285;
      auVar55._4_4_ = fVar253;
      auVar55._0_4_ = fVar226;
      fVar237 = local_6e0._8_4_ * fVar287 * fVar268;
      auVar55._8_4_ = fVar237;
      fVar241 = local_6e0._12_4_ * fVar210 * fVar243;
      auVar55._12_4_ = fVar241;
      fVar247 = local_6e0._16_4_ * fVar310 * fVar246;
      auVar55._16_4_ = fVar247;
      fVar266 = local_6e0._20_4_ * fVar313 * fVar249;
      auVar55._20_4_ = fVar266;
      fVar250 = local_6e0._24_4_ * fVar324 * fVar325;
      auVar55._24_4_ = fVar250;
      auVar55._28_4_ = auVar24._28_4_;
      auVar26 = vsubps_avx(auVar334,auVar52);
      auVar335._0_4_ = local_360._0_4_ + fVar226;
      auVar335._4_4_ = local_360._4_4_ + fVar253;
      auVar335._8_4_ = local_360._8_4_ + fVar237;
      auVar335._12_4_ = local_360._12_4_ + fVar241;
      auVar335._16_4_ = local_360._16_4_ + fVar247;
      auVar335._20_4_ = local_360._20_4_ + fVar266;
      auVar335._24_4_ = local_360._24_4_ + fVar250;
      auVar335._28_4_ = local_360._28_4_ + auVar24._28_4_;
      fVar226 = (float)local_6e0._0_4_ * -fVar227 * fVar239;
      fVar253 = local_6e0._4_4_ * -fVar238 * fVar285;
      auVar56._4_4_ = fVar253;
      auVar56._0_4_ = fVar226;
      fVar237 = local_6e0._8_4_ * -fVar240 * fVar268;
      auVar56._8_4_ = fVar237;
      fVar241 = local_6e0._12_4_ * -fVar242 * fVar243;
      auVar56._12_4_ = fVar241;
      fVar247 = local_6e0._16_4_ * -fVar245 * fVar246;
      auVar56._16_4_ = fVar247;
      fVar266 = local_6e0._20_4_ * -fVar248 * fVar249;
      auVar56._20_4_ = fVar266;
      fVar250 = local_6e0._24_4_ * -fVar251 * fVar325;
      auVar56._24_4_ = fVar250;
      auVar56._28_4_ = fVar326;
      auVar30 = vsubps_avx(auVar361,auVar53);
      auVar369._0_4_ = (float)local_480._0_4_ + fVar226;
      auVar369._4_4_ = (float)local_480._4_4_ + fVar253;
      auVar369._8_4_ = fStack_478 + fVar237;
      auVar369._12_4_ = fStack_474 + fVar241;
      auVar369._16_4_ = fStack_470 + fVar247;
      auVar369._20_4_ = fStack_46c + fVar266;
      auVar369._24_4_ = fStack_468 + fVar250;
      auVar369._28_4_ = register0x0000159c + fVar326;
      fVar226 = fVar239 * 0.0 * (float)local_6e0._0_4_;
      fVar253 = fVar285 * 0.0 * local_6e0._4_4_;
      auVar57._4_4_ = fVar253;
      auVar57._0_4_ = fVar226;
      fVar237 = fVar268 * 0.0 * local_6e0._8_4_;
      auVar57._8_4_ = fVar237;
      fVar239 = fVar243 * 0.0 * local_6e0._12_4_;
      auVar57._12_4_ = fVar239;
      fVar241 = fVar246 * 0.0 * local_6e0._16_4_;
      auVar57._16_4_ = fVar241;
      fVar247 = fVar249 * 0.0 * local_6e0._20_4_;
      auVar57._20_4_ = fVar247;
      fVar266 = fVar325 * 0.0 * local_6e0._24_4_;
      auVar57._24_4_ = fVar266;
      auVar57._28_4_ = fVar211;
      auVar28 = vsubps_avx(auVar127,auVar54);
      auVar380._0_4_ = (float)local_3c0._0_4_ + fVar226;
      auVar380._4_4_ = (float)local_3c0._4_4_ + fVar253;
      auVar380._8_4_ = fStack_3b8 + fVar237;
      auVar380._12_4_ = fStack_3b4 + fVar239;
      auVar380._16_4_ = fStack_3b0 + fVar241;
      auVar380._20_4_ = fStack_3ac + fVar247;
      auVar380._24_4_ = fStack_3a8 + fVar266;
      auVar380._28_4_ = fStack_3a4 + fVar211;
      auVar154 = vsubps_avx(local_360,auVar55);
      auVar23 = vsubps_avx(_local_480,auVar56);
      auVar24 = vsubps_avx(_local_3c0,auVar57);
      auVar25 = vsubps_avx(auVar369,auVar30);
      auVar27 = vsubps_avx(auVar380,auVar28);
      auVar58._4_4_ = auVar28._4_4_ * auVar25._4_4_;
      auVar58._0_4_ = auVar28._0_4_ * auVar25._0_4_;
      auVar58._8_4_ = auVar28._8_4_ * auVar25._8_4_;
      auVar58._12_4_ = auVar28._12_4_ * auVar25._12_4_;
      auVar58._16_4_ = auVar28._16_4_ * auVar25._16_4_;
      auVar58._20_4_ = auVar28._20_4_ * auVar25._20_4_;
      auVar58._24_4_ = auVar28._24_4_ * auVar25._24_4_;
      auVar58._28_4_ = fVar211;
      auVar59._4_4_ = auVar30._4_4_ * auVar27._4_4_;
      auVar59._0_4_ = auVar30._0_4_ * auVar27._0_4_;
      auVar59._8_4_ = auVar30._8_4_ * auVar27._8_4_;
      auVar59._12_4_ = auVar30._12_4_ * auVar27._12_4_;
      auVar59._16_4_ = auVar30._16_4_ * auVar27._16_4_;
      auVar59._20_4_ = auVar30._20_4_ * auVar27._20_4_;
      auVar59._24_4_ = auVar30._24_4_ * auVar27._24_4_;
      auVar59._28_4_ = register0x0000159c;
      auVar29 = vsubps_avx(auVar59,auVar58);
      auVar60._4_4_ = auVar26._4_4_ * auVar27._4_4_;
      auVar60._0_4_ = auVar26._0_4_ * auVar27._0_4_;
      auVar60._8_4_ = auVar26._8_4_ * auVar27._8_4_;
      auVar60._12_4_ = auVar26._12_4_ * auVar27._12_4_;
      auVar60._16_4_ = auVar26._16_4_ * auVar27._16_4_;
      auVar60._20_4_ = auVar26._20_4_ * auVar27._20_4_;
      auVar60._24_4_ = auVar26._24_4_ * auVar27._24_4_;
      auVar60._28_4_ = auVar27._28_4_;
      auVar22 = vsubps_avx(auVar335,auVar26);
      auVar61._4_4_ = auVar28._4_4_ * auVar22._4_4_;
      auVar61._0_4_ = auVar28._0_4_ * auVar22._0_4_;
      auVar61._8_4_ = auVar28._8_4_ * auVar22._8_4_;
      auVar61._12_4_ = auVar28._12_4_ * auVar22._12_4_;
      auVar61._16_4_ = auVar28._16_4_ * auVar22._16_4_;
      auVar61._20_4_ = auVar28._20_4_ * auVar22._20_4_;
      auVar61._24_4_ = auVar28._24_4_ * auVar22._24_4_;
      auVar61._28_4_ = local_360._28_4_;
      auVar43 = vsubps_avx(auVar61,auVar60);
      auVar62._4_4_ = auVar30._4_4_ * auVar22._4_4_;
      auVar62._0_4_ = auVar30._0_4_ * auVar22._0_4_;
      auVar62._8_4_ = auVar30._8_4_ * auVar22._8_4_;
      auVar62._12_4_ = auVar30._12_4_ * auVar22._12_4_;
      auVar62._16_4_ = auVar30._16_4_ * auVar22._16_4_;
      auVar62._20_4_ = auVar30._20_4_ * auVar22._20_4_;
      auVar62._24_4_ = auVar30._24_4_ * auVar22._24_4_;
      auVar62._28_4_ = auVar27._28_4_;
      auVar63._4_4_ = auVar26._4_4_ * auVar25._4_4_;
      auVar63._0_4_ = auVar26._0_4_ * auVar25._0_4_;
      auVar63._8_4_ = auVar26._8_4_ * auVar25._8_4_;
      auVar63._12_4_ = auVar26._12_4_ * auVar25._12_4_;
      auVar63._16_4_ = auVar26._16_4_ * auVar25._16_4_;
      auVar63._20_4_ = auVar26._20_4_ * auVar25._20_4_;
      auVar63._24_4_ = auVar26._24_4_ * auVar25._24_4_;
      auVar63._28_4_ = auVar25._28_4_;
      auVar25 = vsubps_avx(auVar63,auVar62);
      auVar157._0_4_ = auVar29._0_4_ * 0.0 + auVar25._0_4_ + auVar43._0_4_ * 0.0;
      auVar157._4_4_ = auVar29._4_4_ * 0.0 + auVar25._4_4_ + auVar43._4_4_ * 0.0;
      auVar157._8_4_ = auVar29._8_4_ * 0.0 + auVar25._8_4_ + auVar43._8_4_ * 0.0;
      auVar157._12_4_ = auVar29._12_4_ * 0.0 + auVar25._12_4_ + auVar43._12_4_ * 0.0;
      auVar157._16_4_ = auVar29._16_4_ * 0.0 + auVar25._16_4_ + auVar43._16_4_ * 0.0;
      auVar157._20_4_ = auVar29._20_4_ * 0.0 + auVar25._20_4_ + auVar43._20_4_ * 0.0;
      auVar157._24_4_ = auVar29._24_4_ * 0.0 + auVar25._24_4_ + auVar43._24_4_ * 0.0;
      auVar157._28_4_ = auVar25._28_4_ + auVar25._28_4_ + auVar43._28_4_;
      auVar29 = vcmpps_avx(auVar157,ZEXT832(0) << 0x20,2);
      local_520 = vblendvps_avx(auVar154,_local_600,auVar29);
      _local_540 = vblendvps_avx(auVar23,_local_560,auVar29);
      auVar154 = vblendvps_avx(auVar24,auVar303,auVar29);
      auVar23 = vblendvps_avx(auVar26,auVar335,auVar29);
      auVar24 = vblendvps_avx(auVar30,auVar369,auVar29);
      auVar25 = vblendvps_avx(auVar28,auVar380,auVar29);
      auVar26 = vblendvps_avx(auVar335,auVar26,auVar29);
      auVar27 = vblendvps_avx(auVar369,auVar30,auVar29);
      auVar385 = vpackssdw_avx(local_3a0._0_16_,local_3a0._16_16_);
      auVar28 = vblendvps_avx(auVar380,auVar28,auVar29);
      auVar26 = vsubps_avx(auVar26,local_520);
      auVar27 = vsubps_avx(auVar27,_local_540);
      auVar28 = vsubps_avx(auVar28,auVar154);
      auVar22 = vsubps_avx(_local_540,auVar24);
      fVar226 = auVar27._0_4_;
      fVar178 = auVar154._0_4_;
      fVar247 = auVar27._4_4_;
      fVar252 = auVar154._4_4_;
      auVar64._4_4_ = fVar252 * fVar247;
      auVar64._0_4_ = fVar178 * fVar226;
      fVar287 = auVar27._8_4_;
      fVar227 = auVar154._8_4_;
      auVar64._8_4_ = fVar227 * fVar287;
      fVar243 = auVar27._12_4_;
      fVar238 = auVar154._12_4_;
      auVar64._12_4_ = fVar238 * fVar243;
      fVar195 = auVar27._16_4_;
      fVar240 = auVar154._16_4_;
      auVar64._16_4_ = fVar240 * fVar195;
      fVar323 = auVar27._20_4_;
      fVar242 = auVar154._20_4_;
      auVar64._20_4_ = fVar242 * fVar323;
      fVar149 = auVar27._24_4_;
      fVar245 = auVar154._24_4_;
      auVar64._24_4_ = fVar245 * fVar149;
      auVar64._28_4_ = local_3a0._28_4_;
      fVar253 = local_540._0_4_;
      fVar177 = auVar28._0_4_;
      fVar266 = local_540._4_4_;
      fVar198 = auVar28._4_4_;
      auVar65._4_4_ = fVar198 * fVar266;
      auVar65._0_4_ = fVar177 * fVar253;
      fVar268 = local_540._8_4_;
      fVar271 = auVar28._8_4_;
      auVar65._8_4_ = fVar271 * fVar268;
      fVar194 = local_540._12_4_;
      fVar277 = auVar28._12_4_;
      auVar65._12_4_ = fVar277 * fVar194;
      fVar312 = local_540._16_4_;
      fVar280 = auVar28._16_4_;
      auVar65._16_4_ = fVar280 * fVar312;
      fVar324 = local_540._20_4_;
      fVar282 = auVar28._20_4_;
      auVar65._20_4_ = fVar282 * fVar324;
      fVar168 = local_540._24_4_;
      fVar284 = auVar28._24_4_;
      uVar146 = auVar30._28_4_;
      auVar65._24_4_ = fVar284 * fVar168;
      auVar65._28_4_ = uVar146;
      auVar30 = vsubps_avx(auVar65,auVar64);
      fVar237 = local_520._0_4_;
      fVar285 = local_520._4_4_;
      auVar66._4_4_ = fVar198 * fVar285;
      auVar66._0_4_ = fVar177 * fVar237;
      fVar347 = local_520._8_4_;
      auVar66._8_4_ = fVar271 * fVar347;
      fVar307 = local_520._12_4_;
      auVar66._12_4_ = fVar277 * fVar307;
      fVar313 = local_520._16_4_;
      auVar66._16_4_ = fVar280 * fVar313;
      fVar325 = local_520._20_4_;
      auVar66._20_4_ = fVar282 * fVar325;
      fVar171 = local_520._24_4_;
      auVar66._24_4_ = fVar284 * fVar171;
      auVar66._28_4_ = uVar146;
      fVar239 = auVar26._0_4_;
      fVar250 = auVar26._4_4_;
      auVar67._4_4_ = fVar252 * fVar250;
      auVar67._0_4_ = fVar178 * fVar239;
      fVar288 = auVar26._8_4_;
      auVar67._8_4_ = fVar227 * fVar288;
      fVar310 = auVar26._12_4_;
      auVar67._12_4_ = fVar238 * fVar310;
      fVar249 = auVar26._16_4_;
      auVar67._16_4_ = fVar240 * fVar249;
      fVar326 = auVar26._20_4_;
      auVar67._20_4_ = fVar242 * fVar326;
      fVar197 = auVar26._24_4_;
      auVar67._24_4_ = fVar245 * fVar197;
      auVar67._28_4_ = auVar369._28_4_;
      auVar43 = vsubps_avx(auVar67,auVar66);
      auVar68._4_4_ = fVar266 * fVar250;
      auVar68._0_4_ = fVar253 * fVar239;
      auVar68._8_4_ = fVar268 * fVar288;
      auVar68._12_4_ = fVar194 * fVar310;
      auVar68._16_4_ = fVar312 * fVar249;
      auVar68._20_4_ = fVar324 * fVar326;
      auVar68._24_4_ = fVar168 * fVar197;
      auVar68._28_4_ = uVar146;
      auVar69._4_4_ = fVar285 * fVar247;
      auVar69._0_4_ = fVar237 * fVar226;
      auVar69._8_4_ = fVar347 * fVar287;
      auVar69._12_4_ = fVar307 * fVar243;
      auVar69._16_4_ = fVar313 * fVar195;
      auVar69._20_4_ = fVar325 * fVar323;
      auVar69._24_4_ = fVar171 * fVar149;
      auVar69._28_4_ = auVar380._28_4_;
      auVar152 = vsubps_avx(auVar69,auVar68);
      auVar153 = vsubps_avx(auVar154,auVar25);
      fVar241 = auVar152._28_4_ + auVar43._28_4_;
      auVar233._0_4_ = auVar152._0_4_ + auVar43._0_4_ * 0.0 + auVar30._0_4_ * 0.0;
      auVar233._4_4_ = auVar152._4_4_ + auVar43._4_4_ * 0.0 + auVar30._4_4_ * 0.0;
      auVar233._8_4_ = auVar152._8_4_ + auVar43._8_4_ * 0.0 + auVar30._8_4_ * 0.0;
      auVar233._12_4_ = auVar152._12_4_ + auVar43._12_4_ * 0.0 + auVar30._12_4_ * 0.0;
      auVar233._16_4_ = auVar152._16_4_ + auVar43._16_4_ * 0.0 + auVar30._16_4_ * 0.0;
      auVar233._20_4_ = auVar152._20_4_ + auVar43._20_4_ * 0.0 + auVar30._20_4_ * 0.0;
      auVar233._24_4_ = auVar152._24_4_ + auVar43._24_4_ * 0.0 + auVar30._24_4_ * 0.0;
      auVar233._28_4_ = fVar241 + 0.0;
      fVar248 = auVar22._0_4_;
      fVar251 = auVar22._4_4_;
      auVar70._4_4_ = fVar251 * auVar25._4_4_;
      auVar70._0_4_ = fVar248 * auVar25._0_4_;
      fVar169 = auVar22._8_4_;
      auVar70._8_4_ = fVar169 * auVar25._8_4_;
      fVar172 = auVar22._12_4_;
      auVar70._12_4_ = fVar172 * auVar25._12_4_;
      fVar174 = auVar22._16_4_;
      auVar70._16_4_ = fVar174 * auVar25._16_4_;
      fVar175 = auVar22._20_4_;
      auVar70._20_4_ = fVar175 * auVar25._20_4_;
      fVar176 = auVar22._24_4_;
      auVar70._24_4_ = fVar176 * auVar25._24_4_;
      auVar70._28_4_ = fVar241;
      fVar241 = auVar153._0_4_;
      fVar267 = auVar153._4_4_;
      auVar71._4_4_ = auVar24._4_4_ * fVar267;
      auVar71._0_4_ = auVar24._0_4_ * fVar241;
      fVar210 = auVar153._8_4_;
      auVar71._8_4_ = auVar24._8_4_ * fVar210;
      fVar246 = auVar153._12_4_;
      auVar71._12_4_ = auVar24._12_4_ * fVar246;
      fVar196 = auVar153._16_4_;
      auVar71._16_4_ = auVar24._16_4_ * fVar196;
      fVar211 = auVar153._20_4_;
      auVar71._20_4_ = auVar24._20_4_ * fVar211;
      fVar298 = auVar153._24_4_;
      auVar71._24_4_ = auVar24._24_4_ * fVar298;
      auVar71._28_4_ = auVar152._28_4_;
      auVar154 = vsubps_avx(auVar71,auVar70);
      auVar30 = vsubps_avx(local_520,auVar23);
      fVar286 = auVar30._0_4_;
      fVar289 = auVar30._4_4_;
      auVar72._4_4_ = fVar289 * auVar25._4_4_;
      auVar72._0_4_ = fVar286 * auVar25._0_4_;
      fVar290 = auVar30._8_4_;
      auVar72._8_4_ = fVar290 * auVar25._8_4_;
      fVar269 = auVar30._12_4_;
      auVar72._12_4_ = fVar269 * auVar25._12_4_;
      fVar276 = auVar30._16_4_;
      auVar72._16_4_ = fVar276 * auVar25._16_4_;
      fVar279 = auVar30._20_4_;
      auVar72._20_4_ = fVar279 * auVar25._20_4_;
      fVar299 = auVar30._24_4_;
      auVar72._24_4_ = fVar299 * auVar25._24_4_;
      auVar72._28_4_ = auVar25._28_4_;
      auVar73._4_4_ = auVar23._4_4_ * fVar267;
      auVar73._0_4_ = auVar23._0_4_ * fVar241;
      auVar73._8_4_ = auVar23._8_4_ * fVar210;
      auVar73._12_4_ = auVar23._12_4_ * fVar246;
      auVar73._16_4_ = auVar23._16_4_ * fVar196;
      auVar73._20_4_ = auVar23._20_4_ * fVar211;
      auVar73._24_4_ = auVar23._24_4_ * fVar298;
      auVar73._28_4_ = 0;
      auVar30 = vsubps_avx(auVar72,auVar73);
      auVar74._4_4_ = auVar24._4_4_ * fVar289;
      auVar74._0_4_ = auVar24._0_4_ * fVar286;
      auVar74._8_4_ = auVar24._8_4_ * fVar290;
      auVar74._12_4_ = auVar24._12_4_ * fVar269;
      auVar74._16_4_ = auVar24._16_4_ * fVar276;
      auVar74._20_4_ = auVar24._20_4_ * fVar279;
      auVar74._24_4_ = auVar24._24_4_ * fVar299;
      auVar74._28_4_ = auVar25._28_4_;
      auVar75._4_4_ = auVar23._4_4_ * fVar251;
      auVar75._0_4_ = auVar23._0_4_ * fVar248;
      auVar75._8_4_ = auVar23._8_4_ * fVar169;
      auVar75._12_4_ = auVar23._12_4_ * fVar172;
      auVar75._16_4_ = auVar23._16_4_ * fVar174;
      auVar75._20_4_ = auVar23._20_4_ * fVar175;
      auVar75._24_4_ = auVar23._24_4_ * fVar176;
      auVar75._28_4_ = auVar23._28_4_;
      auVar23 = vsubps_avx(auVar75,auVar74);
      auVar207._0_4_ = auVar154._0_4_ * 0.0 + auVar23._0_4_ + auVar30._0_4_ * 0.0;
      auVar207._4_4_ = auVar154._4_4_ * 0.0 + auVar23._4_4_ + auVar30._4_4_ * 0.0;
      auVar207._8_4_ = auVar154._8_4_ * 0.0 + auVar23._8_4_ + auVar30._8_4_ * 0.0;
      auVar207._12_4_ = auVar154._12_4_ * 0.0 + auVar23._12_4_ + auVar30._12_4_ * 0.0;
      auVar207._16_4_ = auVar154._16_4_ * 0.0 + auVar23._16_4_ + auVar30._16_4_ * 0.0;
      auVar207._20_4_ = auVar154._20_4_ * 0.0 + auVar23._20_4_ + auVar30._20_4_ * 0.0;
      auVar207._24_4_ = auVar154._24_4_ * 0.0 + auVar23._24_4_ + auVar30._24_4_ * 0.0;
      auVar207._28_4_ = auVar23._28_4_ + auVar23._28_4_ + auVar30._28_4_;
      auVar209 = ZEXT3264(auVar207);
      auVar154 = vmaxps_avx(auVar233,auVar207);
      auVar154 = vcmpps_avx(auVar154,ZEXT832(0) << 0x20,2);
      auVar214 = vpackssdw_avx(auVar154._0_16_,auVar154._16_16_);
      auVar385 = vpand_avx(auVar385,auVar214);
      auVar214 = vpmovsxwd_avx(auVar385);
      auVar215 = vpunpckhwd_avx(auVar385,auVar385);
      auVar158._16_16_ = auVar215;
      auVar158._0_16_ = auVar214;
      if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar158 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar158 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar158 >> 0x7f,0) == '\0') &&
            (auVar158 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar215 >> 0x3f,0) == '\0') &&
          (auVar158 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar215[0xf]
         ) {
LAB_00b446d5:
        auVar190 = ZEXT3264(CONCAT824(uStack_488,
                                      CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
        auVar166 = ZEXT3264(local_4e0);
        auVar305 = ZEXT3264(local_500);
      }
      else {
        auVar76._4_4_ = fVar267 * fVar247;
        auVar76._0_4_ = fVar241 * fVar226;
        auVar76._8_4_ = fVar210 * fVar287;
        auVar76._12_4_ = fVar246 * fVar243;
        auVar76._16_4_ = fVar196 * fVar195;
        auVar76._20_4_ = fVar211 * fVar323;
        auVar76._24_4_ = fVar298 * fVar149;
        auVar76._28_4_ = auVar215._12_4_;
        auVar354._0_4_ = fVar248 * fVar177;
        auVar354._4_4_ = fVar251 * fVar198;
        auVar354._8_4_ = fVar169 * fVar271;
        auVar354._12_4_ = fVar172 * fVar277;
        auVar354._16_4_ = fVar174 * fVar280;
        auVar354._20_4_ = fVar175 * fVar282;
        auVar354._24_4_ = fVar176 * fVar284;
        auVar354._28_4_ = 0;
        auVar23 = vsubps_avx(auVar354,auVar76);
        auVar77._4_4_ = fVar289 * fVar198;
        auVar77._0_4_ = fVar286 * fVar177;
        auVar77._8_4_ = fVar290 * fVar271;
        auVar77._12_4_ = fVar269 * fVar277;
        auVar77._16_4_ = fVar276 * fVar280;
        auVar77._20_4_ = fVar279 * fVar282;
        auVar77._24_4_ = fVar299 * fVar284;
        auVar77._28_4_ = auVar28._28_4_;
        auVar78._4_4_ = fVar267 * fVar250;
        auVar78._0_4_ = fVar241 * fVar239;
        auVar78._8_4_ = fVar210 * fVar288;
        auVar78._12_4_ = fVar246 * fVar310;
        auVar78._16_4_ = fVar196 * fVar249;
        auVar78._20_4_ = fVar211 * fVar326;
        auVar78._24_4_ = fVar298 * fVar197;
        auVar78._28_4_ = auVar153._28_4_;
        auVar24 = vsubps_avx(auVar78,auVar77);
        auVar79._4_4_ = fVar251 * fVar250;
        auVar79._0_4_ = fVar248 * fVar239;
        auVar79._8_4_ = fVar169 * fVar288;
        auVar79._12_4_ = fVar172 * fVar310;
        auVar79._16_4_ = fVar174 * fVar249;
        auVar79._20_4_ = fVar175 * fVar326;
        auVar79._24_4_ = fVar176 * fVar197;
        auVar79._28_4_ = auVar26._28_4_;
        auVar80._4_4_ = fVar289 * fVar247;
        auVar80._0_4_ = fVar286 * fVar226;
        auVar80._8_4_ = fVar290 * fVar287;
        auVar80._12_4_ = fVar269 * fVar243;
        auVar80._16_4_ = fVar276 * fVar195;
        auVar80._20_4_ = fVar279 * fVar323;
        auVar80._24_4_ = fVar299 * fVar149;
        auVar80._28_4_ = auVar27._28_4_;
        auVar25 = vsubps_avx(auVar80,auVar79);
        auVar295._0_4_ = auVar23._0_4_ * 0.0 + auVar25._0_4_ + auVar24._0_4_ * 0.0;
        auVar295._4_4_ = auVar23._4_4_ * 0.0 + auVar25._4_4_ + auVar24._4_4_ * 0.0;
        auVar295._8_4_ = auVar23._8_4_ * 0.0 + auVar25._8_4_ + auVar24._8_4_ * 0.0;
        auVar295._12_4_ = auVar23._12_4_ * 0.0 + auVar25._12_4_ + auVar24._12_4_ * 0.0;
        auVar295._16_4_ = auVar23._16_4_ * 0.0 + auVar25._16_4_ + auVar24._16_4_ * 0.0;
        auVar295._20_4_ = auVar23._20_4_ * 0.0 + auVar25._20_4_ + auVar24._20_4_ * 0.0;
        auVar295._24_4_ = auVar23._24_4_ * 0.0 + auVar25._24_4_ + auVar24._24_4_ * 0.0;
        auVar295._28_4_ = auVar27._28_4_ + auVar25._28_4_ + auVar26._28_4_;
        auVar154 = vrcpps_avx(auVar295);
        fVar239 = auVar154._0_4_;
        fVar241 = auVar154._4_4_;
        auVar81._4_4_ = auVar295._4_4_ * fVar241;
        auVar81._0_4_ = auVar295._0_4_ * fVar239;
        fVar247 = auVar154._8_4_;
        auVar81._8_4_ = auVar295._8_4_ * fVar247;
        fVar250 = auVar154._12_4_;
        auVar81._12_4_ = auVar295._12_4_ * fVar250;
        fVar267 = auVar154._16_4_;
        auVar81._16_4_ = auVar295._16_4_ * fVar267;
        fVar287 = auVar154._20_4_;
        auVar81._20_4_ = auVar295._20_4_ * fVar287;
        fVar288 = auVar154._24_4_;
        auVar81._24_4_ = auVar295._24_4_ * fVar288;
        auVar81._28_4_ = auVar153._28_4_;
        auVar355._8_4_ = 0x3f800000;
        auVar355._0_8_ = 0x3f8000003f800000;
        auVar355._12_4_ = 0x3f800000;
        auVar355._16_4_ = 0x3f800000;
        auVar355._20_4_ = 0x3f800000;
        auVar355._24_4_ = 0x3f800000;
        auVar355._28_4_ = 0x3f800000;
        auVar154 = vsubps_avx(auVar355,auVar81);
        fVar239 = auVar154._0_4_ * fVar239 + fVar239;
        fVar241 = auVar154._4_4_ * fVar241 + fVar241;
        fVar247 = auVar154._8_4_ * fVar247 + fVar247;
        fVar250 = auVar154._12_4_ * fVar250 + fVar250;
        fVar267 = auVar154._16_4_ * fVar267 + fVar267;
        fVar287 = auVar154._20_4_ * fVar287 + fVar287;
        fVar288 = auVar154._24_4_ * fVar288 + fVar288;
        auVar187._0_4_ =
             (auVar23._0_4_ * fVar237 + auVar24._0_4_ * fVar253 + auVar25._0_4_ * fVar178) * fVar239
        ;
        auVar187._4_4_ =
             (auVar23._4_4_ * fVar285 + auVar24._4_4_ * fVar266 + auVar25._4_4_ * fVar252) * fVar241
        ;
        auVar187._8_4_ =
             (auVar23._8_4_ * fVar347 + auVar24._8_4_ * fVar268 + auVar25._8_4_ * fVar227) * fVar247
        ;
        auVar187._12_4_ =
             (auVar23._12_4_ * fVar307 + auVar24._12_4_ * fVar194 + auVar25._12_4_ * fVar238) *
             fVar250;
        auVar187._16_4_ =
             (auVar23._16_4_ * fVar313 + auVar24._16_4_ * fVar312 + auVar25._16_4_ * fVar240) *
             fVar267;
        auVar187._20_4_ =
             (auVar23._20_4_ * fVar325 + auVar24._20_4_ * fVar324 + auVar25._20_4_ * fVar242) *
             fVar287;
        auVar187._24_4_ =
             (auVar23._24_4_ * fVar171 + auVar24._24_4_ * fVar168 + auVar25._24_4_ * fVar245) *
             fVar288;
        auVar187._28_4_ = 0;
        auVar159._16_16_ = auVar31;
        auVar159._0_16_ = auVar31;
        auVar154 = vcmpps_avx(auVar159,auVar187,2);
        fVar226 = ray->tfar;
        auVar234._4_4_ = fVar226;
        auVar234._0_4_ = fVar226;
        auVar234._8_4_ = fVar226;
        auVar234._12_4_ = fVar226;
        auVar234._16_4_ = fVar226;
        auVar234._20_4_ = fVar226;
        auVar234._24_4_ = fVar226;
        auVar234._28_4_ = fVar226;
        auVar23 = vcmpps_avx(auVar187,auVar234,2);
        auVar154 = vandps_avx(auVar23,auVar154);
        auVar214 = vpackssdw_avx(auVar154._0_16_,auVar154._16_16_);
        auVar385 = vpand_avx(auVar385,auVar214);
        auVar214 = vpmovsxwd_avx(auVar385);
        auVar215 = vpshufd_avx(auVar385,0xee);
        auVar215 = vpmovsxwd_avx(auVar215);
        auVar160._16_16_ = auVar215;
        auVar160._0_16_ = auVar214;
        if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar160 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar160 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar160 >> 0x7f,0) == '\0') &&
              (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar215 >> 0x3f,0) == '\0') &&
            (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar215[0xf]) goto LAB_00b446d5;
        auVar154 = vcmpps_avx(ZEXT832(0) << 0x20,auVar295,4);
        auVar214 = vpackssdw_avx(auVar154._0_16_,auVar154._16_16_);
        auVar385 = vpand_avx(auVar385,auVar214);
        auVar214 = vpmovsxwd_avx(auVar385);
        auVar385 = vpunpckhwd_avx(auVar385,auVar385);
        auVar260._16_16_ = auVar385;
        auVar260._0_16_ = auVar214;
        auVar190 = ZEXT3264(CONCAT824(uStack_488,
                                      CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
        auVar166 = ZEXT3264(local_4e0);
        auVar305 = ZEXT3264(local_500);
        if ((((((((auVar260 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar260 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar260 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar260 >> 0x7f,0) != '\0') ||
              (auVar260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar385 >> 0x3f,0) != '\0') ||
            (auVar260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar385[0xf] < '\0') {
          auVar161._0_4_ = auVar233._0_4_ * fVar239;
          auVar161._4_4_ = auVar233._4_4_ * fVar241;
          auVar161._8_4_ = auVar233._8_4_ * fVar247;
          auVar161._12_4_ = auVar233._12_4_ * fVar250;
          auVar161._16_4_ = auVar233._16_4_ * fVar267;
          auVar161._20_4_ = auVar233._20_4_ * fVar287;
          auVar161._24_4_ = auVar233._24_4_ * fVar288;
          auVar161._28_4_ = 0;
          auVar82._4_4_ = auVar207._4_4_ * fVar241;
          auVar82._0_4_ = auVar207._0_4_ * fVar239;
          auVar82._8_4_ = auVar207._8_4_ * fVar247;
          auVar82._12_4_ = auVar207._12_4_ * fVar250;
          auVar82._16_4_ = auVar207._16_4_ * fVar267;
          auVar82._20_4_ = auVar207._20_4_ * fVar287;
          auVar82._24_4_ = auVar207._24_4_ * fVar288;
          auVar82._28_4_ = auVar207._28_4_;
          auVar209 = ZEXT3264(auVar82);
          auVar272._8_4_ = 0x3f800000;
          auVar272._0_8_ = 0x3f8000003f800000;
          auVar272._12_4_ = 0x3f800000;
          auVar272._16_4_ = 0x3f800000;
          auVar272._20_4_ = 0x3f800000;
          auVar272._24_4_ = 0x3f800000;
          auVar272._28_4_ = 0x3f800000;
          auVar154 = vsubps_avx(auVar272,auVar161);
          auVar154 = vblendvps_avx(auVar154,auVar161,auVar29);
          auVar166 = ZEXT3264(auVar154);
          auVar154 = vsubps_avx(auVar272,auVar82);
          _local_3e0 = vblendvps_avx(auVar154,auVar82,auVar29);
          auVar190 = ZEXT3264(auVar260);
          auVar305 = ZEXT3264(auVar187);
        }
      }
      auVar370 = ZEXT3264(_local_660);
      auVar320 = ZEXT3264(_local_780);
      local_4e0 = auVar166._0_32_;
      local_500 = auVar305._0_32_;
      auVar154 = auVar190._0_32_;
      if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar154 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar154 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar154 >> 0x7f,0) == '\0') &&
            (auVar190 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar154 >> 0xbf,0) == '\0') &&
          (auVar190 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar190[0x1f]) {
        bVar143 = 0;
        _local_6c0 = auVar33;
        _local_6b0 = auVar34;
        _local_5b0 = auVar32;
      }
      else {
        auVar23 = vsubps_avx(local_6e0,_local_7a0);
        fVar253 = (float)local_7a0._0_4_ + auVar23._0_4_ * auVar166._0_4_;
        fVar237 = (float)local_7a0._4_4_ + auVar23._4_4_ * auVar166._4_4_;
        fVar239 = fStack_798 + auVar23._8_4_ * auVar166._8_4_;
        fVar241 = fStack_794 + auVar23._12_4_ * auVar166._12_4_;
        fVar247 = fStack_790 + auVar23._16_4_ * auVar166._16_4_;
        fVar266 = fStack_78c + auVar23._20_4_ * auVar166._20_4_;
        fVar285 = fStack_788 + auVar23._24_4_ * auVar166._24_4_;
        fVar250 = auVar23._28_4_ + 0.0;
        fVar226 = local_718->depth_scale;
        auVar83._4_4_ = (fVar237 + fVar237) * fVar226;
        auVar83._0_4_ = (fVar253 + fVar253) * fVar226;
        auVar83._8_4_ = (fVar239 + fVar239) * fVar226;
        auVar83._12_4_ = (fVar241 + fVar241) * fVar226;
        auVar83._16_4_ = (fVar247 + fVar247) * fVar226;
        auVar83._20_4_ = (fVar266 + fVar266) * fVar226;
        auVar83._24_4_ = (fVar285 + fVar285) * fVar226;
        auVar83._28_4_ = fVar250 + fVar250;
        auVar23 = vcmpps_avx(local_500,auVar83,6);
        auVar24 = auVar154 & auVar23;
        if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar24 >> 0x7f,0) == '\0') &&
              (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar24 >> 0xbf,0) == '\0') &&
            (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar24[0x1f]) {
          bVar143 = 0;
          _local_6c0 = auVar33;
          _local_6b0 = auVar34;
          _local_5b0 = auVar32;
        }
        else {
          local_200 = vandps_avx(auVar23,auVar154);
          local_2a0._0_4_ = (float)local_3e0._0_4_ + (float)local_3e0._0_4_ + -1.0;
          local_2a0._4_4_ = (float)local_3e0._4_4_ + (float)local_3e0._4_4_ + -1.0;
          fStack_298 = (float)uStack_3d8 + (float)uStack_3d8 + -1.0;
          fStack_294 = uStack_3d8._4_4_ + uStack_3d8._4_4_ + -1.0;
          fStack_290 = (float)uStack_3d0 + (float)uStack_3d0 + -1.0;
          fStack_28c = uStack_3d0._4_4_ + uStack_3d0._4_4_ + -1.0;
          fStack_288 = (float)uStack_3c8 + (float)uStack_3c8 + -1.0;
          fStack_284 = uStack_3c8._4_4_ + uStack_3c8._4_4_ + -1.0;
          local_2c0 = local_4e0;
          local_280 = local_500;
          local_260 = 0;
          local_25c = uVar141;
          local_250 = local_6b0;
          uStack_248 = uStack_6a8;
          local_240 = local_6c0;
          uStack_238 = uStack_6b8;
          local_230 = local_5b0;
          uStack_228 = uStack_5a8;
          auVar209 = ZEXT1664(_local_5c0);
          local_220 = _local_5c0;
          local_3e0._4_4_ = local_2a0._4_4_;
          local_3e0._0_4_ = local_2a0._0_4_;
          uStack_3d8._0_4_ = fStack_298;
          uStack_3d8._4_4_ = fStack_294;
          uStack_3d0._0_4_ = fStack_290;
          uStack_3d0._4_4_ = fStack_28c;
          auVar183 = _local_3e0;
          uStack_3c8._0_4_ = fStack_288;
          uStack_3c8._4_4_ = fStack_284;
          auVar154 = _local_3e0;
          auVar23 = local_500;
          auVar24 = local_4e0;
          _local_6c0 = auVar33;
          _local_6b0 = auVar34;
          _local_5b0 = auVar32;
          if ((pGVar19->mask & ray->mask) != 0) {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (bVar143 = 1, pGVar19->occlusionFilterN == (RTCFilterFunctionN)0x0))
            goto LAB_00b438d1;
            auVar200._0_4_ = 1.0 / auVar255._0_4_;
            auVar200._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar385 = vshufps_avx(auVar200,auVar200,0);
            auVar209 = ZEXT3264(CONCAT1616(auVar385,auVar385));
            local_1e0[0] = auVar385._0_4_ * (auVar166._0_4_ + 0.0);
            local_1e0[1] = auVar385._4_4_ * (auVar166._4_4_ + 1.0);
            local_1e0[2] = auVar385._8_4_ * (auVar166._8_4_ + 2.0);
            local_1e0[3] = auVar385._12_4_ * (auVar166._12_4_ + 3.0);
            fStack_1d0 = auVar385._0_4_ * (auVar166._16_4_ + 4.0);
            fStack_1cc = auVar385._4_4_ * (auVar166._20_4_ + 5.0);
            fStack_1c8 = auVar385._8_4_ * (auVar166._24_4_ + 6.0);
            fStack_1c4 = auVar166._28_4_ + 7.0;
            uStack_3d0 = auVar183._16_8_;
            uStack_3c8 = auVar154._24_8_;
            local_1c0 = local_3e0;
            uStack_1b8 = uStack_3d8;
            uStack_1b0 = uStack_3d0;
            uStack_1a8 = uStack_3c8;
            local_1a0 = local_500;
            uVar146 = vmovmskps_avx(local_200);
            uVar138 = CONCAT44((int)((ulong)context->args >> 0x20),uVar146);
            uVar140 = 0;
            if (uVar138 != 0) {
              for (; (uVar138 >> uVar140 & 1) == 0; uVar140 = uVar140 + 1) {
              }
            }
            _local_3e0 = auVar154;
            _local_380 = auVar35;
            while( true ) {
              auVar23 = auVar305._0_32_;
              auVar24 = auVar166._0_32_;
              auVar31 = local_620._0_16_;
              if (uVar138 == 0) break;
              local_7a0 = (undefined1  [8])uVar138;
              local_694 = local_1e0[uVar140];
              local_690 = *(undefined4 *)((long)&local_1c0 + uVar140 * 4);
              local_6e0._0_4_ = ray->tfar;
              ray->tfar = *(float *)(local_1a0 + uVar140 * 4);
              fVar253 = 1.0 - local_694;
              fVar226 = local_694 * 3.0;
              auVar385 = ZEXT416((uint)((fVar253 * -2.0 * local_694 + local_694 * local_694) * 0.5))
              ;
              auVar385 = vshufps_avx(auVar385,auVar385,0);
              auVar214 = ZEXT416((uint)(((fVar253 + fVar253) * (fVar226 + 2.0) +
                                        fVar253 * fVar253 * -3.0) * 0.5));
              auVar214 = vshufps_avx(auVar214,auVar214,0);
              auVar215 = ZEXT416((uint)(((local_694 + local_694) * (fVar226 + -5.0) +
                                        local_694 * fVar226) * 0.5));
              auVar215 = vshufps_avx(auVar215,auVar215,0);
              auVar216 = ZEXT416((uint)((local_694 * (fVar253 + fVar253) - fVar253 * fVar253) * 0.5)
                                );
              auVar216 = vshufps_avx(auVar216,auVar216,0);
              auVar201._0_4_ =
                   auVar216._0_4_ * (float)local_6b0._0_4_ +
                   auVar215._0_4_ * (float)local_6c0._0_4_ +
                   auVar385._0_4_ * (float)local_5c0._0_4_ + auVar214._0_4_ * (float)local_5b0._0_4_
              ;
              auVar201._4_4_ =
                   auVar216._4_4_ * (float)local_6b0._4_4_ +
                   auVar215._4_4_ * (float)local_6c0._4_4_ +
                   auVar385._4_4_ * (float)local_5c0._4_4_ + auVar214._4_4_ * (float)local_5b0._4_4_
              ;
              auVar201._8_4_ =
                   auVar216._8_4_ * (float)uStack_6a8 +
                   auVar215._8_4_ * (float)uStack_6b8 +
                   auVar385._8_4_ * fStack_5b8 + auVar214._8_4_ * (float)uStack_5a8;
              auVar201._12_4_ =
                   auVar216._12_4_ * uStack_6a8._4_4_ +
                   auVar215._12_4_ * uStack_6b8._4_4_ +
                   auVar385._12_4_ * fStack_5b4 + auVar214._12_4_ * uStack_5a8._4_4_;
              auVar209 = ZEXT1664(auVar201);
              local_710.context = context->user;
              local_6a0 = vmovlps_avx(auVar201);
              local_698 = vextractps_avx(auVar201,2);
              local_68c = (int)local_668;
              local_688 = (int)local_720;
              local_684 = (local_710.context)->instID[0];
              local_680 = (local_710.context)->instPrimID[0];
              local_7cc = -1;
              local_710.valid = &local_7cc;
              local_710.geometryUserPtr = pGVar19->userPtr;
              local_710.ray = (RTCRayN *)ray;
              local_710.hit = (RTCHitN *)&local_6a0;
              local_710.N = 1;
              if (pGVar19->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b43812:
                p_Var21 = context->args->filter;
                if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar19->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar209 = ZEXT1664(auVar209._0_16_);
                  (*p_Var21)(&local_710);
                  if (*local_710.valid == 0) goto LAB_00b43856;
                }
                bVar143 = 1;
                auVar320 = ZEXT3264(_local_780);
                auVar370 = ZEXT3264(_local_660);
                fVar148 = (float)local_740._0_4_;
                fVar167 = (float)local_740._4_4_;
                fVar170 = fStack_738;
                fVar173 = fStack_734;
                fVar270 = fStack_730;
                fVar262 = fStack_72c;
                fVar275 = fStack_728;
                fVar263 = fStack_724;
                fVar179 = (float)local_7c0._0_4_;
                fVar191 = (float)local_7c0._4_4_;
                fVar192 = fStack_7b8;
                fVar193 = fStack_7b4;
                fVar278 = fStack_7b0;
                fVar264 = fStack_7ac;
                fVar281 = fStack_7a8;
                fVar212 = (float)local_760._0_4_;
                fVar223 = (float)local_760._4_4_;
                fVar224 = fStack_758;
                fVar225 = fStack_754;
                fVar244 = fStack_750;
                fVar265 = fStack_74c;
                fVar283 = fStack_748;
                auVar31 = local_620._0_16_;
                goto LAB_00b438d1;
              }
              auVar209 = ZEXT1664(auVar201);
              (*pGVar19->occlusionFilterN)(&local_710);
              if (*local_710.valid != 0) goto LAB_00b43812;
LAB_00b43856:
              ray->tfar = (float)local_6e0._0_4_;
              uVar138 = (ulong)local_7a0 ^ 1L << (uVar140 & 0x3f);
              uVar140 = 0;
              if (uVar138 != 0) {
                for (; (uVar138 >> uVar140 & 1) == 0; uVar140 = uVar140 + 1) {
                }
              }
              auVar166 = ZEXT3264(local_4e0);
              auVar305 = ZEXT3264(local_500);
              auVar320 = ZEXT3264(_local_780);
              auVar370 = ZEXT3264(_local_660);
              fVar148 = (float)local_740._0_4_;
              fVar167 = (float)local_740._4_4_;
              fVar170 = fStack_738;
              fVar173 = fStack_734;
              fVar270 = fStack_730;
              fVar262 = fStack_72c;
              fVar275 = fStack_728;
              fVar263 = fStack_724;
              fVar212 = (float)local_760._0_4_;
              fVar223 = (float)local_760._4_4_;
              fVar224 = fStack_758;
              fVar225 = fStack_754;
              fVar244 = fStack_750;
              fVar265 = fStack_74c;
              fVar283 = fStack_748;
            }
          }
          local_620._0_16_ = auVar31;
          local_4e0 = auVar24;
          local_500 = auVar23;
          bVar143 = 0;
          fVar179 = (float)local_7c0._0_4_;
          fVar191 = (float)local_7c0._4_4_;
          fVar192 = fStack_7b8;
          fVar193 = fStack_7b4;
          fVar278 = fStack_7b0;
          fVar264 = fStack_7ac;
          fVar281 = fStack_7a8;
          auVar31 = local_620._0_16_;
        }
      }
LAB_00b438d1:
      local_620._0_16_ = auVar31;
      auVar190 = ZEXT1664(local_640._0_16_);
    }
    if (8 < (int)uVar141) {
      _local_380 = vpshufd_avx(ZEXT416(uVar141),0);
      auVar385 = vshufps_avx(auVar190._0_16_,auVar190._0_16_,0);
      register0x00001210 = auVar385;
      _local_3c0 = auVar385;
      local_100 = local_620._0_8_;
      uStack_f8 = local_620._8_8_;
      uStack_f0 = local_620._0_8_;
      uStack_e8 = local_620._8_8_;
      auVar151._0_4_ = 1.0 / local_440;
      auVar151._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar385 = vshufps_avx(auVar151,auVar151,0);
      register0x00001210 = auVar385;
      _local_120 = auVar385;
      auVar166 = ZEXT3264(_local_120);
      _local_660 = auVar370._0_32_;
      for (lVar147 = 8; lVar147 < local_7c8; lVar147 = lVar147 + 8) {
        pauVar8 = (undefined1 (*) [28])(catmullrom_basis0 + lVar147 * 4 + lVar144);
        fVar226 = *(float *)*pauVar8;
        fVar253 = *(float *)(*pauVar8 + 4);
        fVar237 = *(float *)(*pauVar8 + 8);
        fVar239 = *(float *)(*pauVar8 + 0xc);
        fVar241 = *(float *)(*pauVar8 + 0x10);
        fVar247 = *(float *)(*pauVar8 + 0x14);
        fVar266 = *(float *)(*pauVar8 + 0x18);
        auVar135 = *pauVar8;
        pauVar8 = (undefined1 (*) [28])(lVar144 + 0x22047f0 + lVar147 * 4);
        fVar285 = *(float *)*pauVar8;
        fVar250 = *(float *)(*pauVar8 + 4);
        fVar267 = *(float *)(*pauVar8 + 8);
        fVar287 = *(float *)(*pauVar8 + 0xc);
        fVar268 = *(float *)(*pauVar8 + 0x10);
        fVar347 = *(float *)(*pauVar8 + 0x14);
        fVar288 = *(float *)(*pauVar8 + 0x18);
        auVar134 = *pauVar8;
        pfVar1 = (float *)(lVar144 + 0x2204c74 + lVar147 * 4);
        fVar210 = *pfVar1;
        fVar243 = pfVar1[1];
        fVar194 = pfVar1[2];
        fVar307 = pfVar1[3];
        fVar310 = pfVar1[4];
        fVar246 = pfVar1[5];
        fVar195 = pfVar1[6];
        pauVar8 = (undefined1 (*) [28])(lVar144 + 0x22050f8 + lVar147 * 4);
        fVar312 = *(float *)*pauVar8;
        fVar313 = *(float *)(*pauVar8 + 4);
        fVar249 = *(float *)(*pauVar8 + 8);
        fVar196 = *(float *)(*pauVar8 + 0xc);
        fVar323 = *(float *)(*pauVar8 + 0x10);
        fVar324 = *(float *)(*pauVar8 + 0x14);
        fVar325 = *(float *)(*pauVar8 + 0x18);
        auVar133 = *pauVar8;
        fVar326 = *(float *)pauVar8[1];
        fVar211 = fVar326 + auVar209._28_4_;
        fStack_784 = fVar326 + fVar326 + auVar166._28_4_;
        fVar227 = auVar370._0_4_;
        fVar238 = auVar370._4_4_;
        fVar240 = auVar370._8_4_;
        fVar242 = auVar370._12_4_;
        fVar245 = auVar370._16_4_;
        fVar248 = auVar370._20_4_;
        fVar251 = auVar370._24_4_;
        local_640._0_4_ =
             fVar227 * fVar226 +
             auVar320._0_4_ * fVar285 + fVar210 * fVar179 + (float)local_420._0_4_ * fVar312;
        local_640._4_4_ =
             fVar238 * fVar253 +
             auVar320._4_4_ * fVar250 + fVar243 * fVar191 + (float)local_420._4_4_ * fVar313;
        local_640._8_4_ =
             fVar240 * fVar237 + auVar320._8_4_ * fVar267 + fVar194 * fVar192 + fStack_418 * fVar249
        ;
        local_640._12_4_ =
             fVar242 * fVar239 +
             auVar320._12_4_ * fVar287 + fVar307 * fVar193 + fStack_414 * fVar196;
        local_640._16_4_ =
             fVar245 * fVar241 +
             auVar320._16_4_ * fVar268 + fVar310 * fVar278 + fStack_410 * fVar323;
        local_640._20_4_ =
             fVar248 * fVar247 +
             auVar320._20_4_ * fVar347 + fVar246 * fVar264 + fStack_40c * fVar324;
        local_640._24_4_ =
             fVar251 * fVar266 +
             auVar320._24_4_ * fVar288 + fVar195 * fVar281 + fStack_408 * fVar325;
        local_640._28_4_ = fVar211 + fStack_784;
        auVar208._0_4_ =
             fVar285 * (float)local_320._0_4_ + fVar212 * fVar210 + fVar148 * fVar312 +
             (float)local_340._0_4_ * fVar226;
        auVar208._4_4_ =
             fVar250 * (float)local_320._4_4_ + fVar223 * fVar243 + fVar167 * fVar313 +
             (float)local_340._4_4_ * fVar253;
        auVar208._8_4_ =
             fVar267 * fStack_318 + fVar224 * fVar194 + fVar170 * fVar249 + fStack_338 * fVar237;
        auVar208._12_4_ =
             fVar287 * fStack_314 + fVar225 * fVar307 + fVar173 * fVar196 + fStack_334 * fVar239;
        auVar208._16_4_ =
             fVar268 * fStack_310 + fVar244 * fVar310 + fVar270 * fVar323 + fStack_330 * fVar241;
        auVar208._20_4_ =
             fVar347 * fStack_30c + fVar265 * fVar246 + fVar262 * fVar324 + fStack_32c * fVar247;
        auVar208._24_4_ =
             fVar288 * fStack_308 + fVar283 * fVar195 + fVar275 * fVar325 + fStack_328 * fVar266;
        auVar208._28_4_ = fVar326 + fVar326 + auVar190._28_4_ + fStack_784;
        auVar209 = ZEXT3264(auVar208);
        local_7a0._0_4_ =
             (float)local_e0._0_4_ * fVar226 +
             fVar285 * (float)local_140._0_4_ +
             (float)local_a0._0_4_ * fVar210 + (float)local_c0._0_4_ * fVar312;
        local_7a0._4_4_ =
             (float)local_e0._4_4_ * fVar253 +
             fVar250 * (float)local_140._4_4_ +
             (float)local_a0._4_4_ * fVar243 + (float)local_c0._4_4_ * fVar313;
        fStack_798 = fStack_d8 * fVar237 +
                     fVar267 * fStack_138 + fStack_98 * fVar194 + fStack_b8 * fVar249;
        fStack_794 = fStack_d4 * fVar239 +
                     fVar287 * fStack_134 + fStack_94 * fVar307 + fStack_b4 * fVar196;
        fStack_790 = fStack_d0 * fVar241 +
                     fVar268 * fStack_130 + fStack_90 * fVar310 + fStack_b0 * fVar323;
        fStack_78c = fStack_cc * fVar247 +
                     fVar347 * fStack_12c + fStack_8c * fVar246 + fStack_ac * fVar324;
        fStack_788 = fStack_c8 * fVar266 +
                     fVar288 * fStack_128 + fStack_88 * fVar195 + fStack_a8 * fVar325;
        fStack_784 = fStack_784 + fVar326 + fVar211;
        pfVar1 = (float *)(catmullrom_basis1 + lVar147 * 4 + lVar144);
        fVar268 = *pfVar1;
        fVar347 = pfVar1[1];
        fVar288 = pfVar1[2];
        fVar312 = pfVar1[3];
        fVar313 = pfVar1[4];
        fVar249 = pfVar1[5];
        fVar196 = pfVar1[6];
        pauVar8 = (undefined1 (*) [28])(lVar144 + 0x2206c10 + lVar147 * 4);
        fVar253 = *(float *)*pauVar8;
        fVar285 = *(float *)(*pauVar8 + 4);
        fVar267 = *(float *)(*pauVar8 + 8);
        fVar287 = *(float *)(*pauVar8 + 0xc);
        fVar323 = *(float *)(*pauVar8 + 0x10);
        fVar324 = *(float *)(*pauVar8 + 0x14);
        fVar325 = *(float *)(*pauVar8 + 0x18);
        auVar136 = *pauVar8;
        auVar154 = *(undefined1 (*) [32])(lVar144 + 0x2207094 + lVar147 * 4);
        auVar166 = ZEXT3264(auVar154);
        pfVar2 = (float *)(lVar144 + 0x2207518 + lVar147 * 4);
        fVar326 = *pfVar2;
        fVar211 = pfVar2[1];
        fVar149 = pfVar2[2];
        fVar168 = pfVar2[3];
        fVar171 = pfVar2[4];
        fVar197 = pfVar2[5];
        fVar298 = pfVar2[6];
        fVar178 = pfVar2[7];
        fVar226 = auVar154._0_4_;
        fVar237 = auVar154._4_4_;
        fVar239 = auVar154._8_4_;
        fVar241 = auVar154._12_4_;
        fVar247 = auVar154._16_4_;
        fVar266 = auVar154._20_4_;
        fVar250 = auVar154._24_4_;
        fVar252 = fVar178 + fVar178 + fStack_404;
        auVar273._0_4_ =
             fVar227 * fVar268 +
             fVar253 * auVar320._0_4_ + fVar179 * fVar226 + (float)local_420._0_4_ * fVar326;
        auVar273._4_4_ =
             fVar238 * fVar347 +
             fVar285 * auVar320._4_4_ + fVar191 * fVar237 + (float)local_420._4_4_ * fVar211;
        auVar273._8_4_ =
             fVar240 * fVar288 + fVar267 * auVar320._8_4_ + fVar192 * fVar239 + fStack_418 * fVar149
        ;
        auVar273._12_4_ =
             fVar242 * fVar312 +
             fVar287 * auVar320._12_4_ + fVar193 * fVar241 + fStack_414 * fVar168;
        auVar273._16_4_ =
             fVar245 * fVar313 +
             fVar323 * auVar320._16_4_ + fVar278 * fVar247 + fStack_410 * fVar171;
        auVar273._20_4_ =
             fVar248 * fVar249 +
             fVar324 * auVar320._20_4_ + fVar264 * fVar266 + fStack_40c * fVar197;
        auVar273._24_4_ =
             fVar251 * fVar196 +
             fVar325 * auVar320._24_4_ + fVar281 * fVar250 + fStack_408 * fVar298;
        auVar273._28_4_ = fStack_a4 + fVar178 + fVar252;
        local_520._0_4_ =
             fVar268 * (float)local_340._0_4_ +
             (float)local_320._0_4_ * fVar253 + fVar212 * fVar226 + fVar148 * fVar326;
        local_520._4_4_ =
             fVar347 * (float)local_340._4_4_ +
             (float)local_320._4_4_ * fVar285 + fVar223 * fVar237 + fVar167 * fVar211;
        local_520._8_4_ =
             fVar288 * fStack_338 + fStack_318 * fVar267 + fVar224 * fVar239 + fVar170 * fVar149;
        local_520._12_4_ =
             fVar312 * fStack_334 + fStack_314 * fVar287 + fVar225 * fVar241 + fVar173 * fVar168;
        local_520._16_4_ =
             fVar313 * fStack_330 + fStack_310 * fVar323 + fVar244 * fVar247 + fVar270 * fVar171;
        local_520._20_4_ =
             fVar249 * fStack_32c + fStack_30c * fVar324 + fVar265 * fVar266 + fVar262 * fVar197;
        local_520._24_4_ =
             fVar196 * fStack_328 + fStack_308 * fVar325 + fVar283 * fVar250 + fVar275 * fVar298;
        local_520._28_4_ = fVar252 + fVar178 + fVar178 + fVar263;
        auVar363._0_4_ =
             fVar253 * (float)local_140._0_4_ +
             (float)local_c0._0_4_ * fVar326 + (float)local_a0._0_4_ * fVar226 +
             (float)local_e0._0_4_ * fVar268;
        auVar363._4_4_ =
             fVar285 * (float)local_140._4_4_ +
             (float)local_c0._4_4_ * fVar211 + (float)local_a0._4_4_ * fVar237 +
             (float)local_e0._4_4_ * fVar347;
        auVar363._8_4_ =
             fVar267 * fStack_138 + fStack_b8 * fVar149 + fStack_98 * fVar239 + fStack_d8 * fVar288;
        auVar363._12_4_ =
             fVar287 * fStack_134 + fStack_b4 * fVar168 + fStack_94 * fVar241 + fStack_d4 * fVar312;
        auVar363._16_4_ =
             fVar323 * fStack_130 + fStack_b0 * fVar171 + fStack_90 * fVar247 + fStack_d0 * fVar313;
        auVar363._20_4_ =
             fVar324 * fStack_12c + fStack_ac * fVar197 + fStack_8c * fVar266 + fStack_cc * fVar249;
        auVar363._24_4_ =
             fVar325 * fStack_128 + fStack_a8 * fVar298 + fStack_88 * fVar250 + fStack_c8 * fVar196;
        auVar363._28_4_ = fVar178 + fStack_a4 + fVar178 + fVar252;
        auVar24 = vsubps_avx(auVar273,local_640);
        auVar25 = vsubps_avx(local_520,auVar208);
        fVar253 = auVar24._0_4_;
        fVar262 = auVar24._4_4_;
        auVar84._4_4_ = auVar208._4_4_ * fVar262;
        auVar84._0_4_ = auVar208._0_4_ * fVar253;
        fVar263 = auVar24._8_4_;
        auVar84._8_4_ = auVar208._8_4_ * fVar263;
        fVar264 = auVar24._12_4_;
        auVar84._12_4_ = auVar208._12_4_ * fVar264;
        fVar244 = auVar24._16_4_;
        auVar84._16_4_ = auVar208._16_4_ * fVar244;
        fVar283 = auVar24._20_4_;
        auVar84._20_4_ = auVar208._20_4_ * fVar283;
        fVar267 = auVar24._24_4_;
        auVar84._24_4_ = auVar208._24_4_ * fVar267;
        auVar84._28_4_ = fVar252;
        fVar270 = auVar25._0_4_;
        fVar275 = auVar25._4_4_;
        auVar85._4_4_ = local_640._4_4_ * fVar275;
        auVar85._0_4_ = (float)local_640._0_4_ * fVar270;
        fVar278 = auVar25._8_4_;
        auVar85._8_4_ = local_640._8_4_ * fVar278;
        fVar281 = auVar25._12_4_;
        auVar85._12_4_ = local_640._12_4_ * fVar281;
        fVar265 = auVar25._16_4_;
        auVar85._16_4_ = local_640._16_4_ * fVar265;
        fVar285 = auVar25._20_4_;
        auVar85._20_4_ = local_640._20_4_ * fVar285;
        fVar287 = auVar25._24_4_;
        auVar85._24_4_ = local_640._24_4_ * fVar287;
        auVar85._28_4_ = local_520._28_4_;
        auVar26 = vsubps_avx(auVar84,auVar85);
        auVar23 = vmaxps_avx(_local_7a0,auVar363);
        auVar86._4_4_ = auVar23._4_4_ * auVar23._4_4_ * (fVar262 * fVar262 + fVar275 * fVar275);
        auVar86._0_4_ = auVar23._0_4_ * auVar23._0_4_ * (fVar253 * fVar253 + fVar270 * fVar270);
        auVar86._8_4_ = auVar23._8_4_ * auVar23._8_4_ * (fVar263 * fVar263 + fVar278 * fVar278);
        auVar86._12_4_ = auVar23._12_4_ * auVar23._12_4_ * (fVar264 * fVar264 + fVar281 * fVar281);
        auVar86._16_4_ = auVar23._16_4_ * auVar23._16_4_ * (fVar244 * fVar244 + fVar265 * fVar265);
        auVar86._20_4_ = auVar23._20_4_ * auVar23._20_4_ * (fVar283 * fVar283 + fVar285 * fVar285);
        auVar86._24_4_ = auVar23._24_4_ * auVar23._24_4_ * (fVar267 * fVar267 + fVar287 * fVar287);
        auVar86._28_4_ = auVar273._28_4_ + local_520._28_4_;
        auVar87._4_4_ = auVar26._4_4_ * auVar26._4_4_;
        auVar87._0_4_ = auVar26._0_4_ * auVar26._0_4_;
        auVar87._8_4_ = auVar26._8_4_ * auVar26._8_4_;
        auVar87._12_4_ = auVar26._12_4_ * auVar26._12_4_;
        auVar87._16_4_ = auVar26._16_4_ * auVar26._16_4_;
        auVar87._20_4_ = auVar26._20_4_ * auVar26._20_4_;
        auVar87._24_4_ = auVar26._24_4_ * auVar26._24_4_;
        auVar87._28_4_ = auVar26._28_4_;
        local_360 = vcmpps_avx(auVar87,auVar86,2);
        auVar190 = ZEXT3264(local_360);
        local_260 = (uint)lVar147;
        auVar214 = vpshufd_avx(ZEXT416(local_260),0);
        auVar385 = vpor_avx(auVar214,_DAT_01f4ad30);
        auVar214 = vpor_avx(auVar214,_DAT_01f7afa0);
        auVar385 = vpcmpgtd_avx(_local_380,auVar385);
        auVar214 = vpcmpgtd_avx(_local_380,auVar214);
        auVar222._16_16_ = auVar214;
        auVar222._0_16_ = auVar385;
        auVar23 = auVar222 & local_360;
        fVar148 = (float)local_740._0_4_;
        fVar167 = (float)local_740._4_4_;
        fVar170 = fStack_738;
        fVar173 = fStack_734;
        fVar270 = fStack_730;
        fVar262 = fStack_72c;
        fVar275 = fStack_728;
        fVar263 = fStack_724;
        fVar179 = (float)local_7c0._0_4_;
        fVar191 = (float)local_7c0._4_4_;
        fVar192 = fStack_7b8;
        fVar193 = fStack_7b4;
        fVar278 = fStack_7b0;
        fVar264 = fStack_7ac;
        fVar281 = fStack_7a8;
        fVar212 = (float)local_760._0_4_;
        fVar223 = (float)local_760._4_4_;
        fVar224 = fStack_758;
        fVar225 = fStack_754;
        fVar244 = fStack_750;
        fVar265 = fStack_74c;
        fVar283 = fStack_748;
        if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar23 >> 0x7f,0) == '\0') &&
              (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar23 >> 0xbf,0) == '\0') &&
            (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar23[0x1f]) {
          auVar320 = ZEXT3264(_local_780);
          auVar370 = ZEXT3264(auVar370._0_32_);
        }
        else {
          local_560._0_4_ = auVar136._0_4_;
          local_560._4_4_ = auVar136._4_4_;
          fStack_558 = auVar136._8_4_;
          fStack_554 = auVar136._12_4_;
          fStack_550 = auVar136._16_4_;
          fStack_54c = auVar136._20_4_;
          fStack_548 = auVar136._24_4_;
          fVar253 = (float)local_2e0._0_4_ * (float)local_560._0_4_;
          fVar285 = (float)local_2e0._4_4_ * (float)local_560._4_4_;
          fVar267 = fStack_2d8 * fStack_558;
          fVar287 = fStack_2d4 * fStack_554;
          fVar323 = fStack_2d0 * fStack_550;
          fVar324 = fStack_2cc * fStack_54c;
          fVar325 = fStack_2c8 * fStack_548;
          _local_560 = auVar222;
          local_580 = fVar268 * (float)local_460._0_4_ +
                      fVar253 + (float)local_300._0_4_ * fVar226 + (float)local_5a0._0_4_ * fVar326;
          fStack_57c = fVar347 * (float)local_460._4_4_ +
                       fVar285 + (float)local_300._4_4_ * fVar237 + (float)local_5a0._4_4_ * fVar211
          ;
          fStack_578 = fVar288 * fStack_458 + fVar267 + fStack_2f8 * fVar239 + fStack_598 * fVar149;
          fStack_574 = fVar312 * fStack_454 + fVar287 + fStack_2f4 * fVar241 + fStack_594 * fVar168;
          fStack_570 = fVar313 * fStack_450 + fVar323 + fStack_2f0 * fVar247 + fStack_590 * fVar171;
          fStack_56c = fVar249 * fStack_44c + fVar324 + fStack_2ec * fVar266 + fStack_58c * fVar197;
          fStack_568 = fVar196 * fStack_448 + fVar325 + fStack_2e8 * fVar250 + fStack_588 * fVar298;
          fStack_564 = pfVar1[7] + auVar154._28_4_ + local_360._28_4_ + 0.0;
          local_480._0_4_ = auVar134._0_4_;
          local_480._4_4_ = auVar134._4_4_;
          fStack_478 = auVar134._8_4_;
          fStack_474 = auVar134._12_4_;
          fStack_470 = auVar134._16_4_;
          fStack_46c = auVar134._20_4_;
          fStack_468 = auVar134._24_4_;
          fVar252 = (float)local_2e0._0_4_ * (float)local_480._0_4_;
          fVar169 = (float)local_2e0._4_4_ * (float)local_480._4_4_;
          fVar172 = fStack_2d8 * fStack_478;
          fVar174 = fStack_2d4 * fStack_474;
          fVar175 = fStack_2d0 * fStack_470;
          fVar176 = fStack_2cc * fStack_46c;
          fVar177 = fStack_2c8 * fStack_468;
          local_600._0_4_ = auVar133._0_4_;
          local_600._4_4_ = auVar133._4_4_;
          fStack_5f8 = auVar133._8_4_;
          fStack_5f4 = auVar133._12_4_;
          fStack_5f0 = auVar133._16_4_;
          fStack_5ec = auVar133._20_4_;
          fStack_5e8 = auVar133._24_4_;
          fVar271 = (float)local_5a0._0_4_ * (float)local_600._0_4_;
          fVar277 = (float)local_5a0._4_4_ * (float)local_600._4_4_;
          fVar280 = fStack_598 * fStack_5f8;
          fVar282 = fStack_594 * fStack_5f4;
          fVar284 = fStack_590 * fStack_5f0;
          fVar286 = fStack_58c * fStack_5ec;
          fVar289 = fStack_588 * fStack_5e8;
          pfVar1 = (float *)(lVar144 + 0x2205e84 + lVar147 * 4);
          fVar226 = *pfVar1;
          fVar253 = pfVar1[1];
          fVar237 = pfVar1[2];
          fVar239 = pfVar1[3];
          fVar241 = pfVar1[4];
          fVar247 = pfVar1[5];
          fVar266 = pfVar1[6];
          pfVar2 = (float *)(lVar144 + 0x2206308 + lVar147 * 4);
          fVar285 = *pfVar2;
          fVar250 = pfVar2[1];
          fVar267 = pfVar2[2];
          fVar287 = pfVar2[3];
          fVar268 = pfVar2[4];
          fVar347 = pfVar2[5];
          fVar288 = pfVar2[6];
          _local_480 = auVar363;
          _local_600 = auVar25;
          fVar290 = *(float *)pauVar8[1] + 0.0;
          pfVar3 = (float *)(lVar144 + 0x2205a00 + lVar147 * 4);
          fVar312 = *pfVar3;
          fVar313 = pfVar3[1];
          fVar249 = pfVar3[2];
          fVar196 = pfVar3[3];
          fVar323 = pfVar3[4];
          fVar324 = pfVar3[5];
          fVar325 = pfVar3[6];
          fVar178 = pfVar1[7] + pfVar2[7];
          fVar198 = pfVar2[7] + fVar290;
          fVar290 = *(float *)pauVar8[1] + auVar363._28_4_ + fVar290;
          pfVar1 = (float *)(lVar144 + 0x220557c + lVar147 * 4);
          fVar326 = *pfVar1;
          fVar211 = pfVar1[1];
          fVar149 = pfVar1[2];
          fVar168 = pfVar1[3];
          fVar171 = pfVar1[4];
          fVar197 = pfVar1[5];
          fVar298 = pfVar1[6];
          local_440 = fVar227 * fVar326 +
                      (float)local_780._0_4_ * fVar312 +
                      (float)local_7c0._0_4_ * fVar226 + (float)local_420._0_4_ * fVar285;
          fStack_43c = fVar238 * fVar211 +
                       (float)local_780._4_4_ * fVar313 +
                       (float)local_7c0._4_4_ * fVar253 + (float)local_420._4_4_ * fVar250;
          fStack_438 = fVar240 * fVar149 +
                       fStack_778 * fVar249 + fStack_7b8 * fVar237 + fStack_418 * fVar267;
          fStack_434 = fVar242 * fVar168 +
                       fStack_774 * fVar196 + fStack_7b4 * fVar239 + fStack_414 * fVar287;
          fStack_430 = fVar245 * fVar171 +
                       fStack_770 * fVar323 + fStack_7b0 * fVar241 + fStack_410 * fVar268;
          fStack_42c = fVar248 * fVar197 +
                       fStack_76c * fVar324 + fStack_7ac * fVar247 + fStack_40c * fVar347;
          fStack_428 = fVar251 * fVar298 +
                       fStack_768 * fVar325 + fStack_7a8 * fVar266 + fStack_408 * fVar288;
          fStack_424 = fVar178 + fVar198;
          local_3a0._4_4_ =
               fVar211 * (float)local_340._4_4_ +
               (float)local_760._4_4_ * fVar253 + (float)local_740._4_4_ * fVar250 +
               (float)local_320._4_4_ * fVar313;
          local_3a0._0_4_ =
               fVar326 * (float)local_340._0_4_ +
               (float)local_760._0_4_ * fVar226 + (float)local_740._0_4_ * fVar285 +
               (float)local_320._0_4_ * fVar312;
          fStack_398 = fVar149 * fStack_338 +
                       fStack_758 * fVar237 + fStack_738 * fVar267 + fStack_318 * fVar249;
          fStack_394 = fVar168 * fStack_334 +
                       fStack_754 * fVar239 + fStack_734 * fVar287 + fStack_314 * fVar196;
          fStack_390 = fVar171 * fStack_330 +
                       fStack_750 * fVar241 + fStack_730 * fVar268 + fStack_310 * fVar323;
          fStack_38c = fVar197 * fStack_32c +
                       fStack_74c * fVar247 + fStack_72c * fVar347 + fStack_30c * fVar324;
          fStack_388 = fVar298 * fStack_328 +
                       fStack_748 * fVar266 + fStack_728 * fVar288 + fStack_308 * fVar325;
          fStack_384 = fVar198 + fVar290;
          auVar364._0_4_ =
               fVar312 * (float)local_2e0._0_4_ +
               (float)local_300._0_4_ * fVar226 + (float)local_5a0._0_4_ * fVar285 +
               fVar326 * (float)local_460._0_4_;
          auVar364._4_4_ =
               fVar313 * (float)local_2e0._4_4_ +
               (float)local_300._4_4_ * fVar253 + (float)local_5a0._4_4_ * fVar250 +
               fVar211 * (float)local_460._4_4_;
          auVar364._8_4_ =
               fVar249 * fStack_2d8 + fStack_2f8 * fVar237 + fStack_598 * fVar267 +
               fVar149 * fStack_458;
          auVar364._12_4_ =
               fVar196 * fStack_2d4 + fStack_2f4 * fVar239 + fStack_594 * fVar287 +
               fVar168 * fStack_454;
          auVar364._16_4_ =
               fVar323 * fStack_2d0 + fStack_2f0 * fVar241 + fStack_590 * fVar268 +
               fVar171 * fStack_450;
          auVar364._20_4_ =
               fVar324 * fStack_2cc + fStack_2ec * fVar247 + fStack_58c * fVar347 +
               fVar197 * fStack_44c;
          auVar364._24_4_ =
               fVar325 * fStack_2c8 + fStack_2e8 * fVar266 + fStack_588 * fVar288 +
               fVar298 * fStack_448;
          auVar364._28_4_ = pfVar3[7] + fVar178 + fVar290;
          pfVar1 = (float *)(lVar144 + 0x22082a4 + lVar147 * 4);
          fVar253 = *pfVar1;
          fVar237 = pfVar1[1];
          fVar239 = pfVar1[2];
          fVar241 = pfVar1[3];
          fVar247 = pfVar1[4];
          fVar266 = pfVar1[5];
          fVar285 = pfVar1[6];
          pfVar2 = (float *)(lVar144 + 0x2208728 + lVar147 * 4);
          fVar250 = *pfVar2;
          fVar267 = pfVar2[1];
          fVar287 = pfVar2[2];
          fVar268 = pfVar2[3];
          fVar347 = pfVar2[4];
          fVar288 = pfVar2[5];
          fVar312 = pfVar2[6];
          fVar226 = auVar370._28_4_;
          pfVar3 = (float *)(lVar144 + 0x2207e20 + lVar147 * 4);
          fVar313 = *pfVar3;
          fVar249 = pfVar3[1];
          fVar196 = pfVar3[2];
          fVar323 = pfVar3[3];
          fVar324 = pfVar3[4];
          fVar325 = pfVar3[5];
          fVar326 = pfVar3[6];
          pfVar4 = (float *)(lVar144 + 0x220799c + lVar147 * 4);
          fVar211 = *pfVar4;
          fVar149 = pfVar4[1];
          fVar168 = pfVar4[2];
          fVar171 = pfVar4[3];
          fVar197 = pfVar4[4];
          fVar298 = pfVar4[5];
          fVar178 = pfVar4[6];
          auVar318._0_4_ =
               fVar211 * (float)local_660._0_4_ +
               (float)local_780._0_4_ * fVar313 +
               (float)local_7c0._0_4_ * fVar253 + (float)local_420._0_4_ * fVar250;
          auVar318._4_4_ =
               fVar149 * (float)local_660._4_4_ +
               (float)local_780._4_4_ * fVar249 +
               (float)local_7c0._4_4_ * fVar237 + (float)local_420._4_4_ * fVar267;
          auVar318._8_4_ =
               fVar168 * fStack_658 +
               fStack_778 * fVar196 + fStack_7b8 * fVar239 + fStack_418 * fVar287;
          auVar318._12_4_ =
               fVar171 * fStack_654 +
               fStack_774 * fVar323 + fStack_7b4 * fVar241 + fStack_414 * fVar268;
          auVar318._16_4_ =
               fVar197 * fStack_650 +
               fStack_770 * fVar324 + fStack_7b0 * fVar247 + fStack_410 * fVar347;
          auVar318._20_4_ =
               fVar298 * fStack_64c +
               fStack_76c * fVar325 + fStack_7ac * fVar266 + fStack_40c * fVar288;
          auVar318._24_4_ =
               fVar178 * fStack_648 +
               fStack_768 * fVar326 + fStack_7a8 * fVar285 + fStack_408 * fVar312;
          auVar318._28_4_ = fVar226 + fVar226 + fStack_404 + fVar226;
          auVar356._0_4_ =
               fVar211 * (float)local_340._0_4_ +
               (float)local_320._0_4_ * fVar313 +
               (float)local_760._0_4_ * fVar253 + (float)local_740._0_4_ * fVar250;
          auVar356._4_4_ =
               fVar149 * (float)local_340._4_4_ +
               (float)local_320._4_4_ * fVar249 +
               (float)local_760._4_4_ * fVar237 + (float)local_740._4_4_ * fVar267;
          auVar356._8_4_ =
               fVar168 * fStack_338 +
               fStack_318 * fVar196 + fStack_758 * fVar239 + fStack_738 * fVar287;
          auVar356._12_4_ =
               fVar171 * fStack_334 +
               fStack_314 * fVar323 + fStack_754 * fVar241 + fStack_734 * fVar268;
          auVar356._16_4_ =
               fVar197 * fStack_330 +
               fStack_310 * fVar324 + fStack_750 * fVar247 + fStack_730 * fVar347;
          auVar356._20_4_ =
               fVar298 * fStack_32c +
               fStack_30c * fVar325 + fStack_74c * fVar266 + fStack_72c * fVar288;
          auVar356._24_4_ =
               fVar178 * fStack_328 +
               fStack_308 * fVar326 + fStack_748 * fVar285 + fStack_728 * fVar312;
          auVar356._28_4_ = fVar226 + fVar226 + fStack_724 + fVar226;
          auVar261._8_4_ = 0x7fffffff;
          auVar261._0_8_ = 0x7fffffff7fffffff;
          auVar261._12_4_ = 0x7fffffff;
          auVar261._16_4_ = 0x7fffffff;
          auVar261._20_4_ = 0x7fffffff;
          auVar261._24_4_ = 0x7fffffff;
          auVar261._28_4_ = 0x7fffffff;
          auVar131._4_4_ = fStack_43c;
          auVar131._0_4_ = local_440;
          auVar131._8_4_ = fStack_438;
          auVar131._12_4_ = fStack_434;
          auVar131._16_4_ = fStack_430;
          auVar131._20_4_ = fStack_42c;
          auVar131._24_4_ = fStack_428;
          auVar131._28_4_ = fStack_424;
          auVar154 = vandps_avx(auVar131,auVar261);
          auVar23 = vandps_avx(_local_3a0,auVar261);
          auVar23 = vmaxps_avx(auVar154,auVar23);
          auVar154 = vandps_avx(auVar364,auVar261);
          auVar23 = vmaxps_avx(auVar23,auVar154);
          auVar23 = vcmpps_avx(auVar23,_local_3c0,1);
          auVar26 = vblendvps_avx(auVar131,auVar24,auVar23);
          auVar163._0_4_ =
               fVar211 * (float)local_460._0_4_ +
               fVar313 * (float)local_2e0._0_4_ +
               fVar250 * (float)local_5a0._0_4_ + (float)local_300._0_4_ * fVar253;
          auVar163._4_4_ =
               fVar149 * (float)local_460._4_4_ +
               fVar249 * (float)local_2e0._4_4_ +
               fVar267 * (float)local_5a0._4_4_ + (float)local_300._4_4_ * fVar237;
          auVar163._8_4_ =
               fVar168 * fStack_458 +
               fVar196 * fStack_2d8 + fVar287 * fStack_598 + fStack_2f8 * fVar239;
          auVar163._12_4_ =
               fVar171 * fStack_454 +
               fVar323 * fStack_2d4 + fVar268 * fStack_594 + fStack_2f4 * fVar241;
          auVar163._16_4_ =
               fVar197 * fStack_450 +
               fVar324 * fStack_2d0 + fVar347 * fStack_590 + fStack_2f0 * fVar247;
          auVar163._20_4_ =
               fVar298 * fStack_44c +
               fVar325 * fStack_2cc + fVar288 * fStack_58c + fStack_2ec * fVar266;
          auVar163._24_4_ =
               fVar178 * fStack_448 +
               fVar326 * fStack_2c8 + fVar312 * fStack_588 + fStack_2e8 * fVar285;
          auVar163._28_4_ = auVar154._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
          auVar27 = vblendvps_avx(_local_3a0,auVar25,auVar23);
          auVar154 = vandps_avx(auVar318,auVar261);
          auVar23 = vandps_avx(auVar356,auVar261);
          auVar28 = vmaxps_avx(auVar154,auVar23);
          auVar154 = vandps_avx(auVar163,auVar261);
          auVar154 = vmaxps_avx(auVar28,auVar154);
          local_540._0_4_ = auVar135._0_4_;
          local_540._4_4_ = auVar135._4_4_;
          fStack_538 = auVar135._8_4_;
          fStack_534 = auVar135._12_4_;
          fStack_530 = auVar135._16_4_;
          fStack_52c = auVar135._20_4_;
          fStack_528 = auVar135._24_4_;
          auVar23 = vcmpps_avx(auVar154,_local_3c0,1);
          auVar154 = vblendvps_avx(auVar318,auVar24,auVar23);
          auVar164._0_4_ =
               (float)local_460._0_4_ * (float)local_540._0_4_ +
               fVar252 + (float)local_300._0_4_ * fVar210 + fVar271;
          auVar164._4_4_ =
               (float)local_460._4_4_ * (float)local_540._4_4_ +
               fVar169 + (float)local_300._4_4_ * fVar243 + fVar277;
          auVar164._8_4_ = fStack_458 * fStack_538 + fVar172 + fStack_2f8 * fVar194 + fVar280;
          auVar164._12_4_ = fStack_454 * fStack_534 + fVar174 + fStack_2f4 * fVar307 + fVar282;
          auVar164._16_4_ = fStack_450 * fStack_530 + fVar175 + fStack_2f0 * fVar310 + fVar284;
          auVar164._20_4_ = fStack_44c * fStack_52c + fVar176 + fStack_2ec * fVar246 + fVar286;
          auVar164._24_4_ = fStack_448 * fStack_528 + fVar177 + fStack_2e8 * fVar195 + fVar289;
          auVar164._28_4_ = auVar28._28_4_ + fStack_564 + local_360._28_4_ + 0.0;
          auVar23 = vblendvps_avx(auVar356,auVar25,auVar23);
          fVar178 = auVar26._0_4_;
          fVar252 = auVar26._4_4_;
          fVar227 = auVar26._8_4_;
          fVar238 = auVar26._12_4_;
          fVar240 = auVar26._16_4_;
          fVar242 = auVar26._20_4_;
          fVar245 = auVar26._24_4_;
          fVar248 = auVar26._28_4_;
          fVar210 = auVar154._0_4_;
          fVar194 = auVar154._4_4_;
          fVar310 = auVar154._8_4_;
          fVar195 = auVar154._12_4_;
          fVar313 = auVar154._16_4_;
          fVar196 = auVar154._20_4_;
          fVar324 = auVar154._24_4_;
          fVar226 = auVar27._0_4_;
          fVar237 = auVar27._4_4_;
          fVar241 = auVar27._8_4_;
          fVar266 = auVar27._12_4_;
          fVar250 = auVar27._16_4_;
          fVar287 = auVar27._20_4_;
          fVar347 = auVar27._24_4_;
          auVar336._0_4_ = fVar226 * fVar226 + fVar178 * fVar178;
          auVar336._4_4_ = fVar237 * fVar237 + fVar252 * fVar252;
          auVar336._8_4_ = fVar241 * fVar241 + fVar227 * fVar227;
          auVar336._12_4_ = fVar266 * fVar266 + fVar238 * fVar238;
          auVar336._16_4_ = fVar250 * fVar250 + fVar240 * fVar240;
          auVar336._20_4_ = fVar287 * fVar287 + fVar242 * fVar242;
          auVar336._24_4_ = fVar347 * fVar347 + fVar245 * fVar245;
          auVar336._28_4_ = fStack_304 + auVar25._28_4_;
          auVar24 = vrsqrtps_avx(auVar336);
          fVar253 = auVar24._0_4_;
          fVar239 = auVar24._4_4_;
          auVar88._4_4_ = fVar239 * 1.5;
          auVar88._0_4_ = fVar253 * 1.5;
          fVar247 = auVar24._8_4_;
          auVar88._8_4_ = fVar247 * 1.5;
          fVar285 = auVar24._12_4_;
          auVar88._12_4_ = fVar285 * 1.5;
          fVar267 = auVar24._16_4_;
          auVar88._16_4_ = fVar267 * 1.5;
          fVar268 = auVar24._20_4_;
          auVar88._20_4_ = fVar268 * 1.5;
          fVar288 = auVar24._24_4_;
          auVar88._24_4_ = fVar288 * 1.5;
          auVar88._28_4_ = auVar356._28_4_;
          auVar89._4_4_ = fVar239 * fVar239 * fVar239 * auVar336._4_4_ * 0.5;
          auVar89._0_4_ = fVar253 * fVar253 * fVar253 * auVar336._0_4_ * 0.5;
          auVar89._8_4_ = fVar247 * fVar247 * fVar247 * auVar336._8_4_ * 0.5;
          auVar89._12_4_ = fVar285 * fVar285 * fVar285 * auVar336._12_4_ * 0.5;
          auVar89._16_4_ = fVar267 * fVar267 * fVar267 * auVar336._16_4_ * 0.5;
          auVar89._20_4_ = fVar268 * fVar268 * fVar268 * auVar336._20_4_ * 0.5;
          auVar89._24_4_ = fVar288 * fVar288 * fVar288 * auVar336._24_4_ * 0.5;
          auVar89._28_4_ = auVar336._28_4_;
          auVar25 = vsubps_avx(auVar88,auVar89);
          fVar326 = auVar25._0_4_;
          fVar211 = auVar25._4_4_;
          fVar149 = auVar25._8_4_;
          fVar168 = auVar25._12_4_;
          fVar171 = auVar25._16_4_;
          fVar197 = auVar25._20_4_;
          fVar298 = auVar25._24_4_;
          fVar253 = auVar23._0_4_;
          fVar239 = auVar23._4_4_;
          fVar247 = auVar23._8_4_;
          fVar285 = auVar23._12_4_;
          fVar267 = auVar23._16_4_;
          fVar268 = auVar23._20_4_;
          fVar288 = auVar23._24_4_;
          auVar304._0_4_ = fVar253 * fVar253 + fVar210 * fVar210;
          auVar304._4_4_ = fVar239 * fVar239 + fVar194 * fVar194;
          auVar304._8_4_ = fVar247 * fVar247 + fVar310 * fVar310;
          auVar304._12_4_ = fVar285 * fVar285 + fVar195 * fVar195;
          auVar304._16_4_ = fVar267 * fVar267 + fVar313 * fVar313;
          auVar304._20_4_ = fVar268 * fVar268 + fVar196 * fVar196;
          auVar304._24_4_ = fVar288 * fVar288 + fVar324 * fVar324;
          auVar304._28_4_ = auVar24._28_4_ + auVar154._28_4_;
          auVar154 = vrsqrtps_avx(auVar304);
          fVar243 = auVar154._0_4_;
          fVar307 = auVar154._4_4_;
          auVar90._4_4_ = fVar307 * 1.5;
          auVar90._0_4_ = fVar243 * 1.5;
          fVar246 = auVar154._8_4_;
          auVar90._8_4_ = fVar246 * 1.5;
          fVar312 = auVar154._12_4_;
          auVar90._12_4_ = fVar312 * 1.5;
          fVar249 = auVar154._16_4_;
          auVar90._16_4_ = fVar249 * 1.5;
          fVar323 = auVar154._20_4_;
          auVar90._20_4_ = fVar323 * 1.5;
          fVar325 = auVar154._24_4_;
          auVar90._24_4_ = fVar325 * 1.5;
          auVar90._28_4_ = auVar356._28_4_;
          auVar91._4_4_ = fVar307 * fVar307 * fVar307 * auVar304._4_4_ * 0.5;
          auVar91._0_4_ = fVar243 * fVar243 * fVar243 * auVar304._0_4_ * 0.5;
          auVar91._8_4_ = fVar246 * fVar246 * fVar246 * auVar304._8_4_ * 0.5;
          auVar91._12_4_ = fVar312 * fVar312 * fVar312 * auVar304._12_4_ * 0.5;
          auVar91._16_4_ = fVar249 * fVar249 * fVar249 * auVar304._16_4_ * 0.5;
          auVar91._20_4_ = fVar323 * fVar323 * fVar323 * auVar304._20_4_ * 0.5;
          auVar91._24_4_ = fVar325 * fVar325 * fVar325 * auVar304._24_4_ * 0.5;
          auVar91._28_4_ = auVar304._28_4_;
          auVar23 = vsubps_avx(auVar90,auVar91);
          fVar243 = auVar23._0_4_;
          fVar307 = auVar23._4_4_;
          fVar246 = auVar23._8_4_;
          fVar312 = auVar23._12_4_;
          fVar249 = auVar23._16_4_;
          fVar323 = auVar23._20_4_;
          fVar325 = auVar23._24_4_;
          fVar226 = (float)local_7a0._0_4_ * fVar326 * fVar226;
          fVar237 = (float)local_7a0._4_4_ * fVar211 * fVar237;
          auVar92._4_4_ = fVar237;
          auVar92._0_4_ = fVar226;
          fVar241 = fStack_798 * fVar149 * fVar241;
          auVar92._8_4_ = fVar241;
          fVar266 = fStack_794 * fVar168 * fVar266;
          auVar92._12_4_ = fVar266;
          fVar250 = fStack_790 * fVar171 * fVar250;
          auVar92._16_4_ = fVar250;
          fVar287 = fStack_78c * fVar197 * fVar287;
          auVar92._20_4_ = fVar287;
          fVar347 = fStack_788 * fVar298 * fVar347;
          auVar92._24_4_ = fVar347;
          auVar92._28_4_ = auVar154._28_4_;
          local_540._4_4_ = fVar237 + local_640._4_4_;
          local_540._0_4_ = fVar226 + (float)local_640._0_4_;
          fStack_538 = fVar241 + local_640._8_4_;
          fStack_534 = fVar266 + local_640._12_4_;
          fStack_530 = fVar250 + local_640._16_4_;
          fStack_52c = fVar287 + local_640._20_4_;
          fStack_528 = fVar347 + local_640._24_4_;
          fStack_524 = auVar154._28_4_ + local_640._28_4_;
          local_5e0 = (float)local_7a0._0_4_ * fVar326 * -fVar178;
          fStack_5dc = (float)local_7a0._4_4_ * fVar211 * -fVar252;
          auVar93._4_4_ = fStack_5dc;
          auVar93._0_4_ = local_5e0;
          fStack_5d8 = fStack_798 * fVar149 * -fVar227;
          auVar93._8_4_ = fStack_5d8;
          fStack_5d4 = fStack_794 * fVar168 * -fVar238;
          auVar93._12_4_ = fStack_5d4;
          fStack_5d0 = fStack_790 * fVar171 * -fVar240;
          auVar93._16_4_ = fStack_5d0;
          fStack_5cc = fStack_78c * fVar197 * -fVar242;
          auVar93._20_4_ = fStack_5cc;
          fStack_5c8 = fStack_788 * fVar298 * -fVar245;
          auVar93._24_4_ = fStack_5c8;
          auVar93._28_4_ = -fVar248;
          local_5e0 = auVar208._0_4_ + local_5e0;
          fStack_5dc = auVar208._4_4_ + fStack_5dc;
          fStack_5d8 = auVar208._8_4_ + fStack_5d8;
          fStack_5d4 = auVar208._12_4_ + fStack_5d4;
          fStack_5d0 = auVar208._16_4_ + fStack_5d0;
          fStack_5cc = auVar208._20_4_ + fStack_5cc;
          fStack_5c8 = auVar208._24_4_ + fStack_5c8;
          fStack_5c4 = auVar208._28_4_ + -fVar248;
          fVar226 = fVar326 * 0.0 * (float)local_7a0._0_4_;
          fVar237 = fVar211 * 0.0 * (float)local_7a0._4_4_;
          auVar94._4_4_ = fVar237;
          auVar94._0_4_ = fVar226;
          fVar241 = fVar149 * 0.0 * fStack_798;
          auVar94._8_4_ = fVar241;
          fVar266 = fVar168 * 0.0 * fStack_794;
          auVar94._12_4_ = fVar266;
          fVar250 = fVar171 * 0.0 * fStack_790;
          auVar94._16_4_ = fVar250;
          fVar287 = fVar197 * 0.0 * fStack_78c;
          auVar94._20_4_ = fVar287;
          fVar347 = fVar298 * 0.0 * fStack_788;
          auVar94._24_4_ = fVar347;
          auVar94._28_4_ = fVar248;
          auVar28 = vsubps_avx(local_640,auVar92);
          auVar381._0_4_ = fVar226 + auVar164._0_4_;
          auVar381._4_4_ = fVar237 + auVar164._4_4_;
          auVar381._8_4_ = fVar241 + auVar164._8_4_;
          auVar381._12_4_ = fVar266 + auVar164._12_4_;
          auVar381._16_4_ = fVar250 + auVar164._16_4_;
          auVar381._20_4_ = fVar287 + auVar164._20_4_;
          auVar381._24_4_ = fVar347 + auVar164._24_4_;
          auVar381._28_4_ = fVar248 + auVar164._28_4_;
          fVar226 = auVar363._0_4_ * fVar243 * fVar253;
          fVar253 = auVar363._4_4_ * fVar307 * fVar239;
          auVar95._4_4_ = fVar253;
          auVar95._0_4_ = fVar226;
          fVar237 = auVar363._8_4_ * fVar246 * fVar247;
          auVar95._8_4_ = fVar237;
          fVar239 = auVar363._12_4_ * fVar312 * fVar285;
          auVar95._12_4_ = fVar239;
          fVar241 = auVar363._16_4_ * fVar249 * fVar267;
          auVar95._16_4_ = fVar241;
          fVar247 = auVar363._20_4_ * fVar323 * fVar268;
          auVar95._20_4_ = fVar247;
          fVar266 = auVar363._24_4_ * fVar325 * fVar288;
          auVar95._24_4_ = fVar266;
          auVar95._28_4_ = fStack_784;
          auVar43 = vsubps_avx(auVar208,auVar93);
          auVar365._0_4_ = auVar273._0_4_ + fVar226;
          auVar365._4_4_ = auVar273._4_4_ + fVar253;
          auVar365._8_4_ = auVar273._8_4_ + fVar237;
          auVar365._12_4_ = auVar273._12_4_ + fVar239;
          auVar365._16_4_ = auVar273._16_4_ + fVar241;
          auVar365._20_4_ = auVar273._20_4_ + fVar247;
          auVar365._24_4_ = auVar273._24_4_ + fVar266;
          auVar365._28_4_ = auVar273._28_4_ + fStack_784;
          fVar226 = fVar243 * -fVar210 * auVar363._0_4_;
          fVar253 = fVar307 * -fVar194 * auVar363._4_4_;
          auVar96._4_4_ = fVar253;
          auVar96._0_4_ = fVar226;
          fVar237 = fVar246 * -fVar310 * auVar363._8_4_;
          auVar96._8_4_ = fVar237;
          fVar239 = fVar312 * -fVar195 * auVar363._12_4_;
          auVar96._12_4_ = fVar239;
          fVar241 = fVar249 * -fVar313 * auVar363._16_4_;
          auVar96._16_4_ = fVar241;
          fVar247 = fVar323 * -fVar196 * auVar363._20_4_;
          auVar96._20_4_ = fVar247;
          fVar266 = fVar325 * -fVar324 * auVar363._24_4_;
          auVar96._24_4_ = fVar266;
          auVar96._28_4_ = local_640._28_4_;
          auVar152 = vsubps_avx(auVar164,auVar94);
          auVar235._0_4_ = local_520._0_4_ + fVar226;
          auVar235._4_4_ = local_520._4_4_ + fVar253;
          auVar235._8_4_ = local_520._8_4_ + fVar237;
          auVar235._12_4_ = local_520._12_4_ + fVar239;
          auVar235._16_4_ = local_520._16_4_ + fVar241;
          auVar235._20_4_ = local_520._20_4_ + fVar247;
          auVar235._24_4_ = local_520._24_4_ + fVar266;
          auVar235._28_4_ = local_520._28_4_ + local_640._28_4_;
          fVar226 = fVar243 * 0.0 * auVar363._0_4_;
          fVar253 = fVar307 * 0.0 * auVar363._4_4_;
          auVar97._4_4_ = fVar253;
          auVar97._0_4_ = fVar226;
          fVar237 = fVar246 * 0.0 * auVar363._8_4_;
          auVar97._8_4_ = fVar237;
          fVar239 = fVar312 * 0.0 * auVar363._12_4_;
          auVar97._12_4_ = fVar239;
          fVar241 = fVar249 * 0.0 * auVar363._16_4_;
          auVar97._16_4_ = fVar241;
          fVar247 = fVar323 * 0.0 * auVar363._20_4_;
          auVar97._20_4_ = fVar247;
          fVar266 = fVar325 * 0.0 * auVar363._24_4_;
          auVar97._24_4_ = fVar266;
          auVar97._28_4_ = auVar164._28_4_;
          auVar154 = vsubps_avx(auVar273,auVar95);
          auVar130._4_4_ = fStack_57c;
          auVar130._0_4_ = local_580;
          auVar130._8_4_ = fStack_578;
          auVar130._12_4_ = fStack_574;
          auVar130._16_4_ = fStack_570;
          auVar130._20_4_ = fStack_56c;
          auVar130._24_4_ = fStack_568;
          auVar130._28_4_ = fStack_564;
          auVar319._0_4_ = local_580 + fVar226;
          auVar319._4_4_ = fStack_57c + fVar253;
          auVar319._8_4_ = fStack_578 + fVar237;
          auVar319._12_4_ = fStack_574 + fVar239;
          auVar319._16_4_ = fStack_570 + fVar241;
          auVar319._20_4_ = fStack_56c + fVar247;
          auVar319._24_4_ = fStack_568 + fVar266;
          auVar319._28_4_ = fStack_564 + auVar164._28_4_;
          auVar24 = vsubps_avx(local_520,auVar96);
          auVar25 = vsubps_avx(auVar130,auVar97);
          auVar26 = vsubps_avx(auVar235,auVar43);
          auVar27 = vsubps_avx(auVar319,auVar152);
          auVar98._4_4_ = auVar152._4_4_ * auVar26._4_4_;
          auVar98._0_4_ = auVar152._0_4_ * auVar26._0_4_;
          auVar98._8_4_ = auVar152._8_4_ * auVar26._8_4_;
          auVar98._12_4_ = auVar152._12_4_ * auVar26._12_4_;
          auVar98._16_4_ = auVar152._16_4_ * auVar26._16_4_;
          auVar98._20_4_ = auVar152._20_4_ * auVar26._20_4_;
          auVar98._24_4_ = auVar152._24_4_ * auVar26._24_4_;
          auVar98._28_4_ = auVar356._28_4_;
          auVar99._4_4_ = auVar43._4_4_ * auVar27._4_4_;
          auVar99._0_4_ = auVar43._0_4_ * auVar27._0_4_;
          auVar99._8_4_ = auVar43._8_4_ * auVar27._8_4_;
          auVar99._12_4_ = auVar43._12_4_ * auVar27._12_4_;
          auVar99._16_4_ = auVar43._16_4_ * auVar27._16_4_;
          auVar99._20_4_ = auVar43._20_4_ * auVar27._20_4_;
          auVar99._24_4_ = auVar43._24_4_ * auVar27._24_4_;
          auVar99._28_4_ = fStack_564;
          auVar29 = vsubps_avx(auVar99,auVar98);
          auVar100._4_4_ = auVar28._4_4_ * auVar27._4_4_;
          auVar100._0_4_ = auVar28._0_4_ * auVar27._0_4_;
          auVar100._8_4_ = auVar28._8_4_ * auVar27._8_4_;
          auVar100._12_4_ = auVar28._12_4_ * auVar27._12_4_;
          auVar100._16_4_ = auVar28._16_4_ * auVar27._16_4_;
          auVar100._20_4_ = auVar28._20_4_ * auVar27._20_4_;
          auVar100._24_4_ = auVar28._24_4_ * auVar27._24_4_;
          auVar100._28_4_ = auVar27._28_4_;
          auVar27 = vsubps_avx(auVar365,auVar28);
          auVar101._4_4_ = auVar152._4_4_ * auVar27._4_4_;
          auVar101._0_4_ = auVar152._0_4_ * auVar27._0_4_;
          auVar101._8_4_ = auVar152._8_4_ * auVar27._8_4_;
          auVar101._12_4_ = auVar152._12_4_ * auVar27._12_4_;
          auVar101._16_4_ = auVar152._16_4_ * auVar27._16_4_;
          auVar101._20_4_ = auVar152._20_4_ * auVar27._20_4_;
          auVar101._24_4_ = auVar152._24_4_ * auVar27._24_4_;
          auVar101._28_4_ = auVar23._28_4_;
          auVar30 = vsubps_avx(auVar101,auVar100);
          auVar102._4_4_ = auVar43._4_4_ * auVar27._4_4_;
          auVar102._0_4_ = auVar43._0_4_ * auVar27._0_4_;
          auVar102._8_4_ = auVar43._8_4_ * auVar27._8_4_;
          auVar102._12_4_ = auVar43._12_4_ * auVar27._12_4_;
          auVar102._16_4_ = auVar43._16_4_ * auVar27._16_4_;
          auVar102._20_4_ = auVar43._20_4_ * auVar27._20_4_;
          auVar102._24_4_ = auVar43._24_4_ * auVar27._24_4_;
          auVar102._28_4_ = auVar23._28_4_;
          auVar103._4_4_ = auVar28._4_4_ * auVar26._4_4_;
          auVar103._0_4_ = auVar28._0_4_ * auVar26._0_4_;
          auVar103._8_4_ = auVar28._8_4_ * auVar26._8_4_;
          auVar103._12_4_ = auVar28._12_4_ * auVar26._12_4_;
          auVar103._16_4_ = auVar28._16_4_ * auVar26._16_4_;
          auVar103._20_4_ = auVar28._20_4_ * auVar26._20_4_;
          auVar103._24_4_ = auVar28._24_4_ * auVar26._24_4_;
          auVar103._28_4_ = auVar26._28_4_;
          auVar23 = vsubps_avx(auVar103,auVar102);
          auVar188._0_4_ = auVar29._0_4_ * 0.0 + auVar23._0_4_ + auVar30._0_4_ * 0.0;
          auVar188._4_4_ = auVar29._4_4_ * 0.0 + auVar23._4_4_ + auVar30._4_4_ * 0.0;
          auVar188._8_4_ = auVar29._8_4_ * 0.0 + auVar23._8_4_ + auVar30._8_4_ * 0.0;
          auVar188._12_4_ = auVar29._12_4_ * 0.0 + auVar23._12_4_ + auVar30._12_4_ * 0.0;
          auVar188._16_4_ = auVar29._16_4_ * 0.0 + auVar23._16_4_ + auVar30._16_4_ * 0.0;
          auVar188._20_4_ = auVar29._20_4_ * 0.0 + auVar23._20_4_ + auVar30._20_4_ * 0.0;
          auVar188._24_4_ = auVar29._24_4_ * 0.0 + auVar23._24_4_ + auVar30._24_4_ * 0.0;
          auVar188._28_4_ = auVar29._28_4_ + auVar23._28_4_ + auVar30._28_4_;
          auVar22 = vcmpps_avx(auVar188,ZEXT832(0) << 0x20,2);
          auVar209 = ZEXT3264(auVar22);
          auVar154 = vblendvps_avx(auVar154,_local_540,auVar22);
          auVar128._4_4_ = fStack_5dc;
          auVar128._0_4_ = local_5e0;
          auVar128._8_4_ = fStack_5d8;
          auVar128._12_4_ = fStack_5d4;
          auVar128._16_4_ = fStack_5d0;
          auVar128._20_4_ = fStack_5cc;
          auVar128._24_4_ = fStack_5c8;
          auVar128._28_4_ = fStack_5c4;
          auVar23 = vblendvps_avx(auVar24,auVar128,auVar22);
          auVar24 = vblendvps_avx(auVar25,auVar381,auVar22);
          auVar25 = vblendvps_avx(auVar28,auVar365,auVar22);
          auVar26 = vblendvps_avx(auVar43,auVar235,auVar22);
          auVar27 = vblendvps_avx(auVar152,auVar319,auVar22);
          auVar28 = vblendvps_avx(auVar365,auVar28,auVar22);
          auVar29 = vblendvps_avx(auVar235,auVar43,auVar22);
          auVar30 = vblendvps_avx(auVar319,auVar152,auVar22);
          local_620 = vandps_avx(local_360,auVar222);
          auVar28 = vsubps_avx(auVar28,auVar154);
          auVar153 = vsubps_avx(auVar29,auVar23);
          auVar30 = vsubps_avx(auVar30,auVar24);
          auVar185 = vsubps_avx(auVar23,auVar26);
          fVar226 = auVar153._0_4_;
          fVar177 = auVar24._0_4_;
          fVar285 = auVar153._4_4_;
          fVar198 = auVar24._4_4_;
          auVar104._4_4_ = fVar198 * fVar285;
          auVar104._0_4_ = fVar177 * fVar226;
          fVar210 = auVar153._8_4_;
          fVar271 = auVar24._8_4_;
          auVar104._8_4_ = fVar271 * fVar210;
          fVar312 = auVar153._12_4_;
          fVar277 = auVar24._12_4_;
          auVar104._12_4_ = fVar277 * fVar312;
          fVar326 = auVar153._16_4_;
          fVar280 = auVar24._16_4_;
          auVar104._16_4_ = fVar280 * fVar326;
          fVar178 = auVar153._20_4_;
          fVar282 = auVar24._20_4_;
          auVar104._20_4_ = fVar282 * fVar178;
          fVar248 = auVar153._24_4_;
          fVar284 = auVar24._24_4_;
          auVar104._24_4_ = fVar284 * fVar248;
          auVar104._28_4_ = auVar29._28_4_;
          fVar253 = auVar23._0_4_;
          fVar286 = auVar30._0_4_;
          fVar250 = auVar23._4_4_;
          fVar289 = auVar30._4_4_;
          auVar105._4_4_ = fVar289 * fVar250;
          auVar105._0_4_ = fVar286 * fVar253;
          fVar243 = auVar23._8_4_;
          fVar290 = auVar30._8_4_;
          auVar105._8_4_ = fVar290 * fVar243;
          fVar313 = auVar23._12_4_;
          fVar269 = auVar30._12_4_;
          auVar105._12_4_ = fVar269 * fVar313;
          fVar211 = auVar23._16_4_;
          fVar276 = auVar30._16_4_;
          auVar105._16_4_ = fVar276 * fVar211;
          fVar252 = auVar23._20_4_;
          fVar279 = auVar30._20_4_;
          auVar105._20_4_ = fVar279 * fVar252;
          fVar251 = auVar23._24_4_;
          fVar299 = auVar30._24_4_;
          uVar146 = auVar43._28_4_;
          auVar105._24_4_ = fVar299 * fVar251;
          auVar105._28_4_ = uVar146;
          auVar29 = vsubps_avx(auVar105,auVar104);
          fVar237 = auVar154._0_4_;
          fVar267 = auVar154._4_4_;
          auVar106._4_4_ = fVar289 * fVar267;
          auVar106._0_4_ = fVar286 * fVar237;
          fVar194 = auVar154._8_4_;
          auVar106._8_4_ = fVar290 * fVar194;
          fVar249 = auVar154._12_4_;
          auVar106._12_4_ = fVar269 * fVar249;
          fVar149 = auVar154._16_4_;
          auVar106._16_4_ = fVar276 * fVar149;
          fVar227 = auVar154._20_4_;
          auVar106._20_4_ = fVar279 * fVar227;
          fVar169 = auVar154._24_4_;
          auVar106._24_4_ = fVar299 * fVar169;
          auVar106._28_4_ = uVar146;
          fVar239 = auVar28._0_4_;
          fVar287 = auVar28._4_4_;
          auVar107._4_4_ = fVar198 * fVar287;
          auVar107._0_4_ = fVar177 * fVar239;
          fVar307 = auVar28._8_4_;
          auVar107._8_4_ = fVar271 * fVar307;
          fVar196 = auVar28._12_4_;
          auVar107._12_4_ = fVar277 * fVar196;
          fVar168 = auVar28._16_4_;
          auVar107._16_4_ = fVar280 * fVar168;
          fVar238 = auVar28._20_4_;
          auVar107._20_4_ = fVar282 * fVar238;
          fVar172 = auVar28._24_4_;
          auVar107._24_4_ = fVar284 * fVar172;
          auVar107._28_4_ = auVar365._28_4_;
          auVar43 = vsubps_avx(auVar107,auVar106);
          auVar108._4_4_ = fVar250 * fVar287;
          auVar108._0_4_ = fVar253 * fVar239;
          auVar108._8_4_ = fVar243 * fVar307;
          auVar108._12_4_ = fVar313 * fVar196;
          auVar108._16_4_ = fVar211 * fVar168;
          auVar108._20_4_ = fVar252 * fVar238;
          auVar108._24_4_ = fVar251 * fVar172;
          auVar108._28_4_ = uVar146;
          auVar109._4_4_ = fVar267 * fVar285;
          auVar109._0_4_ = fVar237 * fVar226;
          auVar109._8_4_ = fVar194 * fVar210;
          auVar109._12_4_ = fVar249 * fVar312;
          auVar109._16_4_ = fVar149 * fVar326;
          auVar109._20_4_ = fVar227 * fVar178;
          auVar109._24_4_ = fVar169 * fVar248;
          auVar109._28_4_ = auVar152._28_4_;
          auVar152 = vsubps_avx(auVar109,auVar108);
          auVar184 = vsubps_avx(auVar24,auVar27);
          fVar247 = auVar152._28_4_ + auVar43._28_4_;
          auVar337._0_4_ = auVar152._0_4_ + auVar43._0_4_ * 0.0 + auVar29._0_4_ * 0.0;
          auVar337._4_4_ = auVar152._4_4_ + auVar43._4_4_ * 0.0 + auVar29._4_4_ * 0.0;
          auVar337._8_4_ = auVar152._8_4_ + auVar43._8_4_ * 0.0 + auVar29._8_4_ * 0.0;
          auVar337._12_4_ = auVar152._12_4_ + auVar43._12_4_ * 0.0 + auVar29._12_4_ * 0.0;
          auVar337._16_4_ = auVar152._16_4_ + auVar43._16_4_ * 0.0 + auVar29._16_4_ * 0.0;
          auVar337._20_4_ = auVar152._20_4_ + auVar43._20_4_ * 0.0 + auVar29._20_4_ * 0.0;
          auVar337._24_4_ = auVar152._24_4_ + auVar43._24_4_ * 0.0 + auVar29._24_4_ * 0.0;
          auVar337._28_4_ = fVar247 + auVar29._28_4_;
          fVar241 = auVar185._0_4_;
          fVar268 = auVar185._4_4_;
          auVar110._4_4_ = auVar27._4_4_ * fVar268;
          auVar110._0_4_ = auVar27._0_4_ * fVar241;
          fVar310 = auVar185._8_4_;
          auVar110._8_4_ = auVar27._8_4_ * fVar310;
          fVar323 = auVar185._12_4_;
          auVar110._12_4_ = auVar27._12_4_ * fVar323;
          fVar171 = auVar185._16_4_;
          auVar110._16_4_ = auVar27._16_4_ * fVar171;
          fVar240 = auVar185._20_4_;
          auVar110._20_4_ = auVar27._20_4_ * fVar240;
          fVar174 = auVar185._24_4_;
          auVar110._24_4_ = auVar27._24_4_ * fVar174;
          auVar110._28_4_ = fVar247;
          fVar247 = auVar184._0_4_;
          fVar347 = auVar184._4_4_;
          auVar111._4_4_ = auVar26._4_4_ * fVar347;
          auVar111._0_4_ = auVar26._0_4_ * fVar247;
          fVar246 = auVar184._8_4_;
          auVar111._8_4_ = auVar26._8_4_ * fVar246;
          fVar324 = auVar184._12_4_;
          auVar111._12_4_ = auVar26._12_4_ * fVar324;
          fVar197 = auVar184._16_4_;
          auVar111._16_4_ = auVar26._16_4_ * fVar197;
          fVar242 = auVar184._20_4_;
          auVar111._20_4_ = auVar26._20_4_ * fVar242;
          fVar175 = auVar184._24_4_;
          auVar111._24_4_ = auVar26._24_4_ * fVar175;
          auVar111._28_4_ = auVar152._28_4_;
          auVar43 = vsubps_avx(auVar111,auVar110);
          auVar152 = vsubps_avx(auVar154,auVar25);
          fVar266 = auVar152._0_4_;
          fVar288 = auVar152._4_4_;
          auVar112._4_4_ = auVar27._4_4_ * fVar288;
          auVar112._0_4_ = auVar27._0_4_ * fVar266;
          fVar195 = auVar152._8_4_;
          auVar112._8_4_ = auVar27._8_4_ * fVar195;
          fVar325 = auVar152._12_4_;
          auVar112._12_4_ = auVar27._12_4_ * fVar325;
          fVar298 = auVar152._16_4_;
          auVar112._16_4_ = auVar27._16_4_ * fVar298;
          fVar245 = auVar152._20_4_;
          auVar112._20_4_ = auVar27._20_4_ * fVar245;
          fVar176 = auVar152._24_4_;
          auVar112._24_4_ = auVar27._24_4_ * fVar176;
          auVar112._28_4_ = auVar27._28_4_;
          auVar113._4_4_ = fVar347 * auVar25._4_4_;
          auVar113._0_4_ = fVar247 * auVar25._0_4_;
          auVar113._8_4_ = fVar246 * auVar25._8_4_;
          auVar113._12_4_ = fVar324 * auVar25._12_4_;
          auVar113._16_4_ = fVar197 * auVar25._16_4_;
          auVar113._20_4_ = fVar242 * auVar25._20_4_;
          auVar113._24_4_ = fVar175 * auVar25._24_4_;
          auVar113._28_4_ = auVar29._28_4_;
          auVar27 = vsubps_avx(auVar112,auVar113);
          auVar114._4_4_ = auVar26._4_4_ * fVar288;
          auVar114._0_4_ = auVar26._0_4_ * fVar266;
          auVar114._8_4_ = auVar26._8_4_ * fVar195;
          auVar114._12_4_ = auVar26._12_4_ * fVar325;
          auVar114._16_4_ = auVar26._16_4_ * fVar298;
          auVar114._20_4_ = auVar26._20_4_ * fVar245;
          auVar114._24_4_ = auVar26._24_4_ * fVar176;
          auVar114._28_4_ = auVar26._28_4_;
          auVar115._4_4_ = fVar268 * auVar25._4_4_;
          auVar115._0_4_ = fVar241 * auVar25._0_4_;
          auVar115._8_4_ = fVar310 * auVar25._8_4_;
          auVar115._12_4_ = fVar323 * auVar25._12_4_;
          auVar115._16_4_ = fVar171 * auVar25._16_4_;
          auVar115._20_4_ = fVar240 * auVar25._20_4_;
          auVar115._24_4_ = fVar174 * auVar25._24_4_;
          auVar115._28_4_ = auVar25._28_4_;
          auVar25 = vsubps_avx(auVar115,auVar114);
          auVar165._0_4_ = auVar43._0_4_ * 0.0 + auVar25._0_4_ + auVar27._0_4_ * 0.0;
          auVar165._4_4_ = auVar43._4_4_ * 0.0 + auVar25._4_4_ + auVar27._4_4_ * 0.0;
          auVar165._8_4_ = auVar43._8_4_ * 0.0 + auVar25._8_4_ + auVar27._8_4_ * 0.0;
          auVar165._12_4_ = auVar43._12_4_ * 0.0 + auVar25._12_4_ + auVar27._12_4_ * 0.0;
          auVar165._16_4_ = auVar43._16_4_ * 0.0 + auVar25._16_4_ + auVar27._16_4_ * 0.0;
          auVar165._20_4_ = auVar43._20_4_ * 0.0 + auVar25._20_4_ + auVar27._20_4_ * 0.0;
          auVar165._24_4_ = auVar43._24_4_ * 0.0 + auVar25._24_4_ + auVar27._24_4_ * 0.0;
          auVar165._28_4_ = auVar27._28_4_ + auVar25._28_4_ + auVar27._28_4_;
          auVar166 = ZEXT3264(auVar165);
          auVar25 = vmaxps_avx(auVar337,auVar165);
          auVar25 = vcmpps_avx(auVar25,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar26 = local_620 & auVar25;
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0x7f,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar26 >> 0xbf,0) == '\0') &&
              (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar26[0x1f]) {
LAB_00b44675:
            auVar308 = auVar185._4_12_;
            auVar190 = ZEXT3264(CONCAT824(uStack_488,
                                          CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
          }
          else {
            auVar26 = vandps_avx(auVar25,local_620);
            auVar116._4_4_ = fVar347 * fVar285;
            auVar116._0_4_ = fVar247 * fVar226;
            auVar116._8_4_ = fVar246 * fVar210;
            auVar116._12_4_ = fVar324 * fVar312;
            auVar116._16_4_ = fVar197 * fVar326;
            auVar116._20_4_ = fVar242 * fVar178;
            auVar116._24_4_ = fVar175 * fVar248;
            auVar116._28_4_ = local_620._28_4_;
            auVar117._4_4_ = fVar268 * fVar289;
            auVar117._0_4_ = fVar241 * fVar286;
            auVar117._8_4_ = fVar310 * fVar290;
            auVar117._12_4_ = fVar323 * fVar269;
            auVar117._16_4_ = fVar171 * fVar276;
            auVar117._20_4_ = fVar240 * fVar279;
            auVar117._24_4_ = fVar174 * fVar299;
            auVar117._28_4_ = auVar25._28_4_;
            auVar27 = vsubps_avx(auVar117,auVar116);
            auVar118._4_4_ = fVar288 * fVar289;
            auVar118._0_4_ = fVar266 * fVar286;
            auVar118._8_4_ = fVar195 * fVar290;
            auVar118._12_4_ = fVar325 * fVar269;
            auVar118._16_4_ = fVar298 * fVar276;
            auVar118._20_4_ = fVar245 * fVar279;
            auVar118._24_4_ = fVar176 * fVar299;
            auVar118._28_4_ = auVar30._28_4_;
            auVar119._4_4_ = fVar347 * fVar287;
            auVar119._0_4_ = fVar247 * fVar239;
            auVar119._8_4_ = fVar246 * fVar307;
            auVar119._12_4_ = fVar324 * fVar196;
            auVar119._16_4_ = fVar197 * fVar168;
            auVar119._20_4_ = fVar242 * fVar238;
            auVar119._24_4_ = fVar175 * fVar172;
            auVar119._28_4_ = auVar184._28_4_;
            auVar29 = vsubps_avx(auVar119,auVar118);
            auVar120._4_4_ = fVar268 * fVar287;
            auVar120._0_4_ = fVar241 * fVar239;
            auVar120._8_4_ = fVar310 * fVar307;
            auVar120._12_4_ = fVar323 * fVar196;
            auVar120._16_4_ = fVar171 * fVar168;
            auVar120._20_4_ = fVar240 * fVar238;
            auVar120._24_4_ = fVar174 * fVar172;
            auVar120._28_4_ = auVar28._28_4_;
            auVar121._4_4_ = fVar288 * fVar285;
            auVar121._0_4_ = fVar266 * fVar226;
            auVar121._8_4_ = fVar195 * fVar210;
            auVar121._12_4_ = fVar325 * fVar312;
            auVar121._16_4_ = fVar298 * fVar326;
            auVar121._20_4_ = fVar245 * fVar178;
            auVar121._24_4_ = fVar176 * fVar248;
            auVar121._28_4_ = auVar153._28_4_;
            auVar185 = vsubps_avx(auVar121,auVar120);
            auVar308 = auVar185._4_12_;
            auVar189._0_4_ = auVar27._0_4_ * 0.0 + auVar185._0_4_ + auVar29._0_4_ * 0.0;
            auVar189._4_4_ = auVar27._4_4_ * 0.0 + auVar185._4_4_ + auVar29._4_4_ * 0.0;
            auVar189._8_4_ = auVar27._8_4_ * 0.0 + auVar185._8_4_ + auVar29._8_4_ * 0.0;
            auVar189._12_4_ = auVar27._12_4_ * 0.0 + auVar185._12_4_ + auVar29._12_4_ * 0.0;
            auVar189._16_4_ = auVar27._16_4_ * 0.0 + auVar185._16_4_ + auVar29._16_4_ * 0.0;
            auVar189._20_4_ = auVar27._20_4_ * 0.0 + auVar185._20_4_ + auVar29._20_4_ * 0.0;
            auVar189._24_4_ = auVar27._24_4_ * 0.0 + auVar185._24_4_ + auVar29._24_4_ * 0.0;
            auVar189._28_4_ = auVar153._28_4_ + auVar185._28_4_ + auVar28._28_4_;
            auVar25 = vrcpps_avx(auVar189);
            fVar239 = auVar25._0_4_;
            fVar241 = auVar25._4_4_;
            auVar122._4_4_ = auVar189._4_4_ * fVar241;
            auVar122._0_4_ = auVar189._0_4_ * fVar239;
            fVar247 = auVar25._8_4_;
            auVar122._8_4_ = auVar189._8_4_ * fVar247;
            fVar266 = auVar25._12_4_;
            auVar122._12_4_ = auVar189._12_4_ * fVar266;
            fVar285 = auVar25._16_4_;
            auVar122._16_4_ = auVar189._16_4_ * fVar285;
            fVar287 = auVar25._20_4_;
            auVar122._20_4_ = auVar189._20_4_ * fVar287;
            fVar268 = auVar25._24_4_;
            auVar122._24_4_ = auVar189._24_4_ * fVar268;
            auVar122._28_4_ = auVar184._28_4_;
            auVar357._8_4_ = 0x3f800000;
            auVar357._0_8_ = 0x3f8000003f800000;
            auVar357._12_4_ = 0x3f800000;
            auVar357._16_4_ = 0x3f800000;
            auVar357._20_4_ = 0x3f800000;
            auVar357._24_4_ = 0x3f800000;
            auVar357._28_4_ = 0x3f800000;
            auVar25 = vsubps_avx(auVar357,auVar122);
            fVar239 = auVar25._0_4_ * fVar239 + fVar239;
            fVar241 = auVar25._4_4_ * fVar241 + fVar241;
            fVar247 = auVar25._8_4_ * fVar247 + fVar247;
            fVar266 = auVar25._12_4_ * fVar266 + fVar266;
            fVar285 = auVar25._16_4_ * fVar285 + fVar285;
            fVar287 = auVar25._20_4_ * fVar287 + fVar287;
            fVar268 = auVar25._24_4_ * fVar268 + fVar268;
            auVar123._4_4_ =
                 (fVar267 * auVar27._4_4_ + auVar29._4_4_ * fVar250 + auVar185._4_4_ * fVar198) *
                 fVar241;
            auVar123._0_4_ =
                 (fVar237 * auVar27._0_4_ + auVar29._0_4_ * fVar253 + auVar185._0_4_ * fVar177) *
                 fVar239;
            auVar123._8_4_ =
                 (fVar194 * auVar27._8_4_ + auVar29._8_4_ * fVar243 + auVar185._8_4_ * fVar271) *
                 fVar247;
            auVar123._12_4_ =
                 (fVar249 * auVar27._12_4_ + auVar29._12_4_ * fVar313 + auVar185._12_4_ * fVar277) *
                 fVar266;
            auVar123._16_4_ =
                 (fVar149 * auVar27._16_4_ + auVar29._16_4_ * fVar211 + auVar185._16_4_ * fVar280) *
                 fVar285;
            auVar123._20_4_ =
                 (fVar227 * auVar27._20_4_ + auVar29._20_4_ * fVar252 + auVar185._20_4_ * fVar282) *
                 fVar287;
            auVar123._24_4_ =
                 (fVar169 * auVar27._24_4_ + auVar29._24_4_ * fVar251 + auVar185._24_4_ * fVar284) *
                 fVar268;
            auVar123._28_4_ = auVar154._28_4_ + auVar23._28_4_ + auVar24._28_4_;
            fVar226 = ray->tfar;
            auVar236._4_4_ = fVar226;
            auVar236._0_4_ = fVar226;
            auVar236._8_4_ = fVar226;
            auVar236._12_4_ = fVar226;
            auVar236._16_4_ = fVar226;
            auVar236._20_4_ = fVar226;
            auVar236._24_4_ = fVar226;
            auVar236._28_4_ = fVar226;
            auVar132._8_8_ = uStack_f8;
            auVar132._0_8_ = local_100;
            auVar132._16_8_ = uStack_f0;
            auVar132._24_8_ = uStack_e8;
            auVar154 = vcmpps_avx(auVar132,auVar123,2);
            auVar23 = vcmpps_avx(auVar123,auVar236,2);
            auVar154 = vandps_avx(auVar154,auVar23);
            auVar24 = auVar26 & auVar154;
            if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar24 >> 0x7f,0) == '\0') &&
                  (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar24 >> 0xbf,0) == '\0') &&
                (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar24[0x1f]) goto LAB_00b44675;
            auVar154 = vandps_avx(auVar26,auVar154);
            auVar24 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar189,4);
            auVar25 = auVar154 & auVar24;
            auVar190 = ZEXT3264(CONCAT824(uStack_488,
                                          CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0x7f,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0xbf,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar25[0x1f] < '\0') {
              auVar154 = vandps_avx(auVar24,auVar154);
              auVar190 = ZEXT3264(auVar154);
              auVar124._4_4_ = auVar337._4_4_ * fVar241;
              auVar124._0_4_ = auVar337._0_4_ * fVar239;
              auVar124._8_4_ = auVar337._8_4_ * fVar247;
              auVar124._12_4_ = auVar337._12_4_ * fVar266;
              auVar124._16_4_ = auVar337._16_4_ * fVar285;
              auVar124._20_4_ = auVar337._20_4_ * fVar287;
              auVar124._24_4_ = auVar337._24_4_ * fVar268;
              auVar124._28_4_ = auVar23._28_4_;
              auVar125._4_4_ = auVar165._4_4_ * fVar241;
              auVar125._0_4_ = auVar165._0_4_ * fVar239;
              auVar125._8_4_ = auVar165._8_4_ * fVar247;
              auVar125._12_4_ = auVar165._12_4_ * fVar266;
              auVar125._16_4_ = auVar165._16_4_ * fVar285;
              auVar125._20_4_ = auVar165._20_4_ * fVar287;
              auVar125._24_4_ = auVar165._24_4_ * fVar268;
              auVar125._28_4_ = auVar165._28_4_;
              auVar274._8_4_ = 0x3f800000;
              auVar274._0_8_ = 0x3f8000003f800000;
              auVar274._12_4_ = 0x3f800000;
              auVar274._16_4_ = 0x3f800000;
              auVar274._20_4_ = 0x3f800000;
              auVar274._24_4_ = 0x3f800000;
              auVar274._28_4_ = 0x3f800000;
              auVar154 = vsubps_avx(auVar274,auVar124);
              _local_160 = vblendvps_avx(auVar154,auVar124,auVar22);
              auVar154 = vsubps_avx(auVar274,auVar125);
              _local_400 = vblendvps_avx(auVar154,auVar125,auVar22);
              auVar166 = ZEXT3264(_local_400);
              local_180 = auVar123;
            }
          }
          auVar320 = ZEXT3264(_local_780);
          auVar154 = auVar190._0_32_;
          auVar370 = ZEXT3264(_local_660);
          if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar154 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar154 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar154 >> 0x7f,0) != '\0') ||
                (auVar190 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
               SUB321(auVar154 >> 0xbf,0) != '\0') ||
              (auVar190 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
              auVar190[0x1f] < '\0') {
            auVar23 = vsubps_avx(auVar363,_local_7a0);
            fVar253 = (float)local_7a0._0_4_ + auVar23._0_4_ * (float)local_160._0_4_;
            fVar237 = (float)local_7a0._4_4_ + auVar23._4_4_ * (float)local_160._4_4_;
            fVar239 = fStack_798 + auVar23._8_4_ * fStack_158;
            fVar241 = fStack_794 + auVar23._12_4_ * fStack_154;
            fVar247 = fStack_790 + auVar23._16_4_ * fStack_150;
            fVar266 = fStack_78c + auVar23._20_4_ * fStack_14c;
            fVar285 = fStack_788 + auVar23._24_4_ * fStack_148;
            fVar250 = fStack_784 + auVar23._28_4_;
            fVar226 = local_718->depth_scale;
            auVar209 = ZEXT3264(CONCAT428(fVar226,CONCAT424(fVar226,CONCAT420(fVar226,CONCAT416(
                                                  fVar226,CONCAT412(fVar226,CONCAT48(fVar226,
                                                  CONCAT44(fVar226,fVar226))))))));
            auVar126._4_4_ = (fVar237 + fVar237) * fVar226;
            auVar126._0_4_ = (fVar253 + fVar253) * fVar226;
            auVar126._8_4_ = (fVar239 + fVar239) * fVar226;
            auVar126._12_4_ = (fVar241 + fVar241) * fVar226;
            auVar126._16_4_ = (fVar247 + fVar247) * fVar226;
            auVar126._20_4_ = (fVar266 + fVar266) * fVar226;
            auVar126._24_4_ = (fVar285 + fVar285) * fVar226;
            auVar126._28_4_ = fVar250 + fVar250;
            auVar23 = vcmpps_avx(local_180,auVar126,6);
            auVar166 = ZEXT3264(auVar23);
            auVar24 = auVar154 & auVar23;
            if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar24 >> 0x7f,0) != '\0') ||
                  (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar24 >> 0xbf,0) != '\0') ||
                (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar24[0x1f] < '\0') {
              local_200 = vandps_avx(auVar23,auVar154);
              auVar166 = ZEXT3264(local_200);
              auVar182._0_8_ =
                   CONCAT44((float)local_400._4_4_ + (float)local_400._4_4_ + -1.0,
                            (float)local_400._0_4_ + (float)local_400._0_4_ + -1.0);
              auVar182._8_4_ = (float)uStack_3f8 + (float)uStack_3f8 + -1.0;
              auVar182._12_4_ = uStack_3f8._4_4_ + uStack_3f8._4_4_ + -1.0;
              auVar183._16_4_ = (float)uStack_3f0 + (float)uStack_3f0 + -1.0;
              auVar183._0_16_ = auVar182;
              auVar183._20_4_ = uStack_3f0._4_4_ + uStack_3f0._4_4_ + -1.0;
              fStack_288 = (float)uStack_3e8 + (float)uStack_3e8 + -1.0;
              _local_2a0 = auVar183;
              fStack_284 = uStack_3e8._4_4_ + uStack_3e8._4_4_ + -1.0;
              auVar190 = ZEXT3264(_local_2a0);
              local_2c0 = _local_160;
              local_280 = local_180;
              local_25c = uVar141;
              local_250 = local_6b0;
              uStack_248 = uStack_6a8;
              local_240 = local_6c0;
              uStack_238 = uStack_6b8;
              local_230 = local_5b0;
              uStack_228 = uStack_5a8;
              auVar209 = ZEXT1664(_local_5c0);
              local_220 = _local_5c0;
              local_6e0._0_8_ = (context->scene->geometries).items[local_720].ptr;
              _local_400 = _local_2a0;
              auVar154 = _local_400;
              if ((((Geometry *)local_6e0._0_8_)->mask & ray->mask) == 0) {
                pRVar139 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar139 = context->args;
                if ((pRVar139->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar139 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar139 >> 8),1),
                   ((Geometry *)local_6e0._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_6e0._8_24_ = auVar273._8_24_;
                  auVar202._0_4_ = (float)(int)local_260;
                  auVar202._4_12_ = auVar308;
                  auVar385 = vshufps_avx(auVar202,auVar202,0);
                  auVar209 = ZEXT3264(CONCAT1616(auVar385,auVar385));
                  local_1e0[0] = (auVar385._0_4_ + (float)local_160._0_4_ + 0.0) *
                                 (float)local_120._0_4_;
                  local_1e0[1] = (auVar385._4_4_ + (float)local_160._4_4_ + 1.0) *
                                 (float)local_120._4_4_;
                  local_1e0[2] = (auVar385._8_4_ + fStack_158 + 2.0) * fStack_118;
                  local_1e0[3] = (auVar385._12_4_ + fStack_154 + 3.0) * fStack_114;
                  fStack_1d0 = (auVar385._0_4_ + fStack_150 + 4.0) * fStack_110;
                  fStack_1cc = (auVar385._4_4_ + fStack_14c + 5.0) * fStack_10c;
                  fStack_1c8 = (auVar385._8_4_ + fStack_148 + 6.0) * fStack_108;
                  fStack_1c4 = auVar385._12_4_ + fStack_144 + 7.0;
                  uStack_3f8 = auVar182._8_8_;
                  uStack_3f0 = auVar183._16_8_;
                  uStack_3e8 = local_2a0._24_8_;
                  local_1c0 = auVar182._0_8_;
                  uStack_1b8 = uStack_3f8;
                  uStack_1b0 = uStack_3f0;
                  uStack_1a8 = uStack_3e8;
                  auVar190 = ZEXT3264(local_180);
                  local_1a0 = local_180;
                  uVar146 = vmovmskps_avx(local_200);
                  uVar140 = CONCAT44((int)((ulong)pRVar139 >> 0x20),uVar146);
                  lVar142 = 0;
                  _local_400 = auVar154;
                  if (uVar140 != 0) {
                    for (; (uVar140 >> lVar142 & 1) == 0; lVar142 = lVar142 + 1) {
                    }
                  }
                  while( true ) {
                    local_7a0 = (undefined1  [8])lVar142;
                    local_620._0_8_ = uVar140;
                    if (uVar140 == 0) break;
                    local_694 = local_1e0[lVar142];
                    auVar166 = ZEXT464((uint)local_694);
                    local_690 = *(uint *)((long)&local_1c0 + lVar142 * 4);
                    auVar190 = ZEXT464(local_690);
                    local_640._0_4_ = ray->tfar;
                    ray->tfar = *(float *)(local_1a0 + lVar142 * 4);
                    fVar253 = 1.0 - local_694;
                    fVar226 = local_694 * 3.0;
                    auVar385 = ZEXT416((uint)((fVar253 * -2.0 * local_694 + local_694 * local_694) *
                                             0.5));
                    auVar385 = vshufps_avx(auVar385,auVar385,0);
                    auVar214 = ZEXT416((uint)(((fVar253 + fVar253) * (fVar226 + 2.0) +
                                              fVar253 * fVar253 * -3.0) * 0.5));
                    auVar214 = vshufps_avx(auVar214,auVar214,0);
                    auVar215 = ZEXT416((uint)(((local_694 + local_694) * (fVar226 + -5.0) +
                                              local_694 * fVar226) * 0.5));
                    auVar215 = vshufps_avx(auVar215,auVar215,0);
                    auVar216 = ZEXT416((uint)((local_694 * (fVar253 + fVar253) - fVar253 * fVar253)
                                             * 0.5));
                    auVar216 = vshufps_avx(auVar216,auVar216,0);
                    auVar203._0_4_ =
                         auVar216._0_4_ * (float)local_6b0._0_4_ +
                         auVar215._0_4_ * (float)local_6c0._0_4_ +
                         auVar385._0_4_ * (float)local_5c0._0_4_ +
                         auVar214._0_4_ * (float)local_5b0._0_4_;
                    auVar203._4_4_ =
                         auVar216._4_4_ * (float)local_6b0._4_4_ +
                         auVar215._4_4_ * (float)local_6c0._4_4_ +
                         auVar385._4_4_ * (float)local_5c0._4_4_ +
                         auVar214._4_4_ * (float)local_5b0._4_4_;
                    auVar203._8_4_ =
                         auVar216._8_4_ * (float)uStack_6a8 +
                         auVar215._8_4_ * (float)uStack_6b8 +
                         auVar385._8_4_ * fStack_5b8 + auVar214._8_4_ * (float)uStack_5a8;
                    auVar203._12_4_ =
                         auVar216._12_4_ * uStack_6a8._4_4_ +
                         auVar215._12_4_ * uStack_6b8._4_4_ +
                         auVar385._12_4_ * fStack_5b4 + auVar214._12_4_ * uStack_5a8._4_4_;
                    auVar209 = ZEXT1664(auVar203);
                    local_710.context = context->user;
                    local_6a0 = vmovlps_avx(auVar203);
                    local_698 = vextractps_avx(auVar203,2);
                    local_68c = (int)local_668;
                    local_688 = (int)local_720;
                    local_684 = (local_710.context)->instID[0];
                    local_680 = (local_710.context)->instPrimID[0];
                    local_7cc = -1;
                    local_710.valid = &local_7cc;
                    local_710.geometryUserPtr = *(void **)(local_6e0._0_8_ + 0x18);
                    local_710.ray = (RTCRayN *)ray;
                    local_710.hit = (RTCHitN *)&local_6a0;
                    local_710.N = 1;
                    if (*(code **)(local_6e0._0_8_ + 0x48) == (code *)0x0) {
LAB_00b445ea:
                      p_Var21 = context->args->filter;
                      if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_6e0._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar209 = ZEXT1664(auVar209._0_16_);
                        auVar385 = (*p_Var21)(&local_710);
                        auVar190._0_8_ = auVar385._8_8_;
                        auVar166._0_8_ = auVar385._0_8_;
                        auVar190._8_56_ = extraout_var_02;
                        auVar166._8_56_ = extraout_var_00;
                        if (*local_710.valid == 0) goto LAB_00b4462d;
                      }
                      pRVar139 = (RTCIntersectArguments *)0x1;
                      goto LAB_00b44695;
                    }
                    auVar209 = ZEXT1664(auVar203);
                    auVar385 = (**(code **)(local_6e0._0_8_ + 0x48))(&local_710);
                    auVar190._0_8_ = auVar385._8_8_;
                    auVar166._0_8_ = auVar385._0_8_;
                    auVar190._8_56_ = extraout_var_01;
                    auVar166._8_56_ = extraout_var;
                    if (*local_710.valid != 0) goto LAB_00b445ea;
LAB_00b4462d:
                    auVar166 = ZEXT464((uint)local_640._0_4_);
                    ray->tfar = (float)local_640._0_4_;
                    uVar140 = local_620._0_8_ ^ 1L << ((ulong)local_7a0 & 0x3f);
                    lVar142 = 0;
                    if (uVar140 != 0) {
                      for (; (uVar140 >> lVar142 & 1) == 0; lVar142 = lVar142 + 1) {
                      }
                    }
                  }
                  pRVar139 = (RTCIntersectArguments *)0x0;
LAB_00b44695:
                  auVar320 = ZEXT3264(_local_780);
                  auVar370 = ZEXT3264(_local_660);
                }
              }
              bVar143 = bVar143 | (byte)pRVar139;
              fVar148 = (float)local_740._0_4_;
              fVar167 = (float)local_740._4_4_;
              fVar170 = fStack_738;
              fVar173 = fStack_734;
              fVar270 = fStack_730;
              fVar262 = fStack_72c;
              fVar275 = fStack_728;
              fVar263 = fStack_724;
              fVar179 = (float)local_7c0._0_4_;
              fVar191 = (float)local_7c0._4_4_;
              fVar192 = fStack_7b8;
              fVar193 = fStack_7b4;
              fVar278 = fStack_7b0;
              fVar264 = fStack_7ac;
              fVar281 = fStack_7a8;
              fVar212 = (float)local_760._0_4_;
              fVar223 = (float)local_760._4_4_;
              fVar224 = fStack_758;
              fVar225 = fStack_754;
              fVar244 = fStack_750;
              fVar265 = fStack_74c;
              fVar283 = fStack_748;
            }
          }
        }
      }
    }
    if (bVar143 != 0) break;
    fVar226 = ray->tfar;
    auVar162._4_4_ = fVar226;
    auVar162._0_4_ = fVar226;
    auVar162._8_4_ = fVar226;
    auVar162._12_4_ = fVar226;
    auVar162._16_4_ = fVar226;
    auVar162._20_4_ = fVar226;
    auVar162._24_4_ = fVar226;
    auVar162._28_4_ = fVar226;
    auVar154 = vcmpps_avx(local_80,auVar162,2);
    uVar141 = vmovmskps_avx(auVar154);
  }
  return uVar137 != 0;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }